

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx512::forward
          (Convolution1D_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  _func_int *p_Var7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  float *pfVar14;
  size_t sVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  byte bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  undefined1 auVar294 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [64];
  undefined1 auVar349 [64];
  undefined1 auVar350 [64];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  int *piVar355;
  float afVar356 [16];
  float afVar357 [16];
  float afVar358 [16];
  float afVar359 [16];
  float afVar360 [16];
  float afVar361 [16];
  float afVar362 [16];
  int iVar363;
  ulong uVar364;
  long lVar365;
  long lVar366;
  long lVar367;
  long lVar368;
  ulong uVar369;
  long lVar370;
  undefined4 *puVar371;
  long lVar372;
  ulong uVar373;
  long lVar374;
  undefined4 *puVar375;
  ulong uVar376;
  long lVar377;
  long lVar378;
  undefined1 (*pauVar379) [64];
  undefined4 *puVar380;
  uint *puVar381;
  int iVar382;
  int iVar383;
  long lVar384;
  long lVar385;
  long lVar386;
  int iVar387;
  uint uVar388;
  int iVar389;
  long lVar390;
  long lVar391;
  ulong uVar392;
  ulong uVar393;
  long lVar394;
  ulong uVar395;
  long lVar396;
  long lVar397;
  long lVar398;
  long lVar399;
  uint uVar400;
  ulong uVar401;
  undefined1 (*pauVar402) [32];
  undefined1 (*pauVar403) [16];
  int iVar404;
  long lVar405;
  undefined1 (*pauVar406) [64];
  undefined1 (*pauVar407) [16];
  undefined4 *puVar408;
  uint uVar409;
  int iVar410;
  long lVar411;
  long lVar412;
  undefined1 (*pauVar413) [32];
  undefined1 (*pauVar414) [64];
  long lVar415;
  long lVar416;
  long lVar417;
  long lVar418;
  ulong uVar419;
  long lVar420;
  undefined1 (*pauVar421) [64];
  long lVar422;
  float *pfVar423;
  int iVar424;
  uint *puVar425;
  ulong uVar426;
  ulong uVar427;
  long lVar428;
  float fVar429;
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [32];
  undefined1 auVar461 [64];
  undefined1 auVar462 [64];
  undefined1 auVar463 [64];
  undefined1 auVar464 [64];
  undefined1 auVar465 [64];
  undefined1 auVar466 [64];
  undefined1 auVar467 [64];
  undefined1 auVar468 [64];
  undefined1 auVar469 [64];
  undefined1 auVar470 [64];
  undefined1 auVar471 [64];
  undefined1 auVar472 [64];
  undefined1 auVar473 [64];
  undefined1 auVar474 [64];
  undefined1 auVar475 [64];
  undefined1 auVar476 [64];
  undefined1 auVar477 [64];
  undefined1 auVar478 [64];
  undefined1 auVar479 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  float fVar494;
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  float fVar493;
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  float fVar495;
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  long lVar496;
  undefined1 auVar503 [32];
  undefined1 auVar504 [32];
  undefined1 auVar505 [32];
  undefined1 auVar506 [32];
  undefined1 auVar507 [32];
  float fVar508;
  float fVar509;
  __m128 pos;
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [32];
  undefined1 auVar519 [32];
  undefined1 auVar520 [32];
  undefined1 auVar521 [32];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [32];
  undefined1 auVar526 [32];
  undefined1 auVar527 [32];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  long lVar528;
  long lVar529;
  long lVar530;
  undefined1 auVar534 [32];
  undefined1 auVar535 [64];
  undefined1 auVar537 [16];
  undefined1 auVar538 [32];
  undefined1 auVar536 [16];
  undefined1 auVar539 [32];
  undefined1 auVar540 [16];
  undefined1 auVar541 [32];
  undefined1 auVar542 [32];
  undefined1 auVar543 [16];
  undefined1 auVar544 [32];
  undefined1 auVar545 [16];
  undefined1 auVar546 [32];
  undefined1 auVar547 [16];
  undefined1 auVar548 [32];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [32];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [32];
  undefined1 auVar561 [16];
  undefined1 auVar562 [32];
  undefined1 auVar563 [16];
  undefined1 auVar564 [32];
  undefined1 auVar565 [16];
  undefined1 auVar566 [32];
  undefined1 in_ZMM16 [64];
  float in_ZMM17 [16];
  float in_ZMM18 [16];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar567 [64];
  undefined1 in_ZMM31 [64];
  int local_368;
  int local_360;
  long local_340;
  int local_338;
  undefined1 (*local_310) [32];
  undefined1 (*local_2f0) [64];
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  undefined1 local_2a8 [16];
  long local_290;
  int local_210;
  Mat local_188;
  ulong local_140;
  ulong local_138;
  long local_130;
  long local_128;
  long local_120;
  undefined1 local_118 [32];
  ulong local_f0;
  long local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  undefined1 auVar454 [32];
  
  auVar431 = in_ZMM29._0_16_;
  uVar369 = bottom_blob->elemsize;
  iVar5 = bottom_blob->elempack;
  p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
  iVar383 = *(int *)(&this->field_0xd4 + (long)p_Var7);
  iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var7);
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize._0_4_ = 0;
  local_188.elemsize._4_4_ = 0;
  local_188.elempack = 0;
  local_188.allocator = (Allocator *)0x0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx512 + (long)p_Var7),
             bottom_blob,&local_188,opt);
  iVar424 = -100;
  if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
    uVar400 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]);
    if (opt->use_packing_layout == true) {
      uVar409 = 0x10;
      if (((uVar400 & 0xf) != 0) && (uVar409 = 8, (uVar400 & 7) != 0)) {
        uVar409 = (uint)((uVar400 & 3) == 0) * 3 + 1;
      }
    }
    else {
      uVar409 = 1;
    }
    Mat::create(top_blob,(local_188.w + ~((iVar383 + -1) * iVar6)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx512[-3]
                                 ) + 1,(int)uVar400 / (int)uVar409,
                (ulong)uVar409 * (uVar369 / (ulong)(long)iVar5),uVar409,opt->blob_allocator);
    iVar5 = local_188.elempack;
    afVar362 = _ps512_cephes_exp_p5;
    afVar361 = _ps512_cephes_exp_p4;
    afVar360 = _ps512_cephes_exp_p3;
    afVar359 = _ps512_cephes_exp_p2;
    afVar358 = _ps512_cephes_exp_p1;
    afVar357 = _ps512_cephes_LOG2EF;
    afVar356 = _ps512_1;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
      iVar383 = *(int *)(&this->field_0xd8 + (long)p_Var7);
      lVar398 = (long)iVar383;
      iVar6 = *(int *)(&this->field_0xdc + (long)p_Var7);
      iVar424 = *(int *)(&this->field_0xf4 + (long)p_Var7);
      lVar411 = (long)local_188.elempack;
      lVar384 = (long)local_188.h;
      iVar382 = local_188.w * local_188.elempack;
      local_f0 = (ulong)top_blob->w;
      uVar364 = (long)top_blob->h * (long)top_blob->elempack;
      lVar428 = (long)top_blob->elempack * local_f0;
      lVar8 = *(long *)(&this->field_0x190 + (long)p_Var7);
      iVar389 = (int)uVar364;
      uVar369 = (long)((ulong)(uint)(iVar389 >> 0x1f) << 0x20 | uVar364 & 0xffffffff) / 0x10;
      lVar415 = (long)(iVar383 << 4);
      lVar397 = (long)iVar382;
      lVar390 = (long)(iVar383 * 8);
      lVar422 = (long)(iVar383 * 4);
      auVar446 = vpbroadcastd_avx512vl();
      auVar447 = vpmulld_avx2(auVar446,_DAT_004f6b40);
      auVar461 = vpmovsxdq_avx512f(auVar447);
      auVar430 = vpmulld_avx(auVar446._0_16_,_DAT_004f6b60);
      local_118 = vpmovsxdq_avx2(auVar430);
      lVar365 = (long)(iVar382 * 0xe);
      lVar366 = (long)(iVar382 * 0xf);
      auVar462 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar463 = vxorps_avx512dq(auVar462,(undefined1  [64])_ps512_cephes_log_q2);
      auVar464 = vxorps_avx512dq(auVar462,(undefined1  [64])_ps512_cephes_log_q1);
      auVar465 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_78 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar462);
      iVar383 = (int)lVar428;
      lVar367 = (long)(iVar383 * 2);
      lVar368 = (long)(iVar383 * 3);
      local_c0 = (long)(iVar383 * 0xc);
      local_c8 = (long)(iVar383 * 0xd);
      local_d0 = (long)(iVar383 * 0xe);
      uVar426 = 0;
      uVar419 = (ulong)*(uint *)(&this->field_0xd4 + (long)p_Var7);
      if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var7) < 1) {
        uVar419 = uVar426;
      }
      local_d8 = (long)(iVar383 * 0xf);
      iVar382 = (int)uVar369;
      local_e0 = 0;
      if (0 < iVar382) {
        local_e0 = uVar369 & 0xffffffff;
      }
      lVar412 = vpextrq_avx(auVar461._16_16_,1);
      auVar430 = vextracti32x4_avx512f(auVar461,2);
      lVar528 = auVar430._0_8_;
      lVar9 = vpextrq_avx(auVar430,1);
      auVar430 = vextracti32x4_avx512f(auVar461,3);
      lVar529 = auVar430._0_8_;
      lVar386 = vpextrq_avx(auVar430,1);
      auVar430 = local_118._0_16_;
      lVar399 = lVar398 * 4;
      lVar530 = local_118._16_8_;
      lVar378 = vpextrq_avx(local_118._16_16_,1);
      auVar431 = vxorps_avx512vl(auVar431,auVar431);
      auVar567 = ZEXT1664(auVar431);
      lVar385 = auVar461._0_8_;
      local_b8 = vmovdqu64_avx512f(auVar461);
      lVar416 = vpextrq_avx(auVar461._0_16_,1);
      lVar496 = local_118._0_8_;
      lVar372 = vpextrq_avx(auVar430,1);
      lVar1 = lVar390 * 4;
      lVar2 = lVar422 * 4;
      local_e8 = lVar397 * 4;
      lVar3 = (long)iVar6 * 4;
      auVar462 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      for (; uVar426 != local_e0; uVar426 = uVar426 + 1) {
        uVar400 = top_blob->w;
        iVar410 = top_blob->elempack;
        local_2f0 = (undefined1 (*) [64])
                    ((long)(int)((long)((ulong)(uint)((int)(uVar426 * 0x10) >> 0x1f) << 0x20 |
                                       uVar426 * 0x10 & 0xffffffff) / (long)iVar410) *
                     (long)(int)uVar400 * top_blob->elemsize + (long)top_blob->data);
        lVar405 = (long)local_188.h * (long)local_188.elempack;
        local_290 = 0;
        uVar369 = 0;
        if (0 < (int)uVar400) {
          uVar369 = (ulong)uVar400;
        }
        iVar404 = 0;
        local_310 = (undefined1 (*) [32])local_e8;
        for (uVar393 = 0; uVar393 != uVar369; uVar393 = uVar393 + 1) {
          auVar431 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar431);
          auVar535 = ZEXT1664((undefined1  [16])0x0);
          if (lVar8 != 0) {
            auVar535 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar8 + uVar426 * 0x40));
          }
          pauVar406 = (undefined1 (*) [64])
                      ((this->weight_data_tm).cstep * uVar426 * (this->weight_data_tm).elemsize +
                      (long)(this->weight_data_tm).data);
          iVar363 = local_188.elempack * iVar6 * (int)uVar393;
          lVar391 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar420 = (long)local_188.data + (long)local_310;
          puVar425 = (uint *)((long)local_188.data + local_290);
          uVar392 = 0;
          auVar431 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = (float  [16])ZEXT1664(auVar431);
          auVar431 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = (float  [16])ZEXT1664(auVar431);
          while( true ) {
            local_360 = (int)lVar405;
            if (local_360 <= (int)((uint)uVar392 | 0xf)) break;
            lVar370 = (int)((long)((ulong)(uint)((int)(uint)uVar392 >> 0x1f) << 0x20 |
                                  uVar392 & 0xffffffff) / (long)local_188.elempack) * lVar391;
            if (local_188.elempack == 0x10) {
              puVar371 = (undefined4 *)((long)local_188.data + lVar370 + (long)iVar404 * 4);
              uVar376 = uVar419;
              pauVar379 = pauVar406;
              while (iVar387 = (int)uVar376, uVar376 = (ulong)(iVar387 - 1), iVar387 != 0) {
                in_ZMM26 = pauVar379[8];
                in_ZMM28 = pauVar379[0xb];
                in_ZMM31 = pauVar379[0xc];
                uVar4 = *puVar371;
                auVar255._4_4_ = uVar4;
                auVar255._0_4_ = uVar4;
                auVar255._8_4_ = uVar4;
                auVar255._12_4_ = uVar4;
                auVar255._16_4_ = uVar4;
                auVar255._20_4_ = uVar4;
                auVar255._24_4_ = uVar4;
                auVar255._28_4_ = uVar4;
                auVar255._32_4_ = uVar4;
                auVar255._36_4_ = uVar4;
                auVar255._40_4_ = uVar4;
                auVar255._44_4_ = uVar4;
                auVar255._48_4_ = uVar4;
                auVar255._52_4_ = uVar4;
                auVar255._56_4_ = uVar4;
                auVar255._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar255);
                uVar4 = puVar371[1];
                auVar256._4_4_ = uVar4;
                auVar256._0_4_ = uVar4;
                auVar256._8_4_ = uVar4;
                auVar256._12_4_ = uVar4;
                auVar256._16_4_ = uVar4;
                auVar256._20_4_ = uVar4;
                auVar256._24_4_ = uVar4;
                auVar256._28_4_ = uVar4;
                auVar256._32_4_ = uVar4;
                auVar256._36_4_ = uVar4;
                auVar256._40_4_ = uVar4;
                auVar256._44_4_ = uVar4;
                auVar256._48_4_ = uVar4;
                auVar256._52_4_ = uVar4;
                auVar256._56_4_ = uVar4;
                auVar256._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar256);
                uVar4 = puVar371[2];
                auVar257._4_4_ = uVar4;
                auVar257._0_4_ = uVar4;
                auVar257._8_4_ = uVar4;
                auVar257._12_4_ = uVar4;
                auVar257._16_4_ = uVar4;
                auVar257._20_4_ = uVar4;
                auVar257._24_4_ = uVar4;
                auVar257._28_4_ = uVar4;
                auVar257._32_4_ = uVar4;
                auVar257._36_4_ = uVar4;
                auVar257._40_4_ = uVar4;
                auVar257._44_4_ = uVar4;
                auVar257._48_4_ = uVar4;
                auVar257._52_4_ = uVar4;
                auVar257._56_4_ = uVar4;
                auVar257._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar257);
                uVar4 = puVar371[3];
                auVar258._4_4_ = uVar4;
                auVar258._0_4_ = uVar4;
                auVar258._8_4_ = uVar4;
                auVar258._12_4_ = uVar4;
                auVar258._16_4_ = uVar4;
                auVar258._20_4_ = uVar4;
                auVar258._24_4_ = uVar4;
                auVar258._28_4_ = uVar4;
                auVar258._32_4_ = uVar4;
                auVar258._36_4_ = uVar4;
                auVar258._40_4_ = uVar4;
                auVar258._44_4_ = uVar4;
                auVar258._48_4_ = uVar4;
                auVar258._52_4_ = uVar4;
                auVar258._56_4_ = uVar4;
                auVar258._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar258);
                uVar4 = puVar371[4];
                auVar259._4_4_ = uVar4;
                auVar259._0_4_ = uVar4;
                auVar259._8_4_ = uVar4;
                auVar259._12_4_ = uVar4;
                auVar259._16_4_ = uVar4;
                auVar259._20_4_ = uVar4;
                auVar259._24_4_ = uVar4;
                auVar259._28_4_ = uVar4;
                auVar259._32_4_ = uVar4;
                auVar259._36_4_ = uVar4;
                auVar259._40_4_ = uVar4;
                auVar259._44_4_ = uVar4;
                auVar259._48_4_ = uVar4;
                auVar259._52_4_ = uVar4;
                auVar259._56_4_ = uVar4;
                auVar259._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[4],auVar259);
                uVar4 = puVar371[5];
                auVar260._4_4_ = uVar4;
                auVar260._0_4_ = uVar4;
                auVar260._8_4_ = uVar4;
                auVar260._12_4_ = uVar4;
                auVar260._16_4_ = uVar4;
                auVar260._20_4_ = uVar4;
                auVar260._24_4_ = uVar4;
                auVar260._28_4_ = uVar4;
                auVar260._32_4_ = uVar4;
                auVar260._36_4_ = uVar4;
                auVar260._40_4_ = uVar4;
                auVar260._44_4_ = uVar4;
                auVar260._48_4_ = uVar4;
                auVar260._52_4_ = uVar4;
                auVar260._56_4_ = uVar4;
                auVar260._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar379[5],auVar260);
                uVar4 = puVar371[6];
                auVar261._4_4_ = uVar4;
                auVar261._0_4_ = uVar4;
                auVar261._8_4_ = uVar4;
                auVar261._12_4_ = uVar4;
                auVar261._16_4_ = uVar4;
                auVar261._20_4_ = uVar4;
                auVar261._24_4_ = uVar4;
                auVar261._28_4_ = uVar4;
                auVar261._32_4_ = uVar4;
                auVar261._36_4_ = uVar4;
                auVar261._40_4_ = uVar4;
                auVar261._44_4_ = uVar4;
                auVar261._48_4_ = uVar4;
                auVar261._52_4_ = uVar4;
                auVar261._56_4_ = uVar4;
                auVar261._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f(auVar467,pauVar379[6],auVar261);
                uVar4 = puVar371[7];
                auVar262._4_4_ = uVar4;
                auVar262._0_4_ = uVar4;
                auVar262._8_4_ = uVar4;
                auVar262._12_4_ = uVar4;
                auVar262._16_4_ = uVar4;
                auVar262._20_4_ = uVar4;
                auVar262._24_4_ = uVar4;
                auVar262._28_4_ = uVar4;
                auVar262._32_4_ = uVar4;
                auVar262._36_4_ = uVar4;
                auVar262._40_4_ = uVar4;
                auVar262._44_4_ = uVar4;
                auVar262._48_4_ = uVar4;
                auVar262._52_4_ = uVar4;
                auVar262._56_4_ = uVar4;
                auVar262._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(auVar468,pauVar379[7],auVar262);
                uVar4 = puVar371[8];
                auVar263._4_4_ = uVar4;
                auVar263._0_4_ = uVar4;
                auVar263._8_4_ = uVar4;
                auVar263._12_4_ = uVar4;
                auVar263._16_4_ = uVar4;
                auVar263._20_4_ = uVar4;
                auVar263._24_4_ = uVar4;
                auVar263._28_4_ = uVar4;
                auVar263._32_4_ = uVar4;
                auVar263._36_4_ = uVar4;
                auVar263._40_4_ = uVar4;
                auVar263._44_4_ = uVar4;
                auVar263._48_4_ = uVar4;
                auVar263._52_4_ = uVar4;
                auVar263._56_4_ = uVar4;
                auVar263._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,in_ZMM26,auVar263);
                uVar4 = puVar371[9];
                auVar264._4_4_ = uVar4;
                auVar264._0_4_ = uVar4;
                auVar264._8_4_ = uVar4;
                auVar264._12_4_ = uVar4;
                auVar264._16_4_ = uVar4;
                auVar264._20_4_ = uVar4;
                auVar264._24_4_ = uVar4;
                auVar264._28_4_ = uVar4;
                auVar264._32_4_ = uVar4;
                auVar264._36_4_ = uVar4;
                auVar264._40_4_ = uVar4;
                auVar264._44_4_ = uVar4;
                auVar264._48_4_ = uVar4;
                auVar264._52_4_ = uVar4;
                auVar264._56_4_ = uVar4;
                auVar264._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar379[9],auVar264);
                uVar4 = puVar371[10];
                auVar265._4_4_ = uVar4;
                auVar265._0_4_ = uVar4;
                auVar265._8_4_ = uVar4;
                auVar265._12_4_ = uVar4;
                auVar265._16_4_ = uVar4;
                auVar265._20_4_ = uVar4;
                auVar265._24_4_ = uVar4;
                auVar265._28_4_ = uVar4;
                auVar265._32_4_ = uVar4;
                auVar265._36_4_ = uVar4;
                auVar265._40_4_ = uVar4;
                auVar265._44_4_ = uVar4;
                auVar265._48_4_ = uVar4;
                auVar265._52_4_ = uVar4;
                auVar265._56_4_ = uVar4;
                auVar265._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f(auVar467,pauVar379[10],auVar265);
                uVar4 = puVar371[0xb];
                auVar266._4_4_ = uVar4;
                auVar266._0_4_ = uVar4;
                auVar266._8_4_ = uVar4;
                auVar266._12_4_ = uVar4;
                auVar266._16_4_ = uVar4;
                auVar266._20_4_ = uVar4;
                auVar266._24_4_ = uVar4;
                auVar266._28_4_ = uVar4;
                auVar266._32_4_ = uVar4;
                auVar266._36_4_ = uVar4;
                auVar266._40_4_ = uVar4;
                auVar266._44_4_ = uVar4;
                auVar266._48_4_ = uVar4;
                auVar266._52_4_ = uVar4;
                auVar266._56_4_ = uVar4;
                auVar266._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(auVar468,in_ZMM28,auVar266);
                uVar4 = puVar371[0xc];
                auVar267._4_4_ = uVar4;
                auVar267._0_4_ = uVar4;
                auVar267._8_4_ = uVar4;
                auVar267._12_4_ = uVar4;
                auVar267._16_4_ = uVar4;
                auVar267._20_4_ = uVar4;
                auVar267._24_4_ = uVar4;
                auVar267._28_4_ = uVar4;
                auVar267._32_4_ = uVar4;
                auVar267._36_4_ = uVar4;
                auVar267._40_4_ = uVar4;
                auVar267._44_4_ = uVar4;
                auVar267._48_4_ = uVar4;
                auVar267._52_4_ = uVar4;
                auVar267._56_4_ = uVar4;
                auVar267._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,in_ZMM31,auVar267);
                uVar4 = puVar371[0xd];
                auVar268._4_4_ = uVar4;
                auVar268._0_4_ = uVar4;
                auVar268._8_4_ = uVar4;
                auVar268._12_4_ = uVar4;
                auVar268._16_4_ = uVar4;
                auVar268._20_4_ = uVar4;
                auVar268._24_4_ = uVar4;
                auVar268._28_4_ = uVar4;
                auVar268._32_4_ = uVar4;
                auVar268._36_4_ = uVar4;
                auVar268._40_4_ = uVar4;
                auVar268._44_4_ = uVar4;
                auVar268._48_4_ = uVar4;
                auVar268._52_4_ = uVar4;
                auVar268._56_4_ = uVar4;
                auVar268._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar466,pauVar379[0xd],auVar268);
                uVar4 = puVar371[0xe];
                auVar269._4_4_ = uVar4;
                auVar269._0_4_ = uVar4;
                auVar269._8_4_ = uVar4;
                auVar269._12_4_ = uVar4;
                auVar269._16_4_ = uVar4;
                auVar269._20_4_ = uVar4;
                auVar269._24_4_ = uVar4;
                auVar269._28_4_ = uVar4;
                auVar269._32_4_ = uVar4;
                auVar269._36_4_ = uVar4;
                auVar269._40_4_ = uVar4;
                auVar269._44_4_ = uVar4;
                auVar269._48_4_ = uVar4;
                auVar269._52_4_ = uVar4;
                auVar269._56_4_ = uVar4;
                auVar269._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar467,pauVar379[0xe],auVar269);
                uVar4 = puVar371[0xf];
                auVar270._4_4_ = uVar4;
                auVar270._0_4_ = uVar4;
                auVar270._8_4_ = uVar4;
                auVar270._12_4_ = uVar4;
                auVar270._16_4_ = uVar4;
                auVar270._20_4_ = uVar4;
                auVar270._24_4_ = uVar4;
                auVar270._28_4_ = uVar4;
                auVar270._32_4_ = uVar4;
                auVar270._36_4_ = uVar4;
                auVar270._40_4_ = uVar4;
                auVar270._44_4_ = uVar4;
                auVar270._48_4_ = uVar4;
                auVar270._52_4_ = uVar4;
                auVar270._56_4_ = uVar4;
                auVar270._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar468,pauVar379[0xf],auVar270);
                pauVar379 = pauVar379 + 0x10;
                puVar371 = puVar371 + lVar415;
              }
              pauVar406 = pauVar406 + uVar419 * 0x10;
            }
            else {
              puVar371 = (undefined4 *)((long)local_188.data + lVar370 + (long)iVar363 * 4);
            }
            if (local_188.elempack == 8) {
              puVar375 = puVar371 + 7;
              uVar376 = uVar419;
              pauVar379 = pauVar406;
              while (iVar387 = (int)uVar376, uVar376 = (ulong)(iVar387 - 1), iVar387 != 0) {
                in_ZMM26 = pauVar379[0xc];
                in_ZMM28 = pauVar379[0xe];
                in_ZMM31 = pauVar379[0xf];
                uVar4 = puVar375[-7];
                auVar271._4_4_ = uVar4;
                auVar271._0_4_ = uVar4;
                auVar271._8_4_ = uVar4;
                auVar271._12_4_ = uVar4;
                auVar271._16_4_ = uVar4;
                auVar271._20_4_ = uVar4;
                auVar271._24_4_ = uVar4;
                auVar271._28_4_ = uVar4;
                auVar271._32_4_ = uVar4;
                auVar271._36_4_ = uVar4;
                auVar271._40_4_ = uVar4;
                auVar271._44_4_ = uVar4;
                auVar271._48_4_ = uVar4;
                auVar271._52_4_ = uVar4;
                auVar271._56_4_ = uVar4;
                auVar271._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar271);
                uVar4 = puVar375[-6];
                auVar272._4_4_ = uVar4;
                auVar272._0_4_ = uVar4;
                auVar272._8_4_ = uVar4;
                auVar272._12_4_ = uVar4;
                auVar272._16_4_ = uVar4;
                auVar272._20_4_ = uVar4;
                auVar272._24_4_ = uVar4;
                auVar272._28_4_ = uVar4;
                auVar272._32_4_ = uVar4;
                auVar272._36_4_ = uVar4;
                auVar272._40_4_ = uVar4;
                auVar272._44_4_ = uVar4;
                auVar272._48_4_ = uVar4;
                auVar272._52_4_ = uVar4;
                auVar272._56_4_ = uVar4;
                auVar272._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar272);
                uVar4 = puVar375[-5];
                auVar273._4_4_ = uVar4;
                auVar273._0_4_ = uVar4;
                auVar273._8_4_ = uVar4;
                auVar273._12_4_ = uVar4;
                auVar273._16_4_ = uVar4;
                auVar273._20_4_ = uVar4;
                auVar273._24_4_ = uVar4;
                auVar273._28_4_ = uVar4;
                auVar273._32_4_ = uVar4;
                auVar273._36_4_ = uVar4;
                auVar273._40_4_ = uVar4;
                auVar273._44_4_ = uVar4;
                auVar273._48_4_ = uVar4;
                auVar273._52_4_ = uVar4;
                auVar273._56_4_ = uVar4;
                auVar273._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar273);
                uVar4 = puVar375[-4];
                auVar274._4_4_ = uVar4;
                auVar274._0_4_ = uVar4;
                auVar274._8_4_ = uVar4;
                auVar274._12_4_ = uVar4;
                auVar274._16_4_ = uVar4;
                auVar274._20_4_ = uVar4;
                auVar274._24_4_ = uVar4;
                auVar274._28_4_ = uVar4;
                auVar274._32_4_ = uVar4;
                auVar274._36_4_ = uVar4;
                auVar274._40_4_ = uVar4;
                auVar274._44_4_ = uVar4;
                auVar274._48_4_ = uVar4;
                auVar274._52_4_ = uVar4;
                auVar274._56_4_ = uVar4;
                auVar274._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar274);
                uVar4 = puVar375[-3];
                auVar275._4_4_ = uVar4;
                auVar275._0_4_ = uVar4;
                auVar275._8_4_ = uVar4;
                auVar275._12_4_ = uVar4;
                auVar275._16_4_ = uVar4;
                auVar275._20_4_ = uVar4;
                auVar275._24_4_ = uVar4;
                auVar275._28_4_ = uVar4;
                auVar275._32_4_ = uVar4;
                auVar275._36_4_ = uVar4;
                auVar275._40_4_ = uVar4;
                auVar275._44_4_ = uVar4;
                auVar275._48_4_ = uVar4;
                auVar275._52_4_ = uVar4;
                auVar275._56_4_ = uVar4;
                auVar275._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[4],auVar275);
                uVar4 = puVar375[-2];
                auVar276._4_4_ = uVar4;
                auVar276._0_4_ = uVar4;
                auVar276._8_4_ = uVar4;
                auVar276._12_4_ = uVar4;
                auVar276._16_4_ = uVar4;
                auVar276._20_4_ = uVar4;
                auVar276._24_4_ = uVar4;
                auVar276._28_4_ = uVar4;
                auVar276._32_4_ = uVar4;
                auVar276._36_4_ = uVar4;
                auVar276._40_4_ = uVar4;
                auVar276._44_4_ = uVar4;
                auVar276._48_4_ = uVar4;
                auVar276._52_4_ = uVar4;
                auVar276._56_4_ = uVar4;
                auVar276._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar379[5],auVar276);
                uVar4 = puVar375[-1];
                auVar277._4_4_ = uVar4;
                auVar277._0_4_ = uVar4;
                auVar277._8_4_ = uVar4;
                auVar277._12_4_ = uVar4;
                auVar277._16_4_ = uVar4;
                auVar277._20_4_ = uVar4;
                auVar277._24_4_ = uVar4;
                auVar277._28_4_ = uVar4;
                auVar277._32_4_ = uVar4;
                auVar277._36_4_ = uVar4;
                auVar277._40_4_ = uVar4;
                auVar277._44_4_ = uVar4;
                auVar277._48_4_ = uVar4;
                auVar277._52_4_ = uVar4;
                auVar277._56_4_ = uVar4;
                auVar277._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f(auVar467,pauVar379[6],auVar277);
                uVar4 = *puVar375;
                auVar278._4_4_ = uVar4;
                auVar278._0_4_ = uVar4;
                auVar278._8_4_ = uVar4;
                auVar278._12_4_ = uVar4;
                auVar278._16_4_ = uVar4;
                auVar278._20_4_ = uVar4;
                auVar278._24_4_ = uVar4;
                auVar278._28_4_ = uVar4;
                auVar278._32_4_ = uVar4;
                auVar278._36_4_ = uVar4;
                auVar278._40_4_ = uVar4;
                auVar278._44_4_ = uVar4;
                auVar278._48_4_ = uVar4;
                auVar278._52_4_ = uVar4;
                auVar278._56_4_ = uVar4;
                auVar278._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(auVar468,pauVar379[7],auVar278);
                uVar4 = puVar375[lVar397 + -7];
                auVar279._4_4_ = uVar4;
                auVar279._0_4_ = uVar4;
                auVar279._8_4_ = uVar4;
                auVar279._12_4_ = uVar4;
                auVar279._16_4_ = uVar4;
                auVar279._20_4_ = uVar4;
                auVar279._24_4_ = uVar4;
                auVar279._28_4_ = uVar4;
                auVar279._32_4_ = uVar4;
                auVar279._36_4_ = uVar4;
                auVar279._40_4_ = uVar4;
                auVar279._44_4_ = uVar4;
                auVar279._48_4_ = uVar4;
                auVar279._52_4_ = uVar4;
                auVar279._56_4_ = uVar4;
                auVar279._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[8],auVar279);
                uVar4 = puVar375[lVar397 + -6];
                auVar280._4_4_ = uVar4;
                auVar280._0_4_ = uVar4;
                auVar280._8_4_ = uVar4;
                auVar280._12_4_ = uVar4;
                auVar280._16_4_ = uVar4;
                auVar280._20_4_ = uVar4;
                auVar280._24_4_ = uVar4;
                auVar280._28_4_ = uVar4;
                auVar280._32_4_ = uVar4;
                auVar280._36_4_ = uVar4;
                auVar280._40_4_ = uVar4;
                auVar280._44_4_ = uVar4;
                auVar280._48_4_ = uVar4;
                auVar280._52_4_ = uVar4;
                auVar280._56_4_ = uVar4;
                auVar280._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar379[9],auVar280);
                uVar4 = puVar375[lVar397 + -5];
                auVar281._4_4_ = uVar4;
                auVar281._0_4_ = uVar4;
                auVar281._8_4_ = uVar4;
                auVar281._12_4_ = uVar4;
                auVar281._16_4_ = uVar4;
                auVar281._20_4_ = uVar4;
                auVar281._24_4_ = uVar4;
                auVar281._28_4_ = uVar4;
                auVar281._32_4_ = uVar4;
                auVar281._36_4_ = uVar4;
                auVar281._40_4_ = uVar4;
                auVar281._44_4_ = uVar4;
                auVar281._48_4_ = uVar4;
                auVar281._52_4_ = uVar4;
                auVar281._56_4_ = uVar4;
                auVar281._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f(auVar467,pauVar379[10],auVar281);
                uVar4 = puVar375[lVar397 + -4];
                auVar282._4_4_ = uVar4;
                auVar282._0_4_ = uVar4;
                auVar282._8_4_ = uVar4;
                auVar282._12_4_ = uVar4;
                auVar282._16_4_ = uVar4;
                auVar282._20_4_ = uVar4;
                auVar282._24_4_ = uVar4;
                auVar282._28_4_ = uVar4;
                auVar282._32_4_ = uVar4;
                auVar282._36_4_ = uVar4;
                auVar282._40_4_ = uVar4;
                auVar282._44_4_ = uVar4;
                auVar282._48_4_ = uVar4;
                auVar282._52_4_ = uVar4;
                auVar282._56_4_ = uVar4;
                auVar282._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(auVar468,pauVar379[0xb],auVar282);
                uVar4 = puVar375[lVar397 + -3];
                auVar283._4_4_ = uVar4;
                auVar283._0_4_ = uVar4;
                auVar283._8_4_ = uVar4;
                auVar283._12_4_ = uVar4;
                auVar283._16_4_ = uVar4;
                auVar283._20_4_ = uVar4;
                auVar283._24_4_ = uVar4;
                auVar283._28_4_ = uVar4;
                auVar283._32_4_ = uVar4;
                auVar283._36_4_ = uVar4;
                auVar283._40_4_ = uVar4;
                auVar283._44_4_ = uVar4;
                auVar283._48_4_ = uVar4;
                auVar283._52_4_ = uVar4;
                auVar283._56_4_ = uVar4;
                auVar283._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,in_ZMM26,auVar283);
                uVar4 = puVar375[lVar397 + -2];
                auVar284._4_4_ = uVar4;
                auVar284._0_4_ = uVar4;
                auVar284._8_4_ = uVar4;
                auVar284._12_4_ = uVar4;
                auVar284._16_4_ = uVar4;
                auVar284._20_4_ = uVar4;
                auVar284._24_4_ = uVar4;
                auVar284._28_4_ = uVar4;
                auVar284._32_4_ = uVar4;
                auVar284._36_4_ = uVar4;
                auVar284._40_4_ = uVar4;
                auVar284._44_4_ = uVar4;
                auVar284._48_4_ = uVar4;
                auVar284._52_4_ = uVar4;
                auVar284._56_4_ = uVar4;
                auVar284._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar466,pauVar379[0xd],auVar284);
                uVar4 = puVar375[lVar397 + -1];
                auVar285._4_4_ = uVar4;
                auVar285._0_4_ = uVar4;
                auVar285._8_4_ = uVar4;
                auVar285._12_4_ = uVar4;
                auVar285._16_4_ = uVar4;
                auVar285._20_4_ = uVar4;
                auVar285._24_4_ = uVar4;
                auVar285._28_4_ = uVar4;
                auVar285._32_4_ = uVar4;
                auVar285._36_4_ = uVar4;
                auVar285._40_4_ = uVar4;
                auVar285._44_4_ = uVar4;
                auVar285._48_4_ = uVar4;
                auVar285._52_4_ = uVar4;
                auVar285._56_4_ = uVar4;
                auVar285._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar467,in_ZMM28,auVar285);
                uVar4 = puVar375[lVar397];
                auVar286._4_4_ = uVar4;
                auVar286._0_4_ = uVar4;
                auVar286._8_4_ = uVar4;
                auVar286._12_4_ = uVar4;
                auVar286._16_4_ = uVar4;
                auVar286._20_4_ = uVar4;
                auVar286._24_4_ = uVar4;
                auVar286._28_4_ = uVar4;
                auVar286._32_4_ = uVar4;
                auVar286._36_4_ = uVar4;
                auVar286._40_4_ = uVar4;
                auVar286._44_4_ = uVar4;
                auVar286._48_4_ = uVar4;
                auVar286._52_4_ = uVar4;
                auVar286._56_4_ = uVar4;
                auVar286._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar468,in_ZMM31,auVar286);
                pauVar379 = pauVar379 + 0x10;
                puVar375 = puVar375 + lVar390;
              }
              pauVar406 = pauVar406 + uVar419 * 0x10;
              puVar371 = puVar371 + lVar390 * uVar419;
            }
            if (local_188.elempack == 4) {
              puVar375 = puVar371 + 3;
              uVar376 = uVar419;
              pauVar379 = pauVar406;
              while (iVar387 = (int)uVar376, uVar376 = (ulong)(iVar387 - 1), iVar387 != 0) {
                in_ZMM26 = pauVar379[0xc];
                in_ZMM28 = pauVar379[0xe];
                in_ZMM31 = pauVar379[0xf];
                uVar4 = puVar375[-3];
                auVar287._4_4_ = uVar4;
                auVar287._0_4_ = uVar4;
                auVar287._8_4_ = uVar4;
                auVar287._12_4_ = uVar4;
                auVar287._16_4_ = uVar4;
                auVar287._20_4_ = uVar4;
                auVar287._24_4_ = uVar4;
                auVar287._28_4_ = uVar4;
                auVar287._32_4_ = uVar4;
                auVar287._36_4_ = uVar4;
                auVar287._40_4_ = uVar4;
                auVar287._44_4_ = uVar4;
                auVar287._48_4_ = uVar4;
                auVar287._52_4_ = uVar4;
                auVar287._56_4_ = uVar4;
                auVar287._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar287);
                uVar4 = puVar375[-2];
                auVar288._4_4_ = uVar4;
                auVar288._0_4_ = uVar4;
                auVar288._8_4_ = uVar4;
                auVar288._12_4_ = uVar4;
                auVar288._16_4_ = uVar4;
                auVar288._20_4_ = uVar4;
                auVar288._24_4_ = uVar4;
                auVar288._28_4_ = uVar4;
                auVar288._32_4_ = uVar4;
                auVar288._36_4_ = uVar4;
                auVar288._40_4_ = uVar4;
                auVar288._44_4_ = uVar4;
                auVar288._48_4_ = uVar4;
                auVar288._52_4_ = uVar4;
                auVar288._56_4_ = uVar4;
                auVar288._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar288);
                uVar4 = puVar375[-1];
                auVar289._4_4_ = uVar4;
                auVar289._0_4_ = uVar4;
                auVar289._8_4_ = uVar4;
                auVar289._12_4_ = uVar4;
                auVar289._16_4_ = uVar4;
                auVar289._20_4_ = uVar4;
                auVar289._24_4_ = uVar4;
                auVar289._28_4_ = uVar4;
                auVar289._32_4_ = uVar4;
                auVar289._36_4_ = uVar4;
                auVar289._40_4_ = uVar4;
                auVar289._44_4_ = uVar4;
                auVar289._48_4_ = uVar4;
                auVar289._52_4_ = uVar4;
                auVar289._56_4_ = uVar4;
                auVar289._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar289);
                uVar4 = *puVar375;
                auVar290._4_4_ = uVar4;
                auVar290._0_4_ = uVar4;
                auVar290._8_4_ = uVar4;
                auVar290._12_4_ = uVar4;
                auVar290._16_4_ = uVar4;
                auVar290._20_4_ = uVar4;
                auVar290._24_4_ = uVar4;
                auVar290._28_4_ = uVar4;
                auVar290._32_4_ = uVar4;
                auVar290._36_4_ = uVar4;
                auVar290._40_4_ = uVar4;
                auVar290._44_4_ = uVar4;
                auVar290._48_4_ = uVar4;
                auVar290._52_4_ = uVar4;
                auVar290._56_4_ = uVar4;
                auVar290._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar290);
                uVar4 = puVar375[lVar397 + -3];
                auVar291._4_4_ = uVar4;
                auVar291._0_4_ = uVar4;
                auVar291._8_4_ = uVar4;
                auVar291._12_4_ = uVar4;
                auVar291._16_4_ = uVar4;
                auVar291._20_4_ = uVar4;
                auVar291._24_4_ = uVar4;
                auVar291._28_4_ = uVar4;
                auVar291._32_4_ = uVar4;
                auVar291._36_4_ = uVar4;
                auVar291._40_4_ = uVar4;
                auVar291._44_4_ = uVar4;
                auVar291._48_4_ = uVar4;
                auVar291._52_4_ = uVar4;
                auVar291._56_4_ = uVar4;
                auVar291._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[4],auVar291);
                uVar4 = puVar375[lVar397 + -2];
                auVar292._4_4_ = uVar4;
                auVar292._0_4_ = uVar4;
                auVar292._8_4_ = uVar4;
                auVar292._12_4_ = uVar4;
                auVar292._16_4_ = uVar4;
                auVar292._20_4_ = uVar4;
                auVar292._24_4_ = uVar4;
                auVar292._28_4_ = uVar4;
                auVar292._32_4_ = uVar4;
                auVar292._36_4_ = uVar4;
                auVar292._40_4_ = uVar4;
                auVar292._44_4_ = uVar4;
                auVar292._48_4_ = uVar4;
                auVar292._52_4_ = uVar4;
                auVar292._56_4_ = uVar4;
                auVar292._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar379[5],auVar292);
                uVar4 = puVar375[lVar397 + -1];
                auVar293._4_4_ = uVar4;
                auVar293._0_4_ = uVar4;
                auVar293._8_4_ = uVar4;
                auVar293._12_4_ = uVar4;
                auVar293._16_4_ = uVar4;
                auVar293._20_4_ = uVar4;
                auVar293._24_4_ = uVar4;
                auVar293._28_4_ = uVar4;
                auVar293._32_4_ = uVar4;
                auVar293._36_4_ = uVar4;
                auVar293._40_4_ = uVar4;
                auVar293._44_4_ = uVar4;
                auVar293._48_4_ = uVar4;
                auVar293._52_4_ = uVar4;
                auVar293._56_4_ = uVar4;
                auVar293._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f(auVar467,pauVar379[6],auVar293);
                uVar4 = puVar375[lVar397];
                auVar294._4_4_ = uVar4;
                auVar294._0_4_ = uVar4;
                auVar294._8_4_ = uVar4;
                auVar294._12_4_ = uVar4;
                auVar294._16_4_ = uVar4;
                auVar294._20_4_ = uVar4;
                auVar294._24_4_ = uVar4;
                auVar294._28_4_ = uVar4;
                auVar294._32_4_ = uVar4;
                auVar294._36_4_ = uVar4;
                auVar294._40_4_ = uVar4;
                auVar294._44_4_ = uVar4;
                auVar294._48_4_ = uVar4;
                auVar294._52_4_ = uVar4;
                auVar294._56_4_ = uVar4;
                auVar294._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(auVar468,pauVar379[7],auVar294);
                uVar4 = puVar375[lVar385 + -3];
                auVar295._4_4_ = uVar4;
                auVar295._0_4_ = uVar4;
                auVar295._8_4_ = uVar4;
                auVar295._12_4_ = uVar4;
                auVar295._16_4_ = uVar4;
                auVar295._20_4_ = uVar4;
                auVar295._24_4_ = uVar4;
                auVar295._28_4_ = uVar4;
                auVar295._32_4_ = uVar4;
                auVar295._36_4_ = uVar4;
                auVar295._40_4_ = uVar4;
                auVar295._44_4_ = uVar4;
                auVar295._48_4_ = uVar4;
                auVar295._52_4_ = uVar4;
                auVar295._56_4_ = uVar4;
                auVar295._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[8],auVar295);
                uVar4 = puVar375[lVar385 + -2];
                auVar296._4_4_ = uVar4;
                auVar296._0_4_ = uVar4;
                auVar296._8_4_ = uVar4;
                auVar296._12_4_ = uVar4;
                auVar296._16_4_ = uVar4;
                auVar296._20_4_ = uVar4;
                auVar296._24_4_ = uVar4;
                auVar296._28_4_ = uVar4;
                auVar296._32_4_ = uVar4;
                auVar296._36_4_ = uVar4;
                auVar296._40_4_ = uVar4;
                auVar296._44_4_ = uVar4;
                auVar296._48_4_ = uVar4;
                auVar296._52_4_ = uVar4;
                auVar296._56_4_ = uVar4;
                auVar296._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar379[9],auVar296);
                uVar4 = puVar375[lVar385 + -1];
                auVar297._4_4_ = uVar4;
                auVar297._0_4_ = uVar4;
                auVar297._8_4_ = uVar4;
                auVar297._12_4_ = uVar4;
                auVar297._16_4_ = uVar4;
                auVar297._20_4_ = uVar4;
                auVar297._24_4_ = uVar4;
                auVar297._28_4_ = uVar4;
                auVar297._32_4_ = uVar4;
                auVar297._36_4_ = uVar4;
                auVar297._40_4_ = uVar4;
                auVar297._44_4_ = uVar4;
                auVar297._48_4_ = uVar4;
                auVar297._52_4_ = uVar4;
                auVar297._56_4_ = uVar4;
                auVar297._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f(auVar467,pauVar379[10],auVar297);
                uVar4 = puVar375[lVar385];
                auVar298._4_4_ = uVar4;
                auVar298._0_4_ = uVar4;
                auVar298._8_4_ = uVar4;
                auVar298._12_4_ = uVar4;
                auVar298._16_4_ = uVar4;
                auVar298._20_4_ = uVar4;
                auVar298._24_4_ = uVar4;
                auVar298._28_4_ = uVar4;
                auVar298._32_4_ = uVar4;
                auVar298._36_4_ = uVar4;
                auVar298._40_4_ = uVar4;
                auVar298._44_4_ = uVar4;
                auVar298._48_4_ = uVar4;
                auVar298._52_4_ = uVar4;
                auVar298._56_4_ = uVar4;
                auVar298._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(auVar468,pauVar379[0xb],auVar298);
                uVar4 = puVar375[lVar416 + -3];
                auVar299._4_4_ = uVar4;
                auVar299._0_4_ = uVar4;
                auVar299._8_4_ = uVar4;
                auVar299._12_4_ = uVar4;
                auVar299._16_4_ = uVar4;
                auVar299._20_4_ = uVar4;
                auVar299._24_4_ = uVar4;
                auVar299._28_4_ = uVar4;
                auVar299._32_4_ = uVar4;
                auVar299._36_4_ = uVar4;
                auVar299._40_4_ = uVar4;
                auVar299._44_4_ = uVar4;
                auVar299._48_4_ = uVar4;
                auVar299._52_4_ = uVar4;
                auVar299._56_4_ = uVar4;
                auVar299._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,in_ZMM26,auVar299);
                uVar4 = puVar375[lVar416 + -2];
                auVar300._4_4_ = uVar4;
                auVar300._0_4_ = uVar4;
                auVar300._8_4_ = uVar4;
                auVar300._12_4_ = uVar4;
                auVar300._16_4_ = uVar4;
                auVar300._20_4_ = uVar4;
                auVar300._24_4_ = uVar4;
                auVar300._28_4_ = uVar4;
                auVar300._32_4_ = uVar4;
                auVar300._36_4_ = uVar4;
                auVar300._40_4_ = uVar4;
                auVar300._44_4_ = uVar4;
                auVar300._48_4_ = uVar4;
                auVar300._52_4_ = uVar4;
                auVar300._56_4_ = uVar4;
                auVar300._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar466,pauVar379[0xd],auVar300);
                uVar4 = puVar375[lVar416 + -1];
                auVar301._4_4_ = uVar4;
                auVar301._0_4_ = uVar4;
                auVar301._8_4_ = uVar4;
                auVar301._12_4_ = uVar4;
                auVar301._16_4_ = uVar4;
                auVar301._20_4_ = uVar4;
                auVar301._24_4_ = uVar4;
                auVar301._28_4_ = uVar4;
                auVar301._32_4_ = uVar4;
                auVar301._36_4_ = uVar4;
                auVar301._40_4_ = uVar4;
                auVar301._44_4_ = uVar4;
                auVar301._48_4_ = uVar4;
                auVar301._52_4_ = uVar4;
                auVar301._56_4_ = uVar4;
                auVar301._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar467,in_ZMM28,auVar301);
                uVar4 = puVar375[lVar416];
                auVar302._4_4_ = uVar4;
                auVar302._0_4_ = uVar4;
                auVar302._8_4_ = uVar4;
                auVar302._12_4_ = uVar4;
                auVar302._16_4_ = uVar4;
                auVar302._20_4_ = uVar4;
                auVar302._24_4_ = uVar4;
                auVar302._28_4_ = uVar4;
                auVar302._32_4_ = uVar4;
                auVar302._36_4_ = uVar4;
                auVar302._40_4_ = uVar4;
                auVar302._44_4_ = uVar4;
                auVar302._48_4_ = uVar4;
                auVar302._52_4_ = uVar4;
                auVar302._56_4_ = uVar4;
                auVar302._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar468,in_ZMM31,auVar302);
                pauVar379 = pauVar379 + 0x10;
                puVar375 = puVar375 + lVar422;
              }
              pauVar406 = pauVar406 + uVar419 * 0x10;
              puVar371 = puVar371 + lVar422 * uVar419;
            }
            uVar376 = uVar419;
            pauVar379 = pauVar406;
            if (local_188.elempack == 1) {
              while ((int)uVar376 != 0) {
                in_ZMM26 = pauVar379[0xc];
                in_ZMM28 = pauVar379[0xe];
                in_ZMM31 = pauVar379[0xf];
                uVar4 = *puVar371;
                auVar303._4_4_ = uVar4;
                auVar303._0_4_ = uVar4;
                auVar303._8_4_ = uVar4;
                auVar303._12_4_ = uVar4;
                auVar303._16_4_ = uVar4;
                auVar303._20_4_ = uVar4;
                auVar303._24_4_ = uVar4;
                auVar303._28_4_ = uVar4;
                auVar303._32_4_ = uVar4;
                auVar303._36_4_ = uVar4;
                auVar303._40_4_ = uVar4;
                auVar303._44_4_ = uVar4;
                auVar303._48_4_ = uVar4;
                auVar303._52_4_ = uVar4;
                auVar303._56_4_ = uVar4;
                auVar303._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar303);
                uVar4 = puVar371[lVar397];
                auVar304._4_4_ = uVar4;
                auVar304._0_4_ = uVar4;
                auVar304._8_4_ = uVar4;
                auVar304._12_4_ = uVar4;
                auVar304._16_4_ = uVar4;
                auVar304._20_4_ = uVar4;
                auVar304._24_4_ = uVar4;
                auVar304._28_4_ = uVar4;
                auVar304._32_4_ = uVar4;
                auVar304._36_4_ = uVar4;
                auVar304._40_4_ = uVar4;
                auVar304._44_4_ = uVar4;
                auVar304._48_4_ = uVar4;
                auVar304._52_4_ = uVar4;
                auVar304._56_4_ = uVar4;
                auVar304._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar304);
                uVar4 = puVar371[lVar385];
                auVar305._4_4_ = uVar4;
                auVar305._0_4_ = uVar4;
                auVar305._8_4_ = uVar4;
                auVar305._12_4_ = uVar4;
                auVar305._16_4_ = uVar4;
                auVar305._20_4_ = uVar4;
                auVar305._24_4_ = uVar4;
                auVar305._28_4_ = uVar4;
                auVar305._32_4_ = uVar4;
                auVar305._36_4_ = uVar4;
                auVar305._40_4_ = uVar4;
                auVar305._44_4_ = uVar4;
                auVar305._48_4_ = uVar4;
                auVar305._52_4_ = uVar4;
                auVar305._56_4_ = uVar4;
                auVar305._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar305);
                uVar4 = puVar371[lVar416];
                auVar306._4_4_ = uVar4;
                auVar306._0_4_ = uVar4;
                auVar306._8_4_ = uVar4;
                auVar306._12_4_ = uVar4;
                auVar306._16_4_ = uVar4;
                auVar306._20_4_ = uVar4;
                auVar306._24_4_ = uVar4;
                auVar306._28_4_ = uVar4;
                auVar306._32_4_ = uVar4;
                auVar306._36_4_ = uVar4;
                auVar306._40_4_ = uVar4;
                auVar306._44_4_ = uVar4;
                auVar306._48_4_ = uVar4;
                auVar306._52_4_ = uVar4;
                auVar306._56_4_ = uVar4;
                auVar306._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar306);
                uVar4 = puVar371[auVar461._16_8_];
                auVar307._4_4_ = uVar4;
                auVar307._0_4_ = uVar4;
                auVar307._8_4_ = uVar4;
                auVar307._12_4_ = uVar4;
                auVar307._16_4_ = uVar4;
                auVar307._20_4_ = uVar4;
                auVar307._24_4_ = uVar4;
                auVar307._28_4_ = uVar4;
                auVar307._32_4_ = uVar4;
                auVar307._36_4_ = uVar4;
                auVar307._40_4_ = uVar4;
                auVar307._44_4_ = uVar4;
                auVar307._48_4_ = uVar4;
                auVar307._52_4_ = uVar4;
                auVar307._56_4_ = uVar4;
                auVar307._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[4],auVar307);
                uVar4 = puVar371[lVar412];
                auVar308._4_4_ = uVar4;
                auVar308._0_4_ = uVar4;
                auVar308._8_4_ = uVar4;
                auVar308._12_4_ = uVar4;
                auVar308._16_4_ = uVar4;
                auVar308._20_4_ = uVar4;
                auVar308._24_4_ = uVar4;
                auVar308._28_4_ = uVar4;
                auVar308._32_4_ = uVar4;
                auVar308._36_4_ = uVar4;
                auVar308._40_4_ = uVar4;
                auVar308._44_4_ = uVar4;
                auVar308._48_4_ = uVar4;
                auVar308._52_4_ = uVar4;
                auVar308._56_4_ = uVar4;
                auVar308._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar379[5],auVar308);
                uVar4 = puVar371[lVar528];
                auVar309._4_4_ = uVar4;
                auVar309._0_4_ = uVar4;
                auVar309._8_4_ = uVar4;
                auVar309._12_4_ = uVar4;
                auVar309._16_4_ = uVar4;
                auVar309._20_4_ = uVar4;
                auVar309._24_4_ = uVar4;
                auVar309._28_4_ = uVar4;
                auVar309._32_4_ = uVar4;
                auVar309._36_4_ = uVar4;
                auVar309._40_4_ = uVar4;
                auVar309._44_4_ = uVar4;
                auVar309._48_4_ = uVar4;
                auVar309._52_4_ = uVar4;
                auVar309._56_4_ = uVar4;
                auVar309._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f(auVar467,pauVar379[6],auVar309);
                uVar4 = puVar371[lVar9];
                auVar310._4_4_ = uVar4;
                auVar310._0_4_ = uVar4;
                auVar310._8_4_ = uVar4;
                auVar310._12_4_ = uVar4;
                auVar310._16_4_ = uVar4;
                auVar310._20_4_ = uVar4;
                auVar310._24_4_ = uVar4;
                auVar310._28_4_ = uVar4;
                auVar310._32_4_ = uVar4;
                auVar310._36_4_ = uVar4;
                auVar310._40_4_ = uVar4;
                auVar310._44_4_ = uVar4;
                auVar310._48_4_ = uVar4;
                auVar310._52_4_ = uVar4;
                auVar310._56_4_ = uVar4;
                auVar310._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(auVar468,pauVar379[7],auVar310);
                uVar4 = puVar371[lVar529];
                auVar311._4_4_ = uVar4;
                auVar311._0_4_ = uVar4;
                auVar311._8_4_ = uVar4;
                auVar311._12_4_ = uVar4;
                auVar311._16_4_ = uVar4;
                auVar311._20_4_ = uVar4;
                auVar311._24_4_ = uVar4;
                auVar311._28_4_ = uVar4;
                auVar311._32_4_ = uVar4;
                auVar311._36_4_ = uVar4;
                auVar311._40_4_ = uVar4;
                auVar311._44_4_ = uVar4;
                auVar311._48_4_ = uVar4;
                auVar311._52_4_ = uVar4;
                auVar311._56_4_ = uVar4;
                auVar311._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[8],auVar311);
                uVar4 = puVar371[lVar386];
                auVar312._4_4_ = uVar4;
                auVar312._0_4_ = uVar4;
                auVar312._8_4_ = uVar4;
                auVar312._12_4_ = uVar4;
                auVar312._16_4_ = uVar4;
                auVar312._20_4_ = uVar4;
                auVar312._24_4_ = uVar4;
                auVar312._28_4_ = uVar4;
                auVar312._32_4_ = uVar4;
                auVar312._36_4_ = uVar4;
                auVar312._40_4_ = uVar4;
                auVar312._44_4_ = uVar4;
                auVar312._48_4_ = uVar4;
                auVar312._52_4_ = uVar4;
                auVar312._56_4_ = uVar4;
                auVar312._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar466,pauVar379[9],auVar312);
                uVar4 = puVar371[lVar496];
                auVar313._4_4_ = uVar4;
                auVar313._0_4_ = uVar4;
                auVar313._8_4_ = uVar4;
                auVar313._12_4_ = uVar4;
                auVar313._16_4_ = uVar4;
                auVar313._20_4_ = uVar4;
                auVar313._24_4_ = uVar4;
                auVar313._28_4_ = uVar4;
                auVar313._32_4_ = uVar4;
                auVar313._36_4_ = uVar4;
                auVar313._40_4_ = uVar4;
                auVar313._44_4_ = uVar4;
                auVar313._48_4_ = uVar4;
                auVar313._52_4_ = uVar4;
                auVar313._56_4_ = uVar4;
                auVar313._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f(auVar467,pauVar379[10],auVar313);
                uVar4 = puVar371[lVar372];
                auVar314._4_4_ = uVar4;
                auVar314._0_4_ = uVar4;
                auVar314._8_4_ = uVar4;
                auVar314._12_4_ = uVar4;
                auVar314._16_4_ = uVar4;
                auVar314._20_4_ = uVar4;
                auVar314._24_4_ = uVar4;
                auVar314._28_4_ = uVar4;
                auVar314._32_4_ = uVar4;
                auVar314._36_4_ = uVar4;
                auVar314._40_4_ = uVar4;
                auVar314._44_4_ = uVar4;
                auVar314._48_4_ = uVar4;
                auVar314._52_4_ = uVar4;
                auVar314._56_4_ = uVar4;
                auVar314._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(auVar468,pauVar379[0xb],auVar314);
                uVar4 = puVar371[lVar530];
                auVar315._4_4_ = uVar4;
                auVar315._0_4_ = uVar4;
                auVar315._8_4_ = uVar4;
                auVar315._12_4_ = uVar4;
                auVar315._16_4_ = uVar4;
                auVar315._20_4_ = uVar4;
                auVar315._24_4_ = uVar4;
                auVar315._28_4_ = uVar4;
                auVar315._32_4_ = uVar4;
                auVar315._36_4_ = uVar4;
                auVar315._40_4_ = uVar4;
                auVar315._44_4_ = uVar4;
                auVar315._48_4_ = uVar4;
                auVar315._52_4_ = uVar4;
                auVar315._56_4_ = uVar4;
                auVar315._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,in_ZMM26,auVar315);
                uVar4 = puVar371[lVar378];
                auVar316._4_4_ = uVar4;
                auVar316._0_4_ = uVar4;
                auVar316._8_4_ = uVar4;
                auVar316._12_4_ = uVar4;
                auVar316._16_4_ = uVar4;
                auVar316._20_4_ = uVar4;
                auVar316._24_4_ = uVar4;
                auVar316._28_4_ = uVar4;
                auVar316._32_4_ = uVar4;
                auVar316._36_4_ = uVar4;
                auVar316._40_4_ = uVar4;
                auVar316._44_4_ = uVar4;
                auVar316._48_4_ = uVar4;
                auVar316._52_4_ = uVar4;
                auVar316._56_4_ = uVar4;
                auVar316._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar466,pauVar379[0xd],auVar316);
                uVar4 = puVar371[lVar365];
                auVar317._4_4_ = uVar4;
                auVar317._0_4_ = uVar4;
                auVar317._8_4_ = uVar4;
                auVar317._12_4_ = uVar4;
                auVar317._16_4_ = uVar4;
                auVar317._20_4_ = uVar4;
                auVar317._24_4_ = uVar4;
                auVar317._28_4_ = uVar4;
                auVar317._32_4_ = uVar4;
                auVar317._36_4_ = uVar4;
                auVar317._40_4_ = uVar4;
                auVar317._44_4_ = uVar4;
                auVar317._48_4_ = uVar4;
                auVar317._52_4_ = uVar4;
                auVar317._56_4_ = uVar4;
                auVar317._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar467,in_ZMM28,auVar317);
                uVar4 = puVar371[lVar366];
                auVar318._4_4_ = uVar4;
                auVar318._0_4_ = uVar4;
                auVar318._8_4_ = uVar4;
                auVar318._12_4_ = uVar4;
                auVar318._16_4_ = uVar4;
                auVar318._20_4_ = uVar4;
                auVar318._24_4_ = uVar4;
                auVar318._28_4_ = uVar4;
                auVar318._32_4_ = uVar4;
                auVar318._36_4_ = uVar4;
                auVar318._40_4_ = uVar4;
                auVar318._44_4_ = uVar4;
                auVar318._48_4_ = uVar4;
                auVar318._52_4_ = uVar4;
                auVar318._56_4_ = uVar4;
                auVar318._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar468,in_ZMM31,auVar318);
                puVar371 = puVar371 + lVar398;
                uVar376 = (ulong)((int)uVar376 - 1);
                pauVar379 = pauVar379 + 0x10;
              }
              pauVar406 = pauVar406 + uVar419 * 0x10;
            }
            uVar392 = uVar392 + 0x10;
            lVar420 = lVar420 + lVar391 * 0x10;
            puVar425 = puVar425 + lVar391 * 4;
          }
          for (; (int)((uint)uVar392 | 7) < local_360; uVar392 = uVar392 + 8) {
            lVar370 = (int)((long)((ulong)(uint)((int)(uint)uVar392 >> 0x1f) << 0x20 |
                                  uVar392 & 0xffffffff) / (long)local_188.elempack) * lVar391;
            if (local_188.elempack == 8) {
              puVar371 = (undefined4 *)((long)local_188.data + lVar370 + (long)iVar404 * 4);
              uVar376 = uVar419;
              pauVar379 = pauVar406;
              while (iVar387 = (int)uVar376, uVar376 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = *puVar371;
                auVar466._4_4_ = uVar4;
                auVar466._0_4_ = uVar4;
                auVar466._8_4_ = uVar4;
                auVar466._12_4_ = uVar4;
                auVar466._16_4_ = uVar4;
                auVar466._20_4_ = uVar4;
                auVar466._24_4_ = uVar4;
                auVar466._28_4_ = uVar4;
                auVar466._32_4_ = uVar4;
                auVar466._36_4_ = uVar4;
                auVar466._40_4_ = uVar4;
                auVar466._44_4_ = uVar4;
                auVar466._48_4_ = uVar4;
                auVar466._52_4_ = uVar4;
                auVar466._56_4_ = uVar4;
                auVar466._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar466);
                uVar4 = puVar371[1];
                auVar535._4_4_ = uVar4;
                auVar535._0_4_ = uVar4;
                auVar535._8_4_ = uVar4;
                auVar535._12_4_ = uVar4;
                auVar535._16_4_ = uVar4;
                auVar535._20_4_ = uVar4;
                auVar535._24_4_ = uVar4;
                auVar535._28_4_ = uVar4;
                auVar535._32_4_ = uVar4;
                auVar535._36_4_ = uVar4;
                auVar535._40_4_ = uVar4;
                auVar535._44_4_ = uVar4;
                auVar535._48_4_ = uVar4;
                auVar535._52_4_ = uVar4;
                auVar535._56_4_ = uVar4;
                auVar535._60_4_ = uVar4;
                auVar469 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar535);
                uVar4 = puVar371[2];
                auVar467._4_4_ = uVar4;
                auVar467._0_4_ = uVar4;
                auVar467._8_4_ = uVar4;
                auVar467._12_4_ = uVar4;
                auVar467._16_4_ = uVar4;
                auVar467._20_4_ = uVar4;
                auVar467._24_4_ = uVar4;
                auVar467._28_4_ = uVar4;
                auVar467._32_4_ = uVar4;
                auVar467._36_4_ = uVar4;
                auVar467._40_4_ = uVar4;
                auVar467._44_4_ = uVar4;
                auVar467._48_4_ = uVar4;
                auVar467._52_4_ = uVar4;
                auVar467._56_4_ = uVar4;
                auVar467._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar467);
                uVar4 = puVar371[3];
                auVar468._4_4_ = uVar4;
                auVar468._0_4_ = uVar4;
                auVar468._8_4_ = uVar4;
                auVar468._12_4_ = uVar4;
                auVar468._16_4_ = uVar4;
                auVar468._20_4_ = uVar4;
                auVar468._24_4_ = uVar4;
                auVar468._28_4_ = uVar4;
                auVar468._32_4_ = uVar4;
                auVar468._36_4_ = uVar4;
                auVar468._40_4_ = uVar4;
                auVar468._44_4_ = uVar4;
                auVar468._48_4_ = uVar4;
                auVar468._52_4_ = uVar4;
                auVar468._56_4_ = uVar4;
                auVar468._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar468);
                uVar4 = puVar371[4];
                auVar471._4_4_ = uVar4;
                auVar471._0_4_ = uVar4;
                auVar471._8_4_ = uVar4;
                auVar471._12_4_ = uVar4;
                auVar471._16_4_ = uVar4;
                auVar471._20_4_ = uVar4;
                auVar471._24_4_ = uVar4;
                auVar471._28_4_ = uVar4;
                auVar471._32_4_ = uVar4;
                auVar471._36_4_ = uVar4;
                auVar471._40_4_ = uVar4;
                auVar471._44_4_ = uVar4;
                auVar471._48_4_ = uVar4;
                auVar471._52_4_ = uVar4;
                auVar471._56_4_ = uVar4;
                auVar471._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar466,pauVar379[4],auVar471);
                uVar4 = puVar371[5];
                auVar473._4_4_ = uVar4;
                auVar473._0_4_ = uVar4;
                auVar473._8_4_ = uVar4;
                auVar473._12_4_ = uVar4;
                auVar473._16_4_ = uVar4;
                auVar473._20_4_ = uVar4;
                auVar473._24_4_ = uVar4;
                auVar473._28_4_ = uVar4;
                auVar473._32_4_ = uVar4;
                auVar473._36_4_ = uVar4;
                auVar473._40_4_ = uVar4;
                auVar473._44_4_ = uVar4;
                auVar473._48_4_ = uVar4;
                auVar473._52_4_ = uVar4;
                auVar473._56_4_ = uVar4;
                auVar473._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar469,pauVar379[5],auVar473);
                uVar4 = puVar371[6];
                auVar469._4_4_ = uVar4;
                auVar469._0_4_ = uVar4;
                auVar469._8_4_ = uVar4;
                auVar469._12_4_ = uVar4;
                auVar469._16_4_ = uVar4;
                auVar469._20_4_ = uVar4;
                auVar469._24_4_ = uVar4;
                auVar469._28_4_ = uVar4;
                auVar469._32_4_ = uVar4;
                auVar469._36_4_ = uVar4;
                auVar469._40_4_ = uVar4;
                auVar469._44_4_ = uVar4;
                auVar469._48_4_ = uVar4;
                auVar469._52_4_ = uVar4;
                auVar469._56_4_ = uVar4;
                auVar469._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar467,pauVar379[6],auVar469);
                uVar4 = puVar371[7];
                auVar319._4_4_ = uVar4;
                auVar319._0_4_ = uVar4;
                auVar319._8_4_ = uVar4;
                auVar319._12_4_ = uVar4;
                auVar319._16_4_ = uVar4;
                auVar319._20_4_ = uVar4;
                auVar319._24_4_ = uVar4;
                auVar319._28_4_ = uVar4;
                auVar319._32_4_ = uVar4;
                auVar319._36_4_ = uVar4;
                auVar319._40_4_ = uVar4;
                auVar319._44_4_ = uVar4;
                auVar319._48_4_ = uVar4;
                auVar319._52_4_ = uVar4;
                auVar319._56_4_ = uVar4;
                auVar319._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar468,pauVar379[7],auVar319);
                pauVar379 = pauVar379 + 8;
                puVar371 = puVar371 + lVar390;
              }
              pauVar406 = pauVar406 + uVar419 * 8;
            }
            else {
              puVar371 = (undefined4 *)((long)local_188.data + lVar370 + (long)iVar363 * 4);
            }
            if (local_188.elempack == 4) {
              puVar375 = puVar371 + 3;
              uVar376 = uVar419;
              pauVar379 = pauVar406;
              while (iVar387 = (int)uVar376, uVar376 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = puVar375[-3];
                auVar320._4_4_ = uVar4;
                auVar320._0_4_ = uVar4;
                auVar320._8_4_ = uVar4;
                auVar320._12_4_ = uVar4;
                auVar320._16_4_ = uVar4;
                auVar320._20_4_ = uVar4;
                auVar320._24_4_ = uVar4;
                auVar320._28_4_ = uVar4;
                auVar320._32_4_ = uVar4;
                auVar320._36_4_ = uVar4;
                auVar320._40_4_ = uVar4;
                auVar320._44_4_ = uVar4;
                auVar320._48_4_ = uVar4;
                auVar320._52_4_ = uVar4;
                auVar320._56_4_ = uVar4;
                auVar320._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar320);
                uVar4 = puVar375[-2];
                auVar321._4_4_ = uVar4;
                auVar321._0_4_ = uVar4;
                auVar321._8_4_ = uVar4;
                auVar321._12_4_ = uVar4;
                auVar321._16_4_ = uVar4;
                auVar321._20_4_ = uVar4;
                auVar321._24_4_ = uVar4;
                auVar321._28_4_ = uVar4;
                auVar321._32_4_ = uVar4;
                auVar321._36_4_ = uVar4;
                auVar321._40_4_ = uVar4;
                auVar321._44_4_ = uVar4;
                auVar321._48_4_ = uVar4;
                auVar321._52_4_ = uVar4;
                auVar321._56_4_ = uVar4;
                auVar321._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar321);
                uVar4 = puVar375[-1];
                auVar322._4_4_ = uVar4;
                auVar322._0_4_ = uVar4;
                auVar322._8_4_ = uVar4;
                auVar322._12_4_ = uVar4;
                auVar322._16_4_ = uVar4;
                auVar322._20_4_ = uVar4;
                auVar322._24_4_ = uVar4;
                auVar322._28_4_ = uVar4;
                auVar322._32_4_ = uVar4;
                auVar322._36_4_ = uVar4;
                auVar322._40_4_ = uVar4;
                auVar322._44_4_ = uVar4;
                auVar322._48_4_ = uVar4;
                auVar322._52_4_ = uVar4;
                auVar322._56_4_ = uVar4;
                auVar322._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar322);
                uVar4 = *puVar375;
                auVar323._4_4_ = uVar4;
                auVar323._0_4_ = uVar4;
                auVar323._8_4_ = uVar4;
                auVar323._12_4_ = uVar4;
                auVar323._16_4_ = uVar4;
                auVar323._20_4_ = uVar4;
                auVar323._24_4_ = uVar4;
                auVar323._28_4_ = uVar4;
                auVar323._32_4_ = uVar4;
                auVar323._36_4_ = uVar4;
                auVar323._40_4_ = uVar4;
                auVar323._44_4_ = uVar4;
                auVar323._48_4_ = uVar4;
                auVar323._52_4_ = uVar4;
                auVar323._56_4_ = uVar4;
                auVar323._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar323);
                uVar4 = puVar375[lVar397 + -3];
                auVar324._4_4_ = uVar4;
                auVar324._0_4_ = uVar4;
                auVar324._8_4_ = uVar4;
                auVar324._12_4_ = uVar4;
                auVar324._16_4_ = uVar4;
                auVar324._20_4_ = uVar4;
                auVar324._24_4_ = uVar4;
                auVar324._28_4_ = uVar4;
                auVar324._32_4_ = uVar4;
                auVar324._36_4_ = uVar4;
                auVar324._40_4_ = uVar4;
                auVar324._44_4_ = uVar4;
                auVar324._48_4_ = uVar4;
                auVar324._52_4_ = uVar4;
                auVar324._56_4_ = uVar4;
                auVar324._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[4],auVar324);
                uVar4 = puVar375[lVar397 + -2];
                auVar325._4_4_ = uVar4;
                auVar325._0_4_ = uVar4;
                auVar325._8_4_ = uVar4;
                auVar325._12_4_ = uVar4;
                auVar325._16_4_ = uVar4;
                auVar325._20_4_ = uVar4;
                auVar325._24_4_ = uVar4;
                auVar325._28_4_ = uVar4;
                auVar325._32_4_ = uVar4;
                auVar325._36_4_ = uVar4;
                auVar325._40_4_ = uVar4;
                auVar325._44_4_ = uVar4;
                auVar325._48_4_ = uVar4;
                auVar325._52_4_ = uVar4;
                auVar325._56_4_ = uVar4;
                auVar325._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar466,pauVar379[5],auVar325);
                uVar4 = puVar375[lVar397 + -1];
                auVar326._4_4_ = uVar4;
                auVar326._0_4_ = uVar4;
                auVar326._8_4_ = uVar4;
                auVar326._12_4_ = uVar4;
                auVar326._16_4_ = uVar4;
                auVar326._20_4_ = uVar4;
                auVar326._24_4_ = uVar4;
                auVar326._28_4_ = uVar4;
                auVar326._32_4_ = uVar4;
                auVar326._36_4_ = uVar4;
                auVar326._40_4_ = uVar4;
                auVar326._44_4_ = uVar4;
                auVar326._48_4_ = uVar4;
                auVar326._52_4_ = uVar4;
                auVar326._56_4_ = uVar4;
                auVar326._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar467,pauVar379[6],auVar326);
                uVar4 = puVar375[lVar397];
                auVar327._4_4_ = uVar4;
                auVar327._0_4_ = uVar4;
                auVar327._8_4_ = uVar4;
                auVar327._12_4_ = uVar4;
                auVar327._16_4_ = uVar4;
                auVar327._20_4_ = uVar4;
                auVar327._24_4_ = uVar4;
                auVar327._28_4_ = uVar4;
                auVar327._32_4_ = uVar4;
                auVar327._36_4_ = uVar4;
                auVar327._40_4_ = uVar4;
                auVar327._44_4_ = uVar4;
                auVar327._48_4_ = uVar4;
                auVar327._52_4_ = uVar4;
                auVar327._56_4_ = uVar4;
                auVar327._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar468,pauVar379[7],auVar327);
                pauVar379 = pauVar379 + 8;
                puVar375 = puVar375 + lVar422;
              }
              pauVar406 = pauVar406 + uVar419 * 8;
              puVar371 = puVar371 + lVar422 * uVar419;
            }
            uVar376 = uVar419;
            pauVar379 = pauVar406;
            if (local_188.elempack == 1) {
              while ((int)uVar376 != 0) {
                uVar4 = *puVar371;
                auVar328._4_4_ = uVar4;
                auVar328._0_4_ = uVar4;
                auVar328._8_4_ = uVar4;
                auVar328._12_4_ = uVar4;
                auVar328._16_4_ = uVar4;
                auVar328._20_4_ = uVar4;
                auVar328._24_4_ = uVar4;
                auVar328._28_4_ = uVar4;
                auVar328._32_4_ = uVar4;
                auVar328._36_4_ = uVar4;
                auVar328._40_4_ = uVar4;
                auVar328._44_4_ = uVar4;
                auVar328._48_4_ = uVar4;
                auVar328._52_4_ = uVar4;
                auVar328._56_4_ = uVar4;
                auVar328._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar328);
                uVar4 = puVar371[lVar397];
                auVar329._4_4_ = uVar4;
                auVar329._0_4_ = uVar4;
                auVar329._8_4_ = uVar4;
                auVar329._12_4_ = uVar4;
                auVar329._16_4_ = uVar4;
                auVar329._20_4_ = uVar4;
                auVar329._24_4_ = uVar4;
                auVar329._28_4_ = uVar4;
                auVar329._32_4_ = uVar4;
                auVar329._36_4_ = uVar4;
                auVar329._40_4_ = uVar4;
                auVar329._44_4_ = uVar4;
                auVar329._48_4_ = uVar4;
                auVar329._52_4_ = uVar4;
                auVar329._56_4_ = uVar4;
                auVar329._60_4_ = uVar4;
                auVar466 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar329);
                uVar4 = puVar371[lVar385];
                auVar330._4_4_ = uVar4;
                auVar330._0_4_ = uVar4;
                auVar330._8_4_ = uVar4;
                auVar330._12_4_ = uVar4;
                auVar330._16_4_ = uVar4;
                auVar330._20_4_ = uVar4;
                auVar330._24_4_ = uVar4;
                auVar330._28_4_ = uVar4;
                auVar330._32_4_ = uVar4;
                auVar330._36_4_ = uVar4;
                auVar330._40_4_ = uVar4;
                auVar330._44_4_ = uVar4;
                auVar330._48_4_ = uVar4;
                auVar330._52_4_ = uVar4;
                auVar330._56_4_ = uVar4;
                auVar330._60_4_ = uVar4;
                auVar467 = vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar330);
                uVar4 = puVar371[lVar416];
                auVar331._4_4_ = uVar4;
                auVar331._0_4_ = uVar4;
                auVar331._8_4_ = uVar4;
                auVar331._12_4_ = uVar4;
                auVar331._16_4_ = uVar4;
                auVar331._20_4_ = uVar4;
                auVar331._24_4_ = uVar4;
                auVar331._28_4_ = uVar4;
                auVar331._32_4_ = uVar4;
                auVar331._36_4_ = uVar4;
                auVar331._40_4_ = uVar4;
                auVar331._44_4_ = uVar4;
                auVar331._48_4_ = uVar4;
                auVar331._52_4_ = uVar4;
                auVar331._56_4_ = uVar4;
                auVar331._60_4_ = uVar4;
                auVar468 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar331);
                uVar4 = puVar371[auVar461._16_8_];
                auVar332._4_4_ = uVar4;
                auVar332._0_4_ = uVar4;
                auVar332._8_4_ = uVar4;
                auVar332._12_4_ = uVar4;
                auVar332._16_4_ = uVar4;
                auVar332._20_4_ = uVar4;
                auVar332._24_4_ = uVar4;
                auVar332._28_4_ = uVar4;
                auVar332._32_4_ = uVar4;
                auVar332._36_4_ = uVar4;
                auVar332._40_4_ = uVar4;
                auVar332._44_4_ = uVar4;
                auVar332._48_4_ = uVar4;
                auVar332._52_4_ = uVar4;
                auVar332._56_4_ = uVar4;
                auVar332._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,pauVar379[4],auVar332);
                uVar4 = puVar371[lVar412];
                auVar333._4_4_ = uVar4;
                auVar333._0_4_ = uVar4;
                auVar333._8_4_ = uVar4;
                auVar333._12_4_ = uVar4;
                auVar333._16_4_ = uVar4;
                auVar333._20_4_ = uVar4;
                auVar333._24_4_ = uVar4;
                auVar333._28_4_ = uVar4;
                auVar333._32_4_ = uVar4;
                auVar333._36_4_ = uVar4;
                auVar333._40_4_ = uVar4;
                auVar333._44_4_ = uVar4;
                auVar333._48_4_ = uVar4;
                auVar333._52_4_ = uVar4;
                auVar333._56_4_ = uVar4;
                auVar333._60_4_ = uVar4;
                in_ZMM18 = (float  [16])vfmadd231ps_avx512f(auVar466,pauVar379[5],auVar333);
                uVar4 = puVar371[lVar528];
                auVar334._4_4_ = uVar4;
                auVar334._0_4_ = uVar4;
                auVar334._8_4_ = uVar4;
                auVar334._12_4_ = uVar4;
                auVar334._16_4_ = uVar4;
                auVar334._20_4_ = uVar4;
                auVar334._24_4_ = uVar4;
                auVar334._28_4_ = uVar4;
                auVar334._32_4_ = uVar4;
                auVar334._36_4_ = uVar4;
                auVar334._40_4_ = uVar4;
                auVar334._44_4_ = uVar4;
                auVar334._48_4_ = uVar4;
                auVar334._52_4_ = uVar4;
                auVar334._56_4_ = uVar4;
                auVar334._60_4_ = uVar4;
                in_ZMM17 = (float  [16])vfmadd231ps_avx512f(auVar467,pauVar379[6],auVar334);
                uVar4 = puVar371[lVar9];
                auVar335._4_4_ = uVar4;
                auVar335._0_4_ = uVar4;
                auVar335._8_4_ = uVar4;
                auVar335._12_4_ = uVar4;
                auVar335._16_4_ = uVar4;
                auVar335._20_4_ = uVar4;
                auVar335._24_4_ = uVar4;
                auVar335._28_4_ = uVar4;
                auVar335._32_4_ = uVar4;
                auVar335._36_4_ = uVar4;
                auVar335._40_4_ = uVar4;
                auVar335._44_4_ = uVar4;
                auVar335._48_4_ = uVar4;
                auVar335._52_4_ = uVar4;
                auVar335._56_4_ = uVar4;
                auVar335._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(auVar468,pauVar379[7],auVar335);
                puVar371 = puVar371 + lVar398;
                uVar376 = (ulong)((int)uVar376 - 1);
                pauVar379 = pauVar379 + 8;
              }
              pauVar406 = pauVar406 + uVar419 * 8;
            }
            lVar420 = lVar420 + lVar391 * 8;
            puVar425 = puVar425 + lVar391 * 2;
          }
          for (; (int)((uint)uVar392 | 3) < local_360; uVar392 = uVar392 + 4) {
            lVar370 = (int)((long)((ulong)(uint)((int)(uint)uVar392 >> 0x1f) << 0x20 |
                                  uVar392 & 0xffffffff) / (long)local_188.elempack) * lVar391;
            if (local_188.elempack == 4) {
              puVar371 = (undefined4 *)((long)local_188.data + lVar370 + (long)iVar404 * 4);
              uVar376 = uVar419;
              pauVar379 = pauVar406;
              while (iVar387 = (int)uVar376, uVar376 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = *puVar371;
                auVar336._4_4_ = uVar4;
                auVar336._0_4_ = uVar4;
                auVar336._8_4_ = uVar4;
                auVar336._12_4_ = uVar4;
                auVar336._16_4_ = uVar4;
                auVar336._20_4_ = uVar4;
                auVar336._24_4_ = uVar4;
                auVar336._28_4_ = uVar4;
                auVar336._32_4_ = uVar4;
                auVar336._36_4_ = uVar4;
                auVar336._40_4_ = uVar4;
                auVar336._44_4_ = uVar4;
                auVar336._48_4_ = uVar4;
                auVar336._52_4_ = uVar4;
                auVar336._56_4_ = uVar4;
                auVar336._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar336);
                uVar4 = puVar371[1];
                auVar337._4_4_ = uVar4;
                auVar337._0_4_ = uVar4;
                auVar337._8_4_ = uVar4;
                auVar337._12_4_ = uVar4;
                auVar337._16_4_ = uVar4;
                auVar337._20_4_ = uVar4;
                auVar337._24_4_ = uVar4;
                auVar337._28_4_ = uVar4;
                auVar337._32_4_ = uVar4;
                auVar337._36_4_ = uVar4;
                auVar337._40_4_ = uVar4;
                auVar337._44_4_ = uVar4;
                auVar337._48_4_ = uVar4;
                auVar337._52_4_ = uVar4;
                auVar337._56_4_ = uVar4;
                auVar337._60_4_ = uVar4;
                in_ZMM18 = (float  [16])
                           vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar337);
                uVar4 = puVar371[2];
                auVar338._4_4_ = uVar4;
                auVar338._0_4_ = uVar4;
                auVar338._8_4_ = uVar4;
                auVar338._12_4_ = uVar4;
                auVar338._16_4_ = uVar4;
                auVar338._20_4_ = uVar4;
                auVar338._24_4_ = uVar4;
                auVar338._28_4_ = uVar4;
                auVar338._32_4_ = uVar4;
                auVar338._36_4_ = uVar4;
                auVar338._40_4_ = uVar4;
                auVar338._44_4_ = uVar4;
                auVar338._48_4_ = uVar4;
                auVar338._52_4_ = uVar4;
                auVar338._56_4_ = uVar4;
                auVar338._60_4_ = uVar4;
                in_ZMM17 = (float  [16])
                           vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar338);
                uVar4 = puVar371[3];
                auVar339._4_4_ = uVar4;
                auVar339._0_4_ = uVar4;
                auVar339._8_4_ = uVar4;
                auVar339._12_4_ = uVar4;
                auVar339._16_4_ = uVar4;
                auVar339._20_4_ = uVar4;
                auVar339._24_4_ = uVar4;
                auVar339._28_4_ = uVar4;
                auVar339._32_4_ = uVar4;
                auVar339._36_4_ = uVar4;
                auVar339._40_4_ = uVar4;
                auVar339._44_4_ = uVar4;
                auVar339._48_4_ = uVar4;
                auVar339._52_4_ = uVar4;
                auVar339._56_4_ = uVar4;
                auVar339._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar339);
                pauVar379 = pauVar379 + 4;
                puVar371 = puVar371 + lVar422;
              }
              pauVar406 = pauVar406 + uVar419 * 4;
            }
            else {
              puVar371 = (undefined4 *)((long)local_188.data + lVar370 + (long)iVar363 * 4);
            }
            uVar376 = uVar419;
            pauVar379 = pauVar406;
            if (local_188.elempack == 1) {
              while ((int)uVar376 != 0) {
                uVar4 = *puVar371;
                auVar340._4_4_ = uVar4;
                auVar340._0_4_ = uVar4;
                auVar340._8_4_ = uVar4;
                auVar340._12_4_ = uVar4;
                auVar340._16_4_ = uVar4;
                auVar340._20_4_ = uVar4;
                auVar340._24_4_ = uVar4;
                auVar340._28_4_ = uVar4;
                auVar340._32_4_ = uVar4;
                auVar340._36_4_ = uVar4;
                auVar340._40_4_ = uVar4;
                auVar340._44_4_ = uVar4;
                auVar340._48_4_ = uVar4;
                auVar340._52_4_ = uVar4;
                auVar340._56_4_ = uVar4;
                auVar340._60_4_ = uVar4;
                auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar340);
                uVar4 = puVar371[lVar397];
                auVar341._4_4_ = uVar4;
                auVar341._0_4_ = uVar4;
                auVar341._8_4_ = uVar4;
                auVar341._12_4_ = uVar4;
                auVar341._16_4_ = uVar4;
                auVar341._20_4_ = uVar4;
                auVar341._24_4_ = uVar4;
                auVar341._28_4_ = uVar4;
                auVar341._32_4_ = uVar4;
                auVar341._36_4_ = uVar4;
                auVar341._40_4_ = uVar4;
                auVar341._44_4_ = uVar4;
                auVar341._48_4_ = uVar4;
                auVar341._52_4_ = uVar4;
                auVar341._56_4_ = uVar4;
                auVar341._60_4_ = uVar4;
                in_ZMM18 = (float  [16])
                           vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar341);
                uVar4 = puVar371[lVar385];
                auVar342._4_4_ = uVar4;
                auVar342._0_4_ = uVar4;
                auVar342._8_4_ = uVar4;
                auVar342._12_4_ = uVar4;
                auVar342._16_4_ = uVar4;
                auVar342._20_4_ = uVar4;
                auVar342._24_4_ = uVar4;
                auVar342._28_4_ = uVar4;
                auVar342._32_4_ = uVar4;
                auVar342._36_4_ = uVar4;
                auVar342._40_4_ = uVar4;
                auVar342._44_4_ = uVar4;
                auVar342._48_4_ = uVar4;
                auVar342._52_4_ = uVar4;
                auVar342._56_4_ = uVar4;
                auVar342._60_4_ = uVar4;
                in_ZMM17 = (float  [16])
                           vfmadd231ps_avx512f((undefined1  [64])in_ZMM17,pauVar379[2],auVar342);
                uVar4 = puVar371[lVar416];
                auVar343._4_4_ = uVar4;
                auVar343._0_4_ = uVar4;
                auVar343._8_4_ = uVar4;
                auVar343._12_4_ = uVar4;
                auVar343._16_4_ = uVar4;
                auVar343._20_4_ = uVar4;
                auVar343._24_4_ = uVar4;
                auVar343._28_4_ = uVar4;
                auVar343._32_4_ = uVar4;
                auVar343._36_4_ = uVar4;
                auVar343._40_4_ = uVar4;
                auVar343._44_4_ = uVar4;
                auVar343._48_4_ = uVar4;
                auVar343._52_4_ = uVar4;
                auVar343._56_4_ = uVar4;
                auVar343._60_4_ = uVar4;
                in_ZMM16 = vfmadd231ps_avx512f(in_ZMM16,pauVar379[3],auVar343);
                puVar371 = puVar371 + lVar398;
                uVar376 = (ulong)((int)uVar376 - 1);
                pauVar379 = pauVar379 + 4;
              }
              pauVar406 = pauVar406 + uVar419 * 4;
            }
            lVar420 = lVar420 + lVar391 * 4;
            puVar425 = puVar425 + lVar391;
          }
          for (; (long)(uVar392 | 1) < lVar405; uVar392 = uVar392 + 2) {
            lVar370 = 0;
            uVar376 = uVar419;
            pauVar379 = pauVar406;
            while (iVar363 = (int)uVar376, uVar376 = (ulong)(iVar363 - 1), iVar363 != 0) {
              uVar4 = *(undefined4 *)((long)puVar425 + lVar370);
              auVar344._4_4_ = uVar4;
              auVar344._0_4_ = uVar4;
              auVar344._8_4_ = uVar4;
              auVar344._12_4_ = uVar4;
              auVar344._16_4_ = uVar4;
              auVar344._20_4_ = uVar4;
              auVar344._24_4_ = uVar4;
              auVar344._28_4_ = uVar4;
              auVar344._32_4_ = uVar4;
              auVar344._36_4_ = uVar4;
              auVar344._40_4_ = uVar4;
              auVar344._44_4_ = uVar4;
              auVar344._48_4_ = uVar4;
              auVar344._52_4_ = uVar4;
              auVar344._56_4_ = uVar4;
              auVar344._60_4_ = uVar4;
              auVar535 = vfmadd231ps_avx512f(auVar535,*pauVar379,auVar344);
              uVar4 = *(undefined4 *)(lVar420 + lVar370);
              auVar345._4_4_ = uVar4;
              auVar345._0_4_ = uVar4;
              auVar345._8_4_ = uVar4;
              auVar345._12_4_ = uVar4;
              auVar345._16_4_ = uVar4;
              auVar345._20_4_ = uVar4;
              auVar345._24_4_ = uVar4;
              auVar345._28_4_ = uVar4;
              auVar345._32_4_ = uVar4;
              auVar345._36_4_ = uVar4;
              auVar345._40_4_ = uVar4;
              auVar345._44_4_ = uVar4;
              auVar345._48_4_ = uVar4;
              auVar345._52_4_ = uVar4;
              auVar345._56_4_ = uVar4;
              auVar345._60_4_ = uVar4;
              in_ZMM18 = (float  [16])
                         vfmadd231ps_avx512f((undefined1  [64])in_ZMM18,pauVar379[1],auVar345);
              pauVar379 = pauVar379 + 2;
              lVar370 = lVar370 + lVar399;
            }
            pauVar406 = pauVar406 + uVar419 * 2;
            lVar420 = lVar420 + lVar391 * 2;
            puVar425 = (uint *)((long)puVar425 + lVar391 * 2);
          }
          for (; puVar381 = puVar425, uVar376 = uVar419, pauVar379 = pauVar406,
              (long)uVar392 < lVar405; uVar392 = uVar392 + 1) {
            while ((int)uVar376 != 0) {
              auVar466 = vbroadcastss_avx512f(ZEXT416(*puVar381));
              auVar535 = vfmadd231ps_avx512f(auVar535,auVar466,*pauVar379);
              puVar381 = puVar381 + lVar398;
              uVar376 = (ulong)((int)uVar376 - 1);
              pauVar379 = pauVar379 + 1;
            }
            pauVar406 = pauVar406 + uVar419;
            puVar425 = (uint *)((long)puVar425 + lVar391);
          }
          auVar466 = vaddps_avx512f((undefined1  [64])in_ZMM17,in_ZMM16);
          auVar535 = vaddps_avx512f((undefined1  [64])in_ZMM18,auVar535);
          auVar535 = vaddps_avx512f(auVar466,auVar535);
          switch(iVar424) {
          case 1:
            auVar535 = vmaxps_avx512f(auVar535,auVar567);
            break;
          case 2:
            uVar392 = vcmpps_avx512f(auVar535,auVar567,1);
            uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
            auVar350._4_4_ = uVar4;
            auVar350._0_4_ = uVar4;
            auVar350._8_4_ = uVar4;
            auVar350._12_4_ = uVar4;
            auVar350._16_4_ = uVar4;
            auVar350._20_4_ = uVar4;
            auVar350._24_4_ = uVar4;
            auVar350._28_4_ = uVar4;
            auVar350._32_4_ = uVar4;
            auVar350._36_4_ = uVar4;
            auVar350._40_4_ = uVar4;
            auVar350._44_4_ = uVar4;
            auVar350._48_4_ = uVar4;
            auVar350._52_4_ = uVar4;
            auVar350._56_4_ = uVar4;
            auVar350._60_4_ = uVar4;
            auVar466 = vmulps_avx512f(auVar535,auVar350);
            bVar18 = (bool)((byte)uVar392 & 1);
            auVar478._0_4_ = (uint)bVar18 * auVar466._0_4_ | (uint)!bVar18 * auVar535._0_4_;
            bVar18 = (bool)((byte)(uVar392 >> 1) & 1);
            auVar478._4_4_ = (uint)bVar18 * auVar466._4_4_ | (uint)!bVar18 * auVar535._4_4_;
            bVar18 = (bool)((byte)(uVar392 >> 2) & 1);
            auVar478._8_4_ = (uint)bVar18 * auVar466._8_4_ | (uint)!bVar18 * auVar535._8_4_;
            bVar18 = (bool)((byte)(uVar392 >> 3) & 1);
            auVar478._12_4_ = (uint)bVar18 * auVar466._12_4_ | (uint)!bVar18 * auVar535._12_4_;
            bVar18 = (bool)((byte)(uVar392 >> 4) & 1);
            auVar478._16_4_ = (uint)bVar18 * auVar466._16_4_ | (uint)!bVar18 * auVar535._16_4_;
            bVar18 = (bool)((byte)(uVar392 >> 5) & 1);
            auVar478._20_4_ = (uint)bVar18 * auVar466._20_4_ | (uint)!bVar18 * auVar535._20_4_;
            bVar18 = (bool)((byte)(uVar392 >> 6) & 1);
            auVar478._24_4_ = (uint)bVar18 * auVar466._24_4_ | (uint)!bVar18 * auVar535._24_4_;
            bVar18 = (bool)((byte)(uVar392 >> 7) & 1);
            auVar478._28_4_ = (uint)bVar18 * auVar466._28_4_ | (uint)!bVar18 * auVar535._28_4_;
            bVar18 = (bool)((byte)(uVar392 >> 8) & 1);
            auVar478._32_4_ = (uint)bVar18 * auVar466._32_4_ | (uint)!bVar18 * auVar535._32_4_;
            bVar18 = (bool)((byte)(uVar392 >> 9) & 1);
            auVar478._36_4_ = (uint)bVar18 * auVar466._36_4_ | (uint)!bVar18 * auVar535._36_4_;
            bVar18 = (bool)((byte)(uVar392 >> 10) & 1);
            auVar478._40_4_ = (uint)bVar18 * auVar466._40_4_ | (uint)!bVar18 * auVar535._40_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xb) & 1);
            auVar478._44_4_ = (uint)bVar18 * auVar466._44_4_ | (uint)!bVar18 * auVar535._44_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xc) & 1);
            auVar478._48_4_ = (uint)bVar18 * auVar466._48_4_ | (uint)!bVar18 * auVar535._48_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xd) & 1);
            auVar478._52_4_ = (uint)bVar18 * auVar466._52_4_ | (uint)!bVar18 * auVar535._52_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xe) & 1);
            auVar478._56_4_ = (uint)bVar18 * auVar466._56_4_ | (uint)!bVar18 * auVar535._56_4_;
            bVar18 = SUB81(uVar392 >> 0xf,0);
            auVar478._60_4_ = (uint)bVar18 * auVar466._60_4_ | (uint)!bVar18 * auVar535._60_4_;
            auVar535 = auVar478;
            break;
          case 3:
            uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
            auVar348._4_4_ = uVar4;
            auVar348._0_4_ = uVar4;
            auVar348._8_4_ = uVar4;
            auVar348._12_4_ = uVar4;
            auVar348._16_4_ = uVar4;
            auVar348._20_4_ = uVar4;
            auVar348._24_4_ = uVar4;
            auVar348._28_4_ = uVar4;
            auVar348._32_4_ = uVar4;
            auVar348._36_4_ = uVar4;
            auVar348._40_4_ = uVar4;
            auVar348._44_4_ = uVar4;
            auVar348._48_4_ = uVar4;
            auVar348._52_4_ = uVar4;
            auVar348._56_4_ = uVar4;
            auVar348._60_4_ = uVar4;
            auVar535 = vmaxps_avx512f(auVar535,auVar348);
            uVar4 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
            auVar349._4_4_ = uVar4;
            auVar349._0_4_ = uVar4;
            auVar349._8_4_ = uVar4;
            auVar349._12_4_ = uVar4;
            auVar349._16_4_ = uVar4;
            auVar349._20_4_ = uVar4;
            auVar349._24_4_ = uVar4;
            auVar349._28_4_ = uVar4;
            auVar349._32_4_ = uVar4;
            auVar349._36_4_ = uVar4;
            auVar349._40_4_ = uVar4;
            auVar349._44_4_ = uVar4;
            auVar349._48_4_ = uVar4;
            auVar349._52_4_ = uVar4;
            auVar349._56_4_ = uVar4;
            auVar349._60_4_ = uVar4;
            auVar535 = vminps_avx512f(auVar535,auVar349);
            break;
          case 4:
            auVar347._8_4_ = 0x80000000;
            auVar347._0_8_ = 0x8000000080000000;
            auVar347._12_4_ = 0x80000000;
            auVar347._16_4_ = 0x80000000;
            auVar347._20_4_ = 0x80000000;
            auVar347._24_4_ = 0x80000000;
            auVar347._28_4_ = 0x80000000;
            auVar347._32_4_ = 0x80000000;
            auVar347._36_4_ = 0x80000000;
            auVar347._40_4_ = 0x80000000;
            auVar347._44_4_ = 0x80000000;
            auVar347._48_4_ = 0x80000000;
            auVar347._52_4_ = 0x80000000;
            auVar347._56_4_ = 0x80000000;
            auVar347._60_4_ = 0x80000000;
            auVar535 = vxorps_avx512dq(auVar535,auVar347);
            auVar535 = vminps_avx512f(auVar535,(undefined1  [64])_ps512_exp_hi);
            auVar535 = vmaxps_avx512f(auVar535,(undefined1  [64])_ps512_exp_lo);
            auVar466 = vfmadd213ps_avx512f((undefined1  [64])afVar357,auVar535,
                                           (undefined1  [64])afVar362);
            auVar467 = vrndscaleps_avx512f(auVar466,1);
            uVar392 = vcmpps_avx512f(auVar466,auVar467,1);
            auVar466 = vsubps_avx512f(auVar467,(undefined1  [64])afVar356);
            bVar18 = (bool)((byte)uVar392 & 1);
            auVar477._0_4_ = (uint)bVar18 * auVar466._0_4_ | (uint)!bVar18 * auVar467._0_4_;
            bVar18 = (bool)((byte)(uVar392 >> 1) & 1);
            auVar477._4_4_ = (uint)bVar18 * auVar466._4_4_ | (uint)!bVar18 * auVar467._4_4_;
            bVar18 = (bool)((byte)(uVar392 >> 2) & 1);
            auVar477._8_4_ = (uint)bVar18 * auVar466._8_4_ | (uint)!bVar18 * auVar467._8_4_;
            bVar18 = (bool)((byte)(uVar392 >> 3) & 1);
            auVar477._12_4_ = (uint)bVar18 * auVar466._12_4_ | (uint)!bVar18 * auVar467._12_4_;
            bVar18 = (bool)((byte)(uVar392 >> 4) & 1);
            auVar477._16_4_ = (uint)bVar18 * auVar466._16_4_ | (uint)!bVar18 * auVar467._16_4_;
            bVar18 = (bool)((byte)(uVar392 >> 5) & 1);
            auVar477._20_4_ = (uint)bVar18 * auVar466._20_4_ | (uint)!bVar18 * auVar467._20_4_;
            bVar18 = (bool)((byte)(uVar392 >> 6) & 1);
            auVar477._24_4_ = (uint)bVar18 * auVar466._24_4_ | (uint)!bVar18 * auVar467._24_4_;
            bVar18 = (bool)((byte)(uVar392 >> 7) & 1);
            auVar477._28_4_ = (uint)bVar18 * auVar466._28_4_ | (uint)!bVar18 * auVar467._28_4_;
            bVar18 = (bool)((byte)(uVar392 >> 8) & 1);
            auVar477._32_4_ = (uint)bVar18 * auVar466._32_4_ | (uint)!bVar18 * auVar467._32_4_;
            bVar18 = (bool)((byte)(uVar392 >> 9) & 1);
            auVar477._36_4_ = (uint)bVar18 * auVar466._36_4_ | (uint)!bVar18 * auVar467._36_4_;
            bVar18 = (bool)((byte)(uVar392 >> 10) & 1);
            auVar477._40_4_ = (uint)bVar18 * auVar466._40_4_ | (uint)!bVar18 * auVar467._40_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xb) & 1);
            auVar477._44_4_ = (uint)bVar18 * auVar466._44_4_ | (uint)!bVar18 * auVar467._44_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xc) & 1);
            auVar477._48_4_ = (uint)bVar18 * auVar466._48_4_ | (uint)!bVar18 * auVar467._48_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xd) & 1);
            auVar477._52_4_ = (uint)bVar18 * auVar466._52_4_ | (uint)!bVar18 * auVar467._52_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xe) & 1);
            auVar477._56_4_ = (uint)bVar18 * auVar466._56_4_ | (uint)!bVar18 * auVar467._56_4_;
            bVar18 = SUB81(uVar392 >> 0xf,0);
            auVar477._60_4_ = (uint)bVar18 * auVar466._60_4_ | (uint)!bVar18 * auVar467._60_4_;
            auVar535 = vfmadd231ps_avx512f(auVar535,auVar477,auVar463);
            auVar535 = vfmadd231ps_avx512f(auVar535,auVar477,auVar464);
            auVar466 = vmulps_avx512f(auVar535,auVar535);
            auVar467 = vfmadd132ps_avx512f(auVar535,(undefined1  [64])afVar358,
                                           (undefined1  [64])_ps512_cephes_exp_p0);
            auVar467 = vfmadd213ps_avx512f(auVar467,auVar535,(undefined1  [64])afVar359);
            auVar467 = vfmadd213ps_avx512f(auVar467,auVar535,(undefined1  [64])afVar360);
            auVar467 = vfmadd213ps_avx512f(auVar467,auVar535,(undefined1  [64])afVar361);
            auVar467 = vfmadd213ps_avx512f(auVar467,auVar535,(undefined1  [64])afVar362);
            auVar535 = vfmadd213ps_avx512f(auVar467,auVar466,auVar535);
            auVar535 = vaddps_avx512f(auVar535,(undefined1  [64])afVar356);
            auVar466 = vcvttps2dq_avx512f(auVar477);
            auVar466 = vpaddd_avx512f(auVar466,auVar465);
            auVar466 = vpslld_avx512f(auVar466,0x17);
            auVar535 = vfmadd213ps_avx512f(auVar466,auVar535,auVar462);
            auVar466 = vrcp14ps_avx512f(auVar535);
            auVar535 = vfmsub213ps_avx512f(auVar535,auVar466,auVar462);
            auVar535 = vfnmadd132ps_avx512vl(auVar535,auVar466,auVar466);
            break;
          case 5:
            auVar466 = vminps_avx512f(auVar535,(undefined1  [64])_ps512_exp_hi);
            auVar466 = vmaxps_avx512f(auVar466,(undefined1  [64])_ps512_exp_lo);
            auVar467 = vfmadd213ps_avx512f((undefined1  [64])afVar357,auVar466,
                                           (undefined1  [64])afVar362);
            auVar468 = vrndscaleps_avx512f(auVar467,1);
            uVar392 = vcmpps_avx512f(auVar467,auVar468,1);
            auVar467 = vsubps_avx512f(auVar468,(undefined1  [64])afVar356);
            bVar18 = (bool)((byte)uVar392 & 1);
            auVar470._0_4_ = (uint)bVar18 * auVar467._0_4_ | (uint)!bVar18 * auVar468._0_4_;
            bVar18 = (bool)((byte)(uVar392 >> 1) & 1);
            auVar470._4_4_ = (uint)bVar18 * auVar467._4_4_ | (uint)!bVar18 * auVar468._4_4_;
            bVar18 = (bool)((byte)(uVar392 >> 2) & 1);
            auVar470._8_4_ = (uint)bVar18 * auVar467._8_4_ | (uint)!bVar18 * auVar468._8_4_;
            bVar18 = (bool)((byte)(uVar392 >> 3) & 1);
            auVar470._12_4_ = (uint)bVar18 * auVar467._12_4_ | (uint)!bVar18 * auVar468._12_4_;
            bVar18 = (bool)((byte)(uVar392 >> 4) & 1);
            auVar470._16_4_ = (uint)bVar18 * auVar467._16_4_ | (uint)!bVar18 * auVar468._16_4_;
            bVar18 = (bool)((byte)(uVar392 >> 5) & 1);
            auVar470._20_4_ = (uint)bVar18 * auVar467._20_4_ | (uint)!bVar18 * auVar468._20_4_;
            bVar18 = (bool)((byte)(uVar392 >> 6) & 1);
            auVar470._24_4_ = (uint)bVar18 * auVar467._24_4_ | (uint)!bVar18 * auVar468._24_4_;
            bVar18 = (bool)((byte)(uVar392 >> 7) & 1);
            auVar470._28_4_ = (uint)bVar18 * auVar467._28_4_ | (uint)!bVar18 * auVar468._28_4_;
            bVar18 = (bool)((byte)(uVar392 >> 8) & 1);
            auVar470._32_4_ = (uint)bVar18 * auVar467._32_4_ | (uint)!bVar18 * auVar468._32_4_;
            bVar18 = (bool)((byte)(uVar392 >> 9) & 1);
            auVar470._36_4_ = (uint)bVar18 * auVar467._36_4_ | (uint)!bVar18 * auVar468._36_4_;
            bVar18 = (bool)((byte)(uVar392 >> 10) & 1);
            auVar470._40_4_ = (uint)bVar18 * auVar467._40_4_ | (uint)!bVar18 * auVar468._40_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xb) & 1);
            auVar470._44_4_ = (uint)bVar18 * auVar467._44_4_ | (uint)!bVar18 * auVar468._44_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xc) & 1);
            auVar470._48_4_ = (uint)bVar18 * auVar467._48_4_ | (uint)!bVar18 * auVar468._48_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xd) & 1);
            auVar470._52_4_ = (uint)bVar18 * auVar467._52_4_ | (uint)!bVar18 * auVar468._52_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xe) & 1);
            auVar470._56_4_ = (uint)bVar18 * auVar467._56_4_ | (uint)!bVar18 * auVar468._56_4_;
            bVar18 = SUB81(uVar392 >> 0xf,0);
            auVar470._60_4_ = (uint)bVar18 * auVar467._60_4_ | (uint)!bVar18 * auVar468._60_4_;
            auVar466 = vfmadd231ps_avx512f(auVar466,auVar470,auVar463);
            auVar466 = vfmadd231ps_avx512f(auVar466,auVar470,auVar464);
            auVar467 = vmulps_avx512f(auVar466,auVar466);
            auVar468 = vfmadd213ps_avx512f(auVar466,(undefined1  [64])_ps512_cephes_exp_p0,
                                           (undefined1  [64])afVar358);
            auVar468 = vfmadd213ps_avx512f(auVar468,auVar466,(undefined1  [64])afVar359);
            auVar468 = vfmadd213ps_avx512f(auVar468,auVar466,(undefined1  [64])afVar360);
            auVar468 = vfmadd213ps_avx512f(auVar468,auVar466,(undefined1  [64])afVar361);
            auVar468 = vfmadd213ps_avx512f(auVar468,auVar466,(undefined1  [64])afVar362);
            auVar466 = vfmadd213ps_avx512f(auVar468,auVar467,auVar466);
            auVar466 = vaddps_avx512f(auVar466,(undefined1  [64])afVar356);
            auVar467 = vcvttps2dq_avx512f(auVar470);
            auVar467 = vpaddd_avx512f(auVar467,auVar465);
            auVar467 = vpslld_avx512f(auVar467,0x17);
            auVar466 = vfmadd213ps_avx512f(auVar467,auVar466,auVar462);
            auVar467 = vmaxps_avx512f(auVar466,(undefined1  [64])_ps512_min_norm_pos);
            auVar468 = vpsrld_avx512f(auVar467,0x17);
            auVar467 = vpternlogd_avx512f(auVar467,(undefined1  [64])afVar362,
                                          (undefined1  [64])_ps512_inv_mant_mask,0xec);
            uVar392 = vcmpps_avx512f(auVar467,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar471 = vsubps_avx512f(auVar467,(undefined1  [64])afVar356);
            auVar467 = vaddps_avx512f(auVar471,auVar467);
            bVar18 = (bool)((byte)uVar392 & 1);
            auVar472._0_4_ = (uint)bVar18 * auVar467._0_4_ | (uint)!bVar18 * auVar471._0_4_;
            bVar18 = (bool)((byte)(uVar392 >> 1) & 1);
            auVar472._4_4_ = (uint)bVar18 * auVar467._4_4_ | (uint)!bVar18 * auVar471._4_4_;
            bVar18 = (bool)((byte)(uVar392 >> 2) & 1);
            auVar472._8_4_ = (uint)bVar18 * auVar467._8_4_ | (uint)!bVar18 * auVar471._8_4_;
            bVar18 = (bool)((byte)(uVar392 >> 3) & 1);
            auVar472._12_4_ = (uint)bVar18 * auVar467._12_4_ | (uint)!bVar18 * auVar471._12_4_;
            bVar18 = (bool)((byte)(uVar392 >> 4) & 1);
            auVar472._16_4_ = (uint)bVar18 * auVar467._16_4_ | (uint)!bVar18 * auVar471._16_4_;
            bVar18 = (bool)((byte)(uVar392 >> 5) & 1);
            auVar472._20_4_ = (uint)bVar18 * auVar467._20_4_ | (uint)!bVar18 * auVar471._20_4_;
            bVar18 = (bool)((byte)(uVar392 >> 6) & 1);
            auVar472._24_4_ = (uint)bVar18 * auVar467._24_4_ | (uint)!bVar18 * auVar471._24_4_;
            bVar18 = (bool)((byte)(uVar392 >> 7) & 1);
            auVar472._28_4_ = (uint)bVar18 * auVar467._28_4_ | (uint)!bVar18 * auVar471._28_4_;
            bVar19 = (byte)(uVar392 >> 8);
            bVar18 = (bool)(bVar19 & 1);
            auVar472._32_4_ = (uint)bVar18 * auVar467._32_4_ | (uint)!bVar18 * auVar471._32_4_;
            bVar18 = (bool)((byte)(uVar392 >> 9) & 1);
            auVar472._36_4_ = (uint)bVar18 * auVar467._36_4_ | (uint)!bVar18 * auVar471._36_4_;
            bVar18 = (bool)((byte)(uVar392 >> 10) & 1);
            auVar472._40_4_ = (uint)bVar18 * auVar467._40_4_ | (uint)!bVar18 * auVar471._40_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xb) & 1);
            auVar472._44_4_ = (uint)bVar18 * auVar467._44_4_ | (uint)!bVar18 * auVar471._44_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xc) & 1);
            auVar472._48_4_ = (uint)bVar18 * auVar467._48_4_ | (uint)!bVar18 * auVar471._48_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xd) & 1);
            auVar472._52_4_ = (uint)bVar18 * auVar467._52_4_ | (uint)!bVar18 * auVar471._52_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xe) & 1);
            auVar472._56_4_ = (uint)bVar18 * auVar467._56_4_ | (uint)!bVar18 * auVar471._56_4_;
            bVar18 = SUB81(uVar392 >> 0xf,0);
            auVar472._60_4_ = (uint)bVar18 * auVar467._60_4_ | (uint)!bVar18 * auVar471._60_4_;
            auVar467 = vmulps_avx512f(auVar472,auVar472);
            auVar471 = vfmadd132ps_avx512f(auVar472,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar472,(undefined1  [64])_ps512_cephes_log_p2)
            ;
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar472,(undefined1  [64])_ps512_cephes_log_p3)
            ;
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar472,(undefined1  [64])_ps512_cephes_log_p4)
            ;
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar472,(undefined1  [64])_ps512_cephes_log_p5)
            ;
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar472,(undefined1  [64])_ps512_cephes_log_p6)
            ;
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar472,(undefined1  [64])_ps512_cephes_log_p7)
            ;
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar472,(undefined1  [64])_ps512_cephes_log_p8)
            ;
            auVar473 = vmulps_avx512f(auVar467,auVar472);
            auVar471 = vfmadd213ps_avx512f(auVar473,auVar471,auVar472);
            uVar376 = vcmpps_avx512f(auVar466,auVar567,2);
            auVar466 = vpsubd_avx512f(auVar468,auVar465);
            auVar466 = vcvtdq2ps_avx512f(auVar466);
            auVar468 = vaddps_avx512f(auVar466,(undefined1  [64])afVar356);
            bVar18 = (bool)((byte)uVar392 & 1);
            auVar474._0_4_ = (uint)bVar18 * auVar466._0_4_ | (uint)!bVar18 * auVar468._0_4_;
            bVar18 = (bool)((byte)(uVar392 >> 1) & 1);
            auVar474._4_4_ = (uint)bVar18 * auVar466._4_4_ | (uint)!bVar18 * auVar468._4_4_;
            bVar18 = (bool)((byte)(uVar392 >> 2) & 1);
            auVar474._8_4_ = (uint)bVar18 * auVar466._8_4_ | (uint)!bVar18 * auVar468._8_4_;
            bVar18 = (bool)((byte)(uVar392 >> 3) & 1);
            auVar474._12_4_ = (uint)bVar18 * auVar466._12_4_ | (uint)!bVar18 * auVar468._12_4_;
            bVar18 = (bool)((byte)(uVar392 >> 4) & 1);
            auVar474._16_4_ = (uint)bVar18 * auVar466._16_4_ | (uint)!bVar18 * auVar468._16_4_;
            bVar18 = (bool)((byte)(uVar392 >> 5) & 1);
            auVar474._20_4_ = (uint)bVar18 * auVar466._20_4_ | (uint)!bVar18 * auVar468._20_4_;
            bVar18 = (bool)((byte)(uVar392 >> 6) & 1);
            auVar474._24_4_ = (uint)bVar18 * auVar466._24_4_ | (uint)!bVar18 * auVar468._24_4_;
            bVar18 = (bool)((byte)(uVar392 >> 7) & 1);
            auVar474._28_4_ = (uint)bVar18 * auVar466._28_4_ | (uint)!bVar18 * auVar468._28_4_;
            bVar18 = (bool)(bVar19 & 1);
            auVar474._32_4_ = (uint)bVar18 * auVar466._32_4_ | (uint)!bVar18 * auVar468._32_4_;
            bVar18 = (bool)((byte)(uVar392 >> 9) & 1);
            auVar474._36_4_ = (uint)bVar18 * auVar466._36_4_ | (uint)!bVar18 * auVar468._36_4_;
            bVar18 = (bool)((byte)(uVar392 >> 10) & 1);
            auVar474._40_4_ = (uint)bVar18 * auVar466._40_4_ | (uint)!bVar18 * auVar468._40_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xb) & 1);
            auVar474._44_4_ = (uint)bVar18 * auVar466._44_4_ | (uint)!bVar18 * auVar468._44_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xc) & 1);
            auVar474._48_4_ = (uint)bVar18 * auVar466._48_4_ | (uint)!bVar18 * auVar468._48_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xd) & 1);
            auVar474._52_4_ = (uint)bVar18 * auVar466._52_4_ | (uint)!bVar18 * auVar468._52_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xe) & 1);
            auVar474._56_4_ = (uint)bVar18 * auVar466._56_4_ | (uint)!bVar18 * auVar468._56_4_;
            bVar18 = SUB81(uVar392 >> 0xf,0);
            auVar474._60_4_ = (uint)bVar18 * auVar466._60_4_ | (uint)!bVar18 * auVar468._60_4_;
            auVar466 = vfmadd231ps_avx512f(auVar471,auVar474,(undefined1  [64])_ps512_cephes_log_q1)
            ;
            auVar466 = vfmadd231ps_avx512f(auVar466,auVar467,local_78);
            in_ZMM16 = vfmadd231ps_avx512f(auVar466,auVar474,(undefined1  [64])_ps512_cephes_log_q2)
            ;
            auVar466 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
            auVar467 = vmulps_avx512f(in_ZMM16,auVar466);
            auVar468 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            bVar18 = (bool)((byte)uVar376 & 1);
            auVar475._0_4_ = (uint)bVar18 * auVar468._0_4_ | (uint)!bVar18 * auVar467._0_4_;
            bVar18 = (bool)((byte)(uVar376 >> 1) & 1);
            auVar475._4_4_ = (uint)bVar18 * auVar468._4_4_ | (uint)!bVar18 * auVar467._4_4_;
            bVar18 = (bool)((byte)(uVar376 >> 2) & 1);
            auVar475._8_4_ = (uint)bVar18 * auVar468._8_4_ | (uint)!bVar18 * auVar467._8_4_;
            bVar18 = (bool)((byte)(uVar376 >> 3) & 1);
            auVar475._12_4_ = (uint)bVar18 * auVar468._12_4_ | (uint)!bVar18 * auVar467._12_4_;
            bVar18 = (bool)((byte)(uVar376 >> 4) & 1);
            auVar475._16_4_ = (uint)bVar18 * auVar468._16_4_ | (uint)!bVar18 * auVar467._16_4_;
            bVar18 = (bool)((byte)(uVar376 >> 5) & 1);
            auVar475._20_4_ = (uint)bVar18 * auVar468._20_4_ | (uint)!bVar18 * auVar467._20_4_;
            bVar18 = (bool)((byte)(uVar376 >> 6) & 1);
            auVar475._24_4_ = (uint)bVar18 * auVar468._24_4_ | (uint)!bVar18 * auVar467._24_4_;
            bVar18 = (bool)((byte)(uVar376 >> 7) & 1);
            auVar475._28_4_ = (uint)bVar18 * auVar468._28_4_ | (uint)!bVar18 * auVar467._28_4_;
            bVar18 = (bool)((byte)(uVar376 >> 8) & 1);
            auVar475._32_4_ = (uint)bVar18 * auVar468._32_4_ | (uint)!bVar18 * auVar467._32_4_;
            bVar18 = (bool)((byte)(uVar376 >> 9) & 1);
            auVar475._36_4_ = (uint)bVar18 * auVar468._36_4_ | (uint)!bVar18 * auVar467._36_4_;
            bVar18 = (bool)((byte)(uVar376 >> 10) & 1);
            auVar475._40_4_ = (uint)bVar18 * auVar468._40_4_ | (uint)!bVar18 * auVar467._40_4_;
            bVar18 = (bool)((byte)(uVar376 >> 0xb) & 1);
            auVar475._44_4_ = (uint)bVar18 * auVar468._44_4_ | (uint)!bVar18 * auVar467._44_4_;
            bVar18 = (bool)((byte)(uVar376 >> 0xc) & 1);
            auVar475._48_4_ = (uint)bVar18 * auVar468._48_4_ | (uint)!bVar18 * auVar467._48_4_;
            bVar18 = (bool)((byte)(uVar376 >> 0xd) & 1);
            auVar475._52_4_ = (uint)bVar18 * auVar468._52_4_ | (uint)!bVar18 * auVar467._52_4_;
            bVar18 = (bool)((byte)(uVar376 >> 0xe) & 1);
            auVar475._56_4_ = (uint)bVar18 * auVar468._56_4_ | (uint)!bVar18 * auVar467._56_4_;
            bVar18 = SUB81(uVar376 >> 0xf,0);
            auVar475._60_4_ = (uint)bVar18 * auVar468._60_4_ | (uint)!bVar18 * auVar467._60_4_;
            auVar467 = vminps_avx512f(auVar475,(undefined1  [64])_ps512_exp_hi);
            auVar467 = vmaxps_avx512f(auVar467,(undefined1  [64])_ps512_exp_lo);
            auVar468 = vfmadd213ps_avx512f((undefined1  [64])afVar357,auVar467,
                                           (undefined1  [64])afVar362);
            auVar471 = vrndscaleps_avx512f(auVar468,1);
            uVar392 = vcmpps_avx512f(auVar468,auVar471,1);
            auVar468 = vsubps_avx512f(auVar471,(undefined1  [64])afVar356);
            bVar18 = (bool)((byte)uVar392 & 1);
            auVar476._0_4_ = (uint)bVar18 * auVar468._0_4_ | (uint)!bVar18 * auVar471._0_4_;
            bVar18 = (bool)((byte)(uVar392 >> 1) & 1);
            auVar476._4_4_ = (uint)bVar18 * auVar468._4_4_ | (uint)!bVar18 * auVar471._4_4_;
            bVar18 = (bool)((byte)(uVar392 >> 2) & 1);
            auVar476._8_4_ = (uint)bVar18 * auVar468._8_4_ | (uint)!bVar18 * auVar471._8_4_;
            bVar18 = (bool)((byte)(uVar392 >> 3) & 1);
            auVar476._12_4_ = (uint)bVar18 * auVar468._12_4_ | (uint)!bVar18 * auVar471._12_4_;
            bVar18 = (bool)((byte)(uVar392 >> 4) & 1);
            auVar476._16_4_ = (uint)bVar18 * auVar468._16_4_ | (uint)!bVar18 * auVar471._16_4_;
            bVar18 = (bool)((byte)(uVar392 >> 5) & 1);
            auVar476._20_4_ = (uint)bVar18 * auVar468._20_4_ | (uint)!bVar18 * auVar471._20_4_;
            bVar18 = (bool)((byte)(uVar392 >> 6) & 1);
            auVar476._24_4_ = (uint)bVar18 * auVar468._24_4_ | (uint)!bVar18 * auVar471._24_4_;
            bVar18 = (bool)((byte)(uVar392 >> 7) & 1);
            auVar476._28_4_ = (uint)bVar18 * auVar468._28_4_ | (uint)!bVar18 * auVar471._28_4_;
            bVar18 = (bool)((byte)(uVar392 >> 8) & 1);
            auVar476._32_4_ = (uint)bVar18 * auVar468._32_4_ | (uint)!bVar18 * auVar471._32_4_;
            bVar18 = (bool)((byte)(uVar392 >> 9) & 1);
            auVar476._36_4_ = (uint)bVar18 * auVar468._36_4_ | (uint)!bVar18 * auVar471._36_4_;
            bVar18 = (bool)((byte)(uVar392 >> 10) & 1);
            auVar476._40_4_ = (uint)bVar18 * auVar468._40_4_ | (uint)!bVar18 * auVar471._40_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xb) & 1);
            auVar476._44_4_ = (uint)bVar18 * auVar468._44_4_ | (uint)!bVar18 * auVar471._44_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xc) & 1);
            auVar476._48_4_ = (uint)bVar18 * auVar468._48_4_ | (uint)!bVar18 * auVar471._48_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xd) & 1);
            auVar476._52_4_ = (uint)bVar18 * auVar468._52_4_ | (uint)!bVar18 * auVar471._52_4_;
            bVar18 = (bool)((byte)(uVar392 >> 0xe) & 1);
            auVar476._56_4_ = (uint)bVar18 * auVar468._56_4_ | (uint)!bVar18 * auVar471._56_4_;
            bVar18 = SUB81(uVar392 >> 0xf,0);
            auVar476._60_4_ = (uint)bVar18 * auVar468._60_4_ | (uint)!bVar18 * auVar471._60_4_;
            auVar467 = vfmadd231ps_avx512f(auVar467,auVar476,auVar463);
            auVar467 = vfmadd231ps_avx512f(auVar467,auVar476,auVar464);
            auVar468 = vmulps_avx512f(auVar467,auVar467);
            auVar471 = vfmadd213ps_avx512f(auVar467,(undefined1  [64])_ps512_cephes_exp_p0,
                                           (undefined1  [64])afVar358);
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar467,(undefined1  [64])afVar359);
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar467,(undefined1  [64])afVar360);
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar467,(undefined1  [64])afVar361);
            auVar471 = vfmadd213ps_avx512f(auVar471,auVar467,(undefined1  [64])afVar362);
            auVar467 = vfmadd213ps_avx512f(auVar471,auVar468,auVar467);
            auVar467 = vaddps_avx512f(auVar467,(undefined1  [64])afVar356);
            auVar468 = vcvttps2dq_avx512f(auVar476);
            auVar468 = vpaddd_avx512f(auVar468,auVar465);
            auVar468 = vpslld_avx512f(auVar468,0x17);
            auVar467 = vfmadd213ps_avx512f(auVar468,auVar467,auVar462);
            auVar468 = vrcp14ps_avx512f(auVar467);
            auVar467 = vfmsub213ps_avx512f(auVar467,auVar468,auVar462);
            auVar467 = vfnmadd132ps_avx512vl(auVar467,auVar468,auVar468);
            auVar466 = vfnmsub213ps_avx512f(auVar467,auVar466,auVar462);
            auVar535 = vmulps_avx512f(auVar466,auVar535);
            in_ZMM17 = _ps512_exp_hi;
            in_ZMM18 = _ps512_exp_lo;
            break;
          case 6:
            auVar466 = vbroadcastss_avx512f(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var7)));
            uVar400 = (*(uint **)(&this->field_0xf8 + (long)p_Var7))[1];
            auVar346._4_4_ = uVar400;
            auVar346._0_4_ = uVar400;
            auVar346._8_4_ = uVar400;
            auVar346._12_4_ = uVar400;
            auVar346._16_4_ = uVar400;
            auVar346._20_4_ = uVar400;
            auVar346._24_4_ = uVar400;
            auVar346._28_4_ = uVar400;
            auVar346._32_4_ = uVar400;
            auVar346._36_4_ = uVar400;
            auVar346._40_4_ = uVar400;
            auVar346._44_4_ = uVar400;
            auVar346._48_4_ = uVar400;
            auVar346._52_4_ = uVar400;
            auVar346._56_4_ = uVar400;
            auVar346._60_4_ = uVar400;
            auVar466 = vfmadd213ps_avx512f(auVar466,auVar535,auVar346);
            auVar466 = vmaxps_avx512f(auVar466,auVar567);
            auVar466 = vminps_avx512f(auVar466,auVar462);
            auVar535 = vmulps_avx512f(auVar466,auVar535);
          }
          auVar431 = auVar535._0_16_;
          if (iVar410 == 1) {
            *(int *)*local_2f0 = auVar535._0_4_;
            uVar4 = vextractps_avx(auVar431,1);
            *(undefined4 *)((long)*local_2f0 + lVar428 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,2);
            *(undefined4 *)((long)*local_2f0 + lVar367 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,3);
            *(undefined4 *)((long)*local_2f0 + lVar368 * 4) = uVar4;
            auVar431 = auVar535._16_16_;
            *(int *)((long)*local_2f0 + (long)(iVar383 * 4) * 4) = auVar535._16_4_;
            uVar4 = vextractps_avx(auVar431,1);
            *(undefined4 *)((long)*local_2f0 + (long)(iVar383 * 5) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,2);
            *(undefined4 *)((long)*local_2f0 + (long)(iVar383 * 6) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,3);
            *(undefined4 *)((long)*local_2f0 + (long)(iVar383 * 7) * 4) = uVar4;
            auVar431 = vextracti32x4_avx512f(auVar535,2);
            *(int *)((long)*local_2f0 + (long)(iVar383 * 8) * 4) = auVar431._0_4_;
            uVar4 = vextractps_avx(auVar431,1);
            *(undefined4 *)((long)*local_2f0 + (long)(iVar383 * 9) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,2);
            *(undefined4 *)((long)*local_2f0 + (long)(iVar383 * 10) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,3);
            *(undefined4 *)((long)*local_2f0 + (long)(iVar383 * 0xb) * 4) = uVar4;
            auVar431 = vextracti32x4_avx512f(auVar535,3);
            *(int *)((long)*local_2f0 + local_c0 * 4) = auVar431._0_4_;
            uVar4 = vextractps_avx(auVar431,1);
            *(undefined4 *)((long)*local_2f0 + local_c8 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,2);
            *(undefined4 *)((long)*local_2f0 + local_d0 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,3);
            *(undefined4 *)((long)*local_2f0 + local_d8 * 4) = uVar4;
            local_2f0 = (undefined1 (*) [64])((long)*local_2f0 + 4);
          }
          else if (iVar410 == 4) {
            *(undefined1 (*) [16])*local_2f0 = auVar431;
            auVar431 = vextractf32x4_avx512f(auVar535,1);
            *(undefined1 (*) [16])((long)*local_2f0 + lVar428 * 4) = auVar431;
            auVar431 = vextractf32x4_avx512f(auVar535,2);
            *(undefined1 (*) [16])((long)*local_2f0 + lVar367 * 4) = auVar431;
            auVar431 = vextractf32x4_avx512f(auVar535,3);
            *(undefined1 (*) [16])((long)*local_2f0 + lVar368 * 4) = auVar431;
            local_2f0 = (undefined1 (*) [64])((long)*local_2f0 + 0x10);
          }
          else if (iVar410 == 8) {
            *(undefined1 (*) [32])*local_2f0 = auVar535._0_32_;
            auVar447 = vextractf64x4_avx512f(auVar535,1);
            *(undefined1 (*) [32])((long)*local_2f0 + lVar428 * 4) = auVar447;
            local_2f0 = (undefined1 (*) [64])((long)*local_2f0 + 0x20);
          }
          else if (iVar410 == 0x10) {
            *local_2f0 = auVar535;
            local_2f0 = local_2f0 + 1;
          }
          iVar404 = iVar404 + local_188.elempack * iVar6;
          local_310 = (undefined1 (*) [32])((long)local_310 + lVar3);
          local_290 = local_290 + lVar3;
        }
      }
      uVar400 = iVar382 * 0x10;
      local_140 = (ulong)uVar400;
      uVar369 = (long)(iVar389 + iVar382 * -0x10) / 8;
      local_138 = uVar369 & 0xffffffff;
      local_120 = uVar419 * 4;
      lVar372 = lVar390 * local_120;
      lVar412 = lVar422 * local_120;
      lVar416 = uVar419 * 0x20;
      uVar393 = 0;
      uVar426 = 0;
      if (0 < (int)uVar369) {
        uVar426 = uVar369 & 0xffffffff;
      }
      local_128 = (long)(int)uVar400;
      auVar461 = vmovdqu64_avx512f(local_b8);
      lVar391 = auVar461._0_8_;
      lVar405 = vpextrq_avx(auVar461._0_16_,1);
      lVar420 = vpextrq_avx(auVar461._16_16_,1);
      lVar385 = vpextrq_avx(auVar430,1);
      local_130 = lVar397 * 4;
      auVar447._8_4_ = 0x3f000000;
      auVar447._0_8_ = 0x3f0000003f000000;
      auVar447._12_4_ = 0x3f000000;
      auVar447._16_4_ = 0x3f000000;
      auVar447._20_4_ = 0x3f000000;
      auVar447._24_4_ = 0x3f000000;
      auVar447._28_4_ = 0x3f000000;
      auVar446._8_4_ = 0x3fb8aa3b;
      auVar446._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar446._12_4_ = 0x3fb8aa3b;
      auVar446._16_4_ = 0x3fb8aa3b;
      auVar446._20_4_ = 0x3fb8aa3b;
      auVar446._24_4_ = 0x3fb8aa3b;
      auVar446._28_4_ = 0x3fb8aa3b;
      auVar538._8_4_ = 0x3f800000;
      auVar538._0_8_ = 0x3f8000003f800000;
      auVar538._12_4_ = 0x3f800000;
      auVar538._16_4_ = 0x3f800000;
      auVar538._20_4_ = 0x3f800000;
      auVar538._24_4_ = 0x3f800000;
      auVar538._28_4_ = 0x3f800000;
      auVar541._8_4_ = 0x3f318000;
      auVar541._0_8_ = 0x3f3180003f318000;
      auVar541._12_4_ = 0x3f318000;
      auVar541._16_4_ = 0x3f318000;
      auVar541._20_4_ = 0x3f318000;
      auVar541._24_4_ = 0x3f318000;
      auVar541._28_4_ = 0x3f318000;
      auVar546._8_4_ = 0x39506967;
      auVar546._0_8_ = 0x3950696739506967;
      auVar546._12_4_ = 0x39506967;
      auVar546._16_4_ = 0x39506967;
      auVar546._20_4_ = 0x39506967;
      auVar546._24_4_ = 0x39506967;
      auVar546._28_4_ = 0x39506967;
      auVar548._8_4_ = 0x3ab743ce;
      auVar548._0_8_ = 0x3ab743ce3ab743ce;
      auVar548._12_4_ = 0x3ab743ce;
      auVar548._16_4_ = 0x3ab743ce;
      auVar548._20_4_ = 0x3ab743ce;
      auVar548._24_4_ = 0x3ab743ce;
      auVar548._28_4_ = 0x3ab743ce;
      auVar554._8_4_ = 0x3c088908;
      auVar554._0_8_ = 0x3c0889083c088908;
      auVar554._12_4_ = 0x3c088908;
      auVar554._16_4_ = 0x3c088908;
      auVar554._20_4_ = 0x3c088908;
      auVar554._24_4_ = 0x3c088908;
      auVar554._28_4_ = 0x3c088908;
      auVar560._8_4_ = 0x3d2aa9c1;
      auVar560._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar560._12_4_ = 0x3d2aa9c1;
      auVar560._16_4_ = 0x3d2aa9c1;
      auVar560._20_4_ = 0x3d2aa9c1;
      auVar560._24_4_ = 0x3d2aa9c1;
      auVar560._28_4_ = 0x3d2aa9c1;
      auVar562._8_4_ = 0x3e2aaaaa;
      auVar562._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar562._12_4_ = 0x3e2aaaaa;
      auVar562._16_4_ = 0x3e2aaaaa;
      auVar562._20_4_ = 0x3e2aaaaa;
      auVar562._24_4_ = 0x3e2aaaaa;
      auVar562._28_4_ = 0x3e2aaaaa;
      auVar564._8_4_ = 0x3f800000;
      auVar564._0_8_ = 0x3f8000003f800000;
      auVar564._12_4_ = 0x3f800000;
      auVar564._16_4_ = 0x3f800000;
      auVar564._20_4_ = 0x3f800000;
      auVar564._24_4_ = 0x3f800000;
      auVar564._28_4_ = 0x3f800000;
      auVar566._8_4_ = 0xb95e8083;
      auVar566._0_8_ = 0xb95e8083b95e8083;
      auVar566._12_4_ = 0xb95e8083;
      auVar566._16_4_ = 0xb95e8083;
      auVar566._20_4_ = 0xb95e8083;
      auVar566._24_4_ = 0xb95e8083;
      auVar566._28_4_ = 0xb95e8083;
      for (; uVar393 != uVar426; uVar393 = uVar393 + 1) {
        uVar392 = local_128 + uVar393 * 8;
        uVar409 = top_blob->w;
        iVar382 = top_blob->elempack;
        uVar388 = (int)uVar392 >> 0x1f;
        local_310 = (undefined1 (*) [32])
                    ((long)(int)((long)((ulong)uVar388 << 0x20 | uVar392 & 0xffffffff) /
                                (long)iVar382) * (long)(int)uVar409 * top_blob->elemsize +
                    (long)top_blob->data);
        uVar376 = (ulong)uVar388 << 0x20 | uVar392 & 0xffffffff;
        lVar370 = (long)local_188.h * (long)local_188.elempack;
        local_2d8 = 0;
        uVar373 = 0;
        if (0 < (int)uVar409) {
          uVar373 = (ulong)uVar409;
        }
        iVar410 = 0;
        local_2e0 = local_130;
        for (uVar427 = 0; uVar427 != uVar373; uVar427 = uVar427 + 1) {
          auVar463 = ZEXT1664((undefined1  [16])0x0);
          auVar464 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar8 != 0) {
            auVar464 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar392 * 4));
          }
          pauVar413 = (undefined1 (*) [32])
                      ((this->weight_data_tm).cstep *
                       (long)(((int)((long)uVar376 % 0x10) >> 3) + (int)((long)uVar376 / 0x10)) *
                       (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          iVar404 = local_188.elempack * iVar6 * (int)uVar427;
          lVar394 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar417 = (long)local_188.data + local_2e0;
          puVar371 = (undefined4 *)((long)local_188.data + local_2d8);
          uVar401 = 0;
          auVar431 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar431);
          auVar431 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = (float  [16])ZEXT1664(auVar431);
          while( true ) {
            local_360 = (int)lVar370;
            if (local_360 <= (int)((uint)uVar401 | 0xf)) break;
            lVar374 = (int)((long)((ulong)(uint)((int)(uint)uVar401 >> 0x1f) << 0x20 |
                                  uVar401 & 0xffffffff) / (long)local_188.elempack) * lVar394;
            if (local_188.elempack == 0x10) {
              puVar375 = (undefined4 *)((long)local_188.data + lVar374 + (long)iVar410 * 4);
              uVar395 = uVar419;
              pauVar402 = pauVar413;
              while (iVar363 = (int)uVar395, uVar395 = (ulong)(iVar363 - 1), iVar363 != 0) {
                in_ZMM26 = ZEXT3264(pauVar402[6]);
                in_ZMM28 = ZEXT3264(pauVar402[8]);
                auVar567 = ZEXT3264(pauVar402[9]);
                auVar462 = ZEXT3264(pauVar402[10]);
                in_ZMM31 = ZEXT3264(pauVar402[0xd]);
                uVar4 = *puVar375;
                auVar144._4_4_ = uVar4;
                auVar144._0_4_ = uVar4;
                auVar144._8_4_ = uVar4;
                auVar144._12_4_ = uVar4;
                auVar144._16_4_ = uVar4;
                auVar144._20_4_ = uVar4;
                auVar144._24_4_ = uVar4;
                auVar144._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar144);
                uVar4 = puVar375[1];
                auVar145._4_4_ = uVar4;
                auVar145._0_4_ = uVar4;
                auVar145._8_4_ = uVar4;
                auVar145._12_4_ = uVar4;
                auVar145._16_4_ = uVar4;
                auVar145._20_4_ = uVar4;
                auVar145._24_4_ = uVar4;
                auVar145._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar145);
                uVar4 = puVar375[2];
                auVar146._4_4_ = uVar4;
                auVar146._0_4_ = uVar4;
                auVar146._8_4_ = uVar4;
                auVar146._12_4_ = uVar4;
                auVar146._16_4_ = uVar4;
                auVar146._20_4_ = uVar4;
                auVar146._24_4_ = uVar4;
                auVar146._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar146);
                uVar4 = puVar375[3];
                auVar147._4_4_ = uVar4;
                auVar147._0_4_ = uVar4;
                auVar147._8_4_ = uVar4;
                auVar147._12_4_ = uVar4;
                auVar147._16_4_ = uVar4;
                auVar147._20_4_ = uVar4;
                auVar147._24_4_ = uVar4;
                auVar147._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar147);
                uVar4 = puVar375[4];
                auVar148._4_4_ = uVar4;
                auVar148._0_4_ = uVar4;
                auVar148._8_4_ = uVar4;
                auVar148._12_4_ = uVar4;
                auVar148._16_4_ = uVar4;
                auVar148._20_4_ = uVar4;
                auVar148._24_4_ = uVar4;
                auVar148._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[4],auVar148);
                uVar4 = puVar375[5];
                auVar149._4_4_ = uVar4;
                auVar149._0_4_ = uVar4;
                auVar149._8_4_ = uVar4;
                auVar149._12_4_ = uVar4;
                auVar149._16_4_ = uVar4;
                auVar149._20_4_ = uVar4;
                auVar149._24_4_ = uVar4;
                auVar149._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar402[5],auVar149);
                uVar4 = puVar375[6];
                auVar150._4_4_ = uVar4;
                auVar150._0_4_ = uVar4;
                auVar150._8_4_ = uVar4;
                auVar150._12_4_ = uVar4;
                auVar150._16_4_ = uVar4;
                auVar150._20_4_ = uVar4;
                auVar150._24_4_ = uVar4;
                auVar150._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar402[6],auVar150);
                uVar4 = puVar375[7];
                auVar151._4_4_ = uVar4;
                auVar151._0_4_ = uVar4;
                auVar151._8_4_ = uVar4;
                auVar151._12_4_ = uVar4;
                auVar151._16_4_ = uVar4;
                auVar151._20_4_ = uVar4;
                auVar151._24_4_ = uVar4;
                auVar151._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar451,pauVar402[7],auVar151);
                uVar4 = puVar375[8];
                auVar152._4_4_ = uVar4;
                auVar152._0_4_ = uVar4;
                auVar152._8_4_ = uVar4;
                auVar152._12_4_ = uVar4;
                auVar152._16_4_ = uVar4;
                auVar152._20_4_ = uVar4;
                auVar152._24_4_ = uVar4;
                auVar152._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[8],auVar152);
                uVar4 = puVar375[9];
                auVar153._4_4_ = uVar4;
                auVar153._0_4_ = uVar4;
                auVar153._8_4_ = uVar4;
                auVar153._12_4_ = uVar4;
                auVar153._16_4_ = uVar4;
                auVar153._20_4_ = uVar4;
                auVar153._24_4_ = uVar4;
                auVar153._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar402[9],auVar153);
                uVar4 = puVar375[10];
                auVar154._4_4_ = uVar4;
                auVar154._0_4_ = uVar4;
                auVar154._8_4_ = uVar4;
                auVar154._12_4_ = uVar4;
                auVar154._16_4_ = uVar4;
                auVar154._20_4_ = uVar4;
                auVar154._24_4_ = uVar4;
                auVar154._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar402[10],auVar154);
                uVar4 = puVar375[0xb];
                auVar155._4_4_ = uVar4;
                auVar155._0_4_ = uVar4;
                auVar155._8_4_ = uVar4;
                auVar155._12_4_ = uVar4;
                auVar155._16_4_ = uVar4;
                auVar155._20_4_ = uVar4;
                auVar155._24_4_ = uVar4;
                auVar155._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar451,pauVar402[0xb],auVar155);
                uVar4 = puVar375[0xc];
                auVar156._4_4_ = uVar4;
                auVar156._0_4_ = uVar4;
                auVar156._8_4_ = uVar4;
                auVar156._12_4_ = uVar4;
                auVar156._16_4_ = uVar4;
                auVar156._20_4_ = uVar4;
                auVar156._24_4_ = uVar4;
                auVar156._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[0xc],auVar156);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar375[0xd];
                auVar157._4_4_ = uVar4;
                auVar157._0_4_ = uVar4;
                auVar157._8_4_ = uVar4;
                auVar157._12_4_ = uVar4;
                auVar157._16_4_ = uVar4;
                auVar157._20_4_ = uVar4;
                auVar157._24_4_ = uVar4;
                auVar157._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar449,pauVar402[0xd],auVar157);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar375[0xe];
                auVar158._4_4_ = uVar4;
                auVar158._0_4_ = uVar4;
                auVar158._8_4_ = uVar4;
                auVar158._12_4_ = uVar4;
                auVar158._16_4_ = uVar4;
                auVar158._20_4_ = uVar4;
                auVar158._24_4_ = uVar4;
                auVar158._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar450,pauVar402[0xe],auVar158);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar375[0xf];
                auVar159._4_4_ = uVar4;
                auVar159._0_4_ = uVar4;
                auVar159._8_4_ = uVar4;
                auVar159._12_4_ = uVar4;
                auVar159._16_4_ = uVar4;
                auVar159._20_4_ = uVar4;
                auVar159._24_4_ = uVar4;
                auVar159._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar451,pauVar402[0xf],auVar159);
                auVar463 = ZEXT3264(auVar448);
                pauVar402 = pauVar402 + 0x10;
                puVar375 = puVar375 + lVar415;
              }
              pauVar413 = pauVar413 + uVar419 * 0x10;
            }
            else {
              puVar375 = (undefined4 *)((long)local_188.data + lVar374 + (long)iVar404 * 4);
            }
            if (local_188.elempack == 8) {
              puVar408 = puVar375 + 7;
              uVar395 = uVar419;
              pauVar402 = pauVar413;
              while (iVar363 = (int)uVar395, uVar395 = (ulong)(iVar363 - 1), iVar363 != 0) {
                in_ZMM26 = ZEXT3264(pauVar402[10]);
                in_ZMM28 = ZEXT3264(pauVar402[0xc]);
                auVar567 = ZEXT3264(pauVar402[0xd]);
                auVar462 = ZEXT3264(pauVar402[0xe]);
                in_ZMM31 = ZEXT3264(pauVar402[0xf]);
                uVar4 = puVar408[-7];
                auVar160._4_4_ = uVar4;
                auVar160._0_4_ = uVar4;
                auVar160._8_4_ = uVar4;
                auVar160._12_4_ = uVar4;
                auVar160._16_4_ = uVar4;
                auVar160._20_4_ = uVar4;
                auVar160._24_4_ = uVar4;
                auVar160._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar160);
                uVar4 = puVar408[-6];
                auVar161._4_4_ = uVar4;
                auVar161._0_4_ = uVar4;
                auVar161._8_4_ = uVar4;
                auVar161._12_4_ = uVar4;
                auVar161._16_4_ = uVar4;
                auVar161._20_4_ = uVar4;
                auVar161._24_4_ = uVar4;
                auVar161._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar161);
                uVar4 = puVar408[-5];
                auVar162._4_4_ = uVar4;
                auVar162._0_4_ = uVar4;
                auVar162._8_4_ = uVar4;
                auVar162._12_4_ = uVar4;
                auVar162._16_4_ = uVar4;
                auVar162._20_4_ = uVar4;
                auVar162._24_4_ = uVar4;
                auVar162._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar162);
                uVar4 = puVar408[-4];
                auVar163._4_4_ = uVar4;
                auVar163._0_4_ = uVar4;
                auVar163._8_4_ = uVar4;
                auVar163._12_4_ = uVar4;
                auVar163._16_4_ = uVar4;
                auVar163._20_4_ = uVar4;
                auVar163._24_4_ = uVar4;
                auVar163._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar163);
                uVar4 = puVar408[-3];
                auVar164._4_4_ = uVar4;
                auVar164._0_4_ = uVar4;
                auVar164._8_4_ = uVar4;
                auVar164._12_4_ = uVar4;
                auVar164._16_4_ = uVar4;
                auVar164._20_4_ = uVar4;
                auVar164._24_4_ = uVar4;
                auVar164._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[4],auVar164);
                uVar4 = puVar408[-2];
                auVar165._4_4_ = uVar4;
                auVar165._0_4_ = uVar4;
                auVar165._8_4_ = uVar4;
                auVar165._12_4_ = uVar4;
                auVar165._16_4_ = uVar4;
                auVar165._20_4_ = uVar4;
                auVar165._24_4_ = uVar4;
                auVar165._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar402[5],auVar165);
                uVar4 = puVar408[-1];
                auVar166._4_4_ = uVar4;
                auVar166._0_4_ = uVar4;
                auVar166._8_4_ = uVar4;
                auVar166._12_4_ = uVar4;
                auVar166._16_4_ = uVar4;
                auVar166._20_4_ = uVar4;
                auVar166._24_4_ = uVar4;
                auVar166._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar402[6],auVar166);
                uVar4 = *puVar408;
                auVar167._4_4_ = uVar4;
                auVar167._0_4_ = uVar4;
                auVar167._8_4_ = uVar4;
                auVar167._12_4_ = uVar4;
                auVar167._16_4_ = uVar4;
                auVar167._20_4_ = uVar4;
                auVar167._24_4_ = uVar4;
                auVar167._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar451,pauVar402[7],auVar167);
                uVar4 = puVar408[lVar397 + -7];
                auVar168._4_4_ = uVar4;
                auVar168._0_4_ = uVar4;
                auVar168._8_4_ = uVar4;
                auVar168._12_4_ = uVar4;
                auVar168._16_4_ = uVar4;
                auVar168._20_4_ = uVar4;
                auVar168._24_4_ = uVar4;
                auVar168._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[8],auVar168);
                uVar4 = puVar408[lVar397 + -6];
                auVar169._4_4_ = uVar4;
                auVar169._0_4_ = uVar4;
                auVar169._8_4_ = uVar4;
                auVar169._12_4_ = uVar4;
                auVar169._16_4_ = uVar4;
                auVar169._20_4_ = uVar4;
                auVar169._24_4_ = uVar4;
                auVar169._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar402[9],auVar169);
                uVar4 = puVar408[lVar397 + -5];
                auVar170._4_4_ = uVar4;
                auVar170._0_4_ = uVar4;
                auVar170._8_4_ = uVar4;
                auVar170._12_4_ = uVar4;
                auVar170._16_4_ = uVar4;
                auVar170._20_4_ = uVar4;
                auVar170._24_4_ = uVar4;
                auVar170._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar402[10],auVar170);
                uVar4 = puVar408[lVar397 + -4];
                auVar171._4_4_ = uVar4;
                auVar171._0_4_ = uVar4;
                auVar171._8_4_ = uVar4;
                auVar171._12_4_ = uVar4;
                auVar171._16_4_ = uVar4;
                auVar171._20_4_ = uVar4;
                auVar171._24_4_ = uVar4;
                auVar171._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar451,pauVar402[0xb],auVar171);
                uVar4 = puVar408[lVar397 + -3];
                auVar172._4_4_ = uVar4;
                auVar172._0_4_ = uVar4;
                auVar172._8_4_ = uVar4;
                auVar172._12_4_ = uVar4;
                auVar172._16_4_ = uVar4;
                auVar172._20_4_ = uVar4;
                auVar172._24_4_ = uVar4;
                auVar172._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[0xc],auVar172);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar408[lVar397 + -2];
                auVar173._4_4_ = uVar4;
                auVar173._0_4_ = uVar4;
                auVar173._8_4_ = uVar4;
                auVar173._12_4_ = uVar4;
                auVar173._16_4_ = uVar4;
                auVar173._20_4_ = uVar4;
                auVar173._24_4_ = uVar4;
                auVar173._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar449,pauVar402[0xd],auVar173);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar408[lVar397 + -1];
                auVar174._4_4_ = uVar4;
                auVar174._0_4_ = uVar4;
                auVar174._8_4_ = uVar4;
                auVar174._12_4_ = uVar4;
                auVar174._16_4_ = uVar4;
                auVar174._20_4_ = uVar4;
                auVar174._24_4_ = uVar4;
                auVar174._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar450,pauVar402[0xe],auVar174);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar408[lVar397];
                auVar175._4_4_ = uVar4;
                auVar175._0_4_ = uVar4;
                auVar175._8_4_ = uVar4;
                auVar175._12_4_ = uVar4;
                auVar175._16_4_ = uVar4;
                auVar175._20_4_ = uVar4;
                auVar175._24_4_ = uVar4;
                auVar175._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar451,pauVar402[0xf],auVar175);
                auVar463 = ZEXT3264(auVar448);
                pauVar402 = pauVar402 + 0x10;
                puVar408 = puVar408 + lVar390;
              }
              puVar375 = (undefined4 *)((long)puVar375 + lVar372);
              pauVar413 = pauVar413 + uVar419 * 0x10;
            }
            if (local_188.elempack == 4) {
              puVar408 = puVar375 + 3;
              uVar395 = uVar419;
              pauVar402 = pauVar413;
              while (iVar363 = (int)uVar395, uVar395 = (ulong)(iVar363 - 1), iVar363 != 0) {
                in_ZMM26 = ZEXT3264(pauVar402[10]);
                in_ZMM28 = ZEXT3264(pauVar402[0xc]);
                auVar567 = ZEXT3264(pauVar402[0xd]);
                auVar462 = ZEXT3264(pauVar402[0xe]);
                in_ZMM31 = ZEXT3264(pauVar402[0xf]);
                uVar4 = puVar408[-3];
                auVar176._4_4_ = uVar4;
                auVar176._0_4_ = uVar4;
                auVar176._8_4_ = uVar4;
                auVar176._12_4_ = uVar4;
                auVar176._16_4_ = uVar4;
                auVar176._20_4_ = uVar4;
                auVar176._24_4_ = uVar4;
                auVar176._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar176);
                uVar4 = puVar408[-2];
                auVar177._4_4_ = uVar4;
                auVar177._0_4_ = uVar4;
                auVar177._8_4_ = uVar4;
                auVar177._12_4_ = uVar4;
                auVar177._16_4_ = uVar4;
                auVar177._20_4_ = uVar4;
                auVar177._24_4_ = uVar4;
                auVar177._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar177);
                uVar4 = puVar408[-1];
                auVar178._4_4_ = uVar4;
                auVar178._0_4_ = uVar4;
                auVar178._8_4_ = uVar4;
                auVar178._12_4_ = uVar4;
                auVar178._16_4_ = uVar4;
                auVar178._20_4_ = uVar4;
                auVar178._24_4_ = uVar4;
                auVar178._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar178);
                uVar4 = *puVar408;
                auVar179._4_4_ = uVar4;
                auVar179._0_4_ = uVar4;
                auVar179._8_4_ = uVar4;
                auVar179._12_4_ = uVar4;
                auVar179._16_4_ = uVar4;
                auVar179._20_4_ = uVar4;
                auVar179._24_4_ = uVar4;
                auVar179._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar179);
                uVar4 = puVar408[lVar397 + -3];
                auVar180._4_4_ = uVar4;
                auVar180._0_4_ = uVar4;
                auVar180._8_4_ = uVar4;
                auVar180._12_4_ = uVar4;
                auVar180._16_4_ = uVar4;
                auVar180._20_4_ = uVar4;
                auVar180._24_4_ = uVar4;
                auVar180._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[4],auVar180);
                uVar4 = puVar408[lVar397 + -2];
                auVar181._4_4_ = uVar4;
                auVar181._0_4_ = uVar4;
                auVar181._8_4_ = uVar4;
                auVar181._12_4_ = uVar4;
                auVar181._16_4_ = uVar4;
                auVar181._20_4_ = uVar4;
                auVar181._24_4_ = uVar4;
                auVar181._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar402[5],auVar181);
                uVar4 = puVar408[lVar397 + -1];
                auVar182._4_4_ = uVar4;
                auVar182._0_4_ = uVar4;
                auVar182._8_4_ = uVar4;
                auVar182._12_4_ = uVar4;
                auVar182._16_4_ = uVar4;
                auVar182._20_4_ = uVar4;
                auVar182._24_4_ = uVar4;
                auVar182._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar402[6],auVar182);
                uVar4 = puVar408[lVar397];
                auVar183._4_4_ = uVar4;
                auVar183._0_4_ = uVar4;
                auVar183._8_4_ = uVar4;
                auVar183._12_4_ = uVar4;
                auVar183._16_4_ = uVar4;
                auVar183._20_4_ = uVar4;
                auVar183._24_4_ = uVar4;
                auVar183._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar451,pauVar402[7],auVar183);
                uVar4 = puVar408[lVar391 + -3];
                auVar184._4_4_ = uVar4;
                auVar184._0_4_ = uVar4;
                auVar184._8_4_ = uVar4;
                auVar184._12_4_ = uVar4;
                auVar184._16_4_ = uVar4;
                auVar184._20_4_ = uVar4;
                auVar184._24_4_ = uVar4;
                auVar184._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[8],auVar184);
                uVar4 = puVar408[lVar391 + -2];
                auVar185._4_4_ = uVar4;
                auVar185._0_4_ = uVar4;
                auVar185._8_4_ = uVar4;
                auVar185._12_4_ = uVar4;
                auVar185._16_4_ = uVar4;
                auVar185._20_4_ = uVar4;
                auVar185._24_4_ = uVar4;
                auVar185._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar402[9],auVar185);
                uVar4 = puVar408[lVar391 + -1];
                auVar186._4_4_ = uVar4;
                auVar186._0_4_ = uVar4;
                auVar186._8_4_ = uVar4;
                auVar186._12_4_ = uVar4;
                auVar186._16_4_ = uVar4;
                auVar186._20_4_ = uVar4;
                auVar186._24_4_ = uVar4;
                auVar186._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar402[10],auVar186);
                uVar4 = puVar408[lVar391];
                auVar187._4_4_ = uVar4;
                auVar187._0_4_ = uVar4;
                auVar187._8_4_ = uVar4;
                auVar187._12_4_ = uVar4;
                auVar187._16_4_ = uVar4;
                auVar187._20_4_ = uVar4;
                auVar187._24_4_ = uVar4;
                auVar187._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar451,pauVar402[0xb],auVar187);
                uVar4 = puVar408[lVar405 + -3];
                auVar188._4_4_ = uVar4;
                auVar188._0_4_ = uVar4;
                auVar188._8_4_ = uVar4;
                auVar188._12_4_ = uVar4;
                auVar188._16_4_ = uVar4;
                auVar188._20_4_ = uVar4;
                auVar188._24_4_ = uVar4;
                auVar188._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[0xc],auVar188);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar408[lVar405 + -2];
                auVar189._4_4_ = uVar4;
                auVar189._0_4_ = uVar4;
                auVar189._8_4_ = uVar4;
                auVar189._12_4_ = uVar4;
                auVar189._16_4_ = uVar4;
                auVar189._20_4_ = uVar4;
                auVar189._24_4_ = uVar4;
                auVar189._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar449,pauVar402[0xd],auVar189);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar408[lVar405 + -1];
                auVar190._4_4_ = uVar4;
                auVar190._0_4_ = uVar4;
                auVar190._8_4_ = uVar4;
                auVar190._12_4_ = uVar4;
                auVar190._16_4_ = uVar4;
                auVar190._20_4_ = uVar4;
                auVar190._24_4_ = uVar4;
                auVar190._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar450,pauVar402[0xe],auVar190);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar408[lVar405];
                auVar191._4_4_ = uVar4;
                auVar191._0_4_ = uVar4;
                auVar191._8_4_ = uVar4;
                auVar191._12_4_ = uVar4;
                auVar191._16_4_ = uVar4;
                auVar191._20_4_ = uVar4;
                auVar191._24_4_ = uVar4;
                auVar191._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar451,pauVar402[0xf],auVar191);
                auVar463 = ZEXT3264(auVar448);
                pauVar402 = pauVar402 + 0x10;
                puVar408 = puVar408 + lVar422;
              }
              puVar375 = (undefined4 *)((long)puVar375 + lVar412);
              pauVar413 = pauVar413 + uVar419 * 0x10;
            }
            uVar395 = uVar419;
            pauVar402 = pauVar413;
            if (local_188.elempack == 1) {
              while ((int)uVar395 != 0) {
                in_ZMM26 = ZEXT3264(pauVar402[10]);
                in_ZMM28 = ZEXT3264(pauVar402[0xc]);
                auVar567 = ZEXT3264(pauVar402[0xd]);
                auVar462 = ZEXT3264(pauVar402[0xe]);
                in_ZMM31 = ZEXT3264(pauVar402[0xf]);
                uVar4 = *puVar375;
                auVar192._4_4_ = uVar4;
                auVar192._0_4_ = uVar4;
                auVar192._8_4_ = uVar4;
                auVar192._12_4_ = uVar4;
                auVar192._16_4_ = uVar4;
                auVar192._20_4_ = uVar4;
                auVar192._24_4_ = uVar4;
                auVar192._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar192);
                uVar4 = puVar375[lVar397];
                auVar193._4_4_ = uVar4;
                auVar193._0_4_ = uVar4;
                auVar193._8_4_ = uVar4;
                auVar193._12_4_ = uVar4;
                auVar193._16_4_ = uVar4;
                auVar193._20_4_ = uVar4;
                auVar193._24_4_ = uVar4;
                auVar193._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar193);
                uVar4 = puVar375[lVar391];
                auVar194._4_4_ = uVar4;
                auVar194._0_4_ = uVar4;
                auVar194._8_4_ = uVar4;
                auVar194._12_4_ = uVar4;
                auVar194._16_4_ = uVar4;
                auVar194._20_4_ = uVar4;
                auVar194._24_4_ = uVar4;
                auVar194._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar194);
                uVar4 = puVar375[lVar405];
                auVar195._4_4_ = uVar4;
                auVar195._0_4_ = uVar4;
                auVar195._8_4_ = uVar4;
                auVar195._12_4_ = uVar4;
                auVar195._16_4_ = uVar4;
                auVar195._20_4_ = uVar4;
                auVar195._24_4_ = uVar4;
                auVar195._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar195);
                uVar4 = puVar375[auVar461._16_8_];
                auVar196._4_4_ = uVar4;
                auVar196._0_4_ = uVar4;
                auVar196._8_4_ = uVar4;
                auVar196._12_4_ = uVar4;
                auVar196._16_4_ = uVar4;
                auVar196._20_4_ = uVar4;
                auVar196._24_4_ = uVar4;
                auVar196._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[4],auVar196);
                uVar4 = puVar375[lVar420];
                auVar197._4_4_ = uVar4;
                auVar197._0_4_ = uVar4;
                auVar197._8_4_ = uVar4;
                auVar197._12_4_ = uVar4;
                auVar197._16_4_ = uVar4;
                auVar197._20_4_ = uVar4;
                auVar197._24_4_ = uVar4;
                auVar197._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar402[5],auVar197);
                uVar4 = puVar375[lVar528];
                auVar198._4_4_ = uVar4;
                auVar198._0_4_ = uVar4;
                auVar198._8_4_ = uVar4;
                auVar198._12_4_ = uVar4;
                auVar198._16_4_ = uVar4;
                auVar198._20_4_ = uVar4;
                auVar198._24_4_ = uVar4;
                auVar198._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar402[6],auVar198);
                uVar4 = puVar375[lVar9];
                auVar199._4_4_ = uVar4;
                auVar199._0_4_ = uVar4;
                auVar199._8_4_ = uVar4;
                auVar199._12_4_ = uVar4;
                auVar199._16_4_ = uVar4;
                auVar199._20_4_ = uVar4;
                auVar199._24_4_ = uVar4;
                auVar199._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar451,pauVar402[7],auVar199);
                uVar4 = puVar375[lVar529];
                auVar200._4_4_ = uVar4;
                auVar200._0_4_ = uVar4;
                auVar200._8_4_ = uVar4;
                auVar200._12_4_ = uVar4;
                auVar200._16_4_ = uVar4;
                auVar200._20_4_ = uVar4;
                auVar200._24_4_ = uVar4;
                auVar200._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[8],auVar200);
                uVar4 = puVar375[lVar386];
                auVar201._4_4_ = uVar4;
                auVar201._0_4_ = uVar4;
                auVar201._8_4_ = uVar4;
                auVar201._12_4_ = uVar4;
                auVar201._16_4_ = uVar4;
                auVar201._20_4_ = uVar4;
                auVar201._24_4_ = uVar4;
                auVar201._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(auVar449,pauVar402[9],auVar201);
                uVar4 = puVar375[lVar496];
                auVar202._4_4_ = uVar4;
                auVar202._0_4_ = uVar4;
                auVar202._8_4_ = uVar4;
                auVar202._12_4_ = uVar4;
                auVar202._16_4_ = uVar4;
                auVar202._20_4_ = uVar4;
                auVar202._24_4_ = uVar4;
                auVar202._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(auVar450,pauVar402[10],auVar202);
                uVar4 = puVar375[lVar385];
                auVar203._4_4_ = uVar4;
                auVar203._0_4_ = uVar4;
                auVar203._8_4_ = uVar4;
                auVar203._12_4_ = uVar4;
                auVar203._16_4_ = uVar4;
                auVar203._20_4_ = uVar4;
                auVar203._24_4_ = uVar4;
                auVar203._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar451,pauVar402[0xb],auVar203);
                uVar4 = puVar375[lVar530];
                auVar204._4_4_ = uVar4;
                auVar204._0_4_ = uVar4;
                auVar204._8_4_ = uVar4;
                auVar204._12_4_ = uVar4;
                auVar204._16_4_ = uVar4;
                auVar204._20_4_ = uVar4;
                auVar204._24_4_ = uVar4;
                auVar204._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[0xc],auVar204);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar375[lVar378];
                auVar205._4_4_ = uVar4;
                auVar205._0_4_ = uVar4;
                auVar205._8_4_ = uVar4;
                auVar205._12_4_ = uVar4;
                auVar205._16_4_ = uVar4;
                auVar205._20_4_ = uVar4;
                auVar205._24_4_ = uVar4;
                auVar205._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar449,pauVar402[0xd],auVar205);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar375[lVar365];
                auVar206._4_4_ = uVar4;
                auVar206._0_4_ = uVar4;
                auVar206._8_4_ = uVar4;
                auVar206._12_4_ = uVar4;
                auVar206._16_4_ = uVar4;
                auVar206._20_4_ = uVar4;
                auVar206._24_4_ = uVar4;
                auVar206._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar450,pauVar402[0xe],auVar206);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar375[lVar366];
                auVar207._4_4_ = uVar4;
                auVar207._0_4_ = uVar4;
                auVar207._8_4_ = uVar4;
                auVar207._12_4_ = uVar4;
                auVar207._16_4_ = uVar4;
                auVar207._20_4_ = uVar4;
                auVar207._24_4_ = uVar4;
                auVar207._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar451,pauVar402[0xf],auVar207);
                auVar463 = ZEXT3264(auVar448);
                puVar375 = puVar375 + lVar398;
                uVar395 = (ulong)((int)uVar395 - 1);
                pauVar402 = pauVar402 + 0x10;
              }
              pauVar413 = pauVar413 + uVar419 * 0x10;
            }
            uVar401 = uVar401 + 0x10;
            lVar417 = lVar417 + lVar394 * 0x10;
            puVar371 = puVar371 + lVar394 * 4;
          }
          for (; (int)((uint)uVar401 | 7) < local_360; uVar401 = uVar401 + 8) {
            lVar374 = (int)((long)((ulong)(uint)((int)(uint)uVar401 >> 0x1f) << 0x20 |
                                  uVar401 & 0xffffffff) / (long)local_188.elempack) * lVar394;
            if (local_188.elempack == 8) {
              puVar375 = (undefined4 *)((long)local_188.data + lVar374 + (long)iVar410 * 4);
              uVar395 = uVar419;
              pauVar402 = pauVar413;
              while (iVar363 = (int)uVar395, uVar395 = (ulong)(iVar363 - 1), iVar363 != 0) {
                uVar4 = *puVar375;
                auVar448._4_4_ = uVar4;
                auVar448._0_4_ = uVar4;
                auVar448._8_4_ = uVar4;
                auVar448._12_4_ = uVar4;
                auVar448._16_4_ = uVar4;
                auVar448._20_4_ = uVar4;
                auVar448._24_4_ = uVar4;
                auVar448._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar448);
                uVar4 = puVar375[1];
                auVar449._4_4_ = uVar4;
                auVar449._0_4_ = uVar4;
                auVar449._8_4_ = uVar4;
                auVar449._12_4_ = uVar4;
                auVar449._16_4_ = uVar4;
                auVar449._20_4_ = uVar4;
                auVar449._24_4_ = uVar4;
                auVar449._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar449);
                uVar4 = puVar375[2];
                auVar450._4_4_ = uVar4;
                auVar450._0_4_ = uVar4;
                auVar450._8_4_ = uVar4;
                auVar450._12_4_ = uVar4;
                auVar450._16_4_ = uVar4;
                auVar450._20_4_ = uVar4;
                auVar450._24_4_ = uVar4;
                auVar450._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar450);
                uVar4 = puVar375[3];
                auVar451._4_4_ = uVar4;
                auVar451._0_4_ = uVar4;
                auVar451._8_4_ = uVar4;
                auVar451._12_4_ = uVar4;
                auVar451._16_4_ = uVar4;
                auVar451._20_4_ = uVar4;
                auVar451._24_4_ = uVar4;
                auVar451._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar451);
                uVar4 = puVar375[4];
                auVar452._4_4_ = uVar4;
                auVar452._0_4_ = uVar4;
                auVar452._8_4_ = uVar4;
                auVar452._12_4_ = uVar4;
                auVar452._16_4_ = uVar4;
                auVar452._20_4_ = uVar4;
                auVar452._24_4_ = uVar4;
                auVar452._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[4],auVar452);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar375[5];
                auVar453._4_4_ = uVar4;
                auVar453._0_4_ = uVar4;
                auVar453._8_4_ = uVar4;
                auVar453._12_4_ = uVar4;
                auVar453._16_4_ = uVar4;
                auVar453._20_4_ = uVar4;
                auVar453._24_4_ = uVar4;
                auVar453._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar449,pauVar402[5],auVar453);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar375[6];
                auVar519._4_4_ = uVar4;
                auVar519._0_4_ = uVar4;
                auVar519._8_4_ = uVar4;
                auVar519._12_4_ = uVar4;
                auVar519._16_4_ = uVar4;
                auVar519._20_4_ = uVar4;
                auVar519._24_4_ = uVar4;
                auVar519._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar450,pauVar402[6],auVar519);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar375[7];
                auVar208._4_4_ = uVar4;
                auVar208._0_4_ = uVar4;
                auVar208._8_4_ = uVar4;
                auVar208._12_4_ = uVar4;
                auVar208._16_4_ = uVar4;
                auVar208._20_4_ = uVar4;
                auVar208._24_4_ = uVar4;
                auVar208._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar451,pauVar402[7],auVar208);
                auVar463 = ZEXT3264(auVar448);
                pauVar402 = pauVar402 + 8;
                puVar375 = puVar375 + lVar390;
              }
              pauVar413 = pauVar413 + uVar419 * 8;
            }
            else {
              puVar375 = (undefined4 *)((long)local_188.data + lVar374 + (long)iVar404 * 4);
            }
            if (local_188.elempack == 4) {
              puVar408 = puVar375 + 3;
              uVar395 = uVar419;
              pauVar402 = pauVar413;
              while (iVar363 = (int)uVar395, uVar395 = (ulong)(iVar363 - 1), iVar363 != 0) {
                uVar4 = puVar408[-3];
                auVar209._4_4_ = uVar4;
                auVar209._0_4_ = uVar4;
                auVar209._8_4_ = uVar4;
                auVar209._12_4_ = uVar4;
                auVar209._16_4_ = uVar4;
                auVar209._20_4_ = uVar4;
                auVar209._24_4_ = uVar4;
                auVar209._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar209);
                uVar4 = puVar408[-2];
                auVar210._4_4_ = uVar4;
                auVar210._0_4_ = uVar4;
                auVar210._8_4_ = uVar4;
                auVar210._12_4_ = uVar4;
                auVar210._16_4_ = uVar4;
                auVar210._20_4_ = uVar4;
                auVar210._24_4_ = uVar4;
                auVar210._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar210);
                uVar4 = puVar408[-1];
                auVar211._4_4_ = uVar4;
                auVar211._0_4_ = uVar4;
                auVar211._8_4_ = uVar4;
                auVar211._12_4_ = uVar4;
                auVar211._16_4_ = uVar4;
                auVar211._20_4_ = uVar4;
                auVar211._24_4_ = uVar4;
                auVar211._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar211);
                uVar4 = *puVar408;
                auVar212._4_4_ = uVar4;
                auVar212._0_4_ = uVar4;
                auVar212._8_4_ = uVar4;
                auVar212._12_4_ = uVar4;
                auVar212._16_4_ = uVar4;
                auVar212._20_4_ = uVar4;
                auVar212._24_4_ = uVar4;
                auVar212._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar212);
                uVar4 = puVar408[lVar397 + -3];
                auVar213._4_4_ = uVar4;
                auVar213._0_4_ = uVar4;
                auVar213._8_4_ = uVar4;
                auVar213._12_4_ = uVar4;
                auVar213._16_4_ = uVar4;
                auVar213._20_4_ = uVar4;
                auVar213._24_4_ = uVar4;
                auVar213._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[4],auVar213);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar408[lVar397 + -2];
                auVar214._4_4_ = uVar4;
                auVar214._0_4_ = uVar4;
                auVar214._8_4_ = uVar4;
                auVar214._12_4_ = uVar4;
                auVar214._16_4_ = uVar4;
                auVar214._20_4_ = uVar4;
                auVar214._24_4_ = uVar4;
                auVar214._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar449,pauVar402[5],auVar214);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar408[lVar397 + -1];
                auVar215._4_4_ = uVar4;
                auVar215._0_4_ = uVar4;
                auVar215._8_4_ = uVar4;
                auVar215._12_4_ = uVar4;
                auVar215._16_4_ = uVar4;
                auVar215._20_4_ = uVar4;
                auVar215._24_4_ = uVar4;
                auVar215._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar450,pauVar402[6],auVar215);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar408[lVar397];
                auVar216._4_4_ = uVar4;
                auVar216._0_4_ = uVar4;
                auVar216._8_4_ = uVar4;
                auVar216._12_4_ = uVar4;
                auVar216._16_4_ = uVar4;
                auVar216._20_4_ = uVar4;
                auVar216._24_4_ = uVar4;
                auVar216._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar451,pauVar402[7],auVar216);
                auVar463 = ZEXT3264(auVar448);
                pauVar402 = pauVar402 + 8;
                puVar408 = puVar408 + lVar422;
              }
              puVar375 = (undefined4 *)((long)puVar375 + lVar412);
              pauVar413 = pauVar413 + uVar419 * 8;
            }
            uVar395 = uVar419;
            pauVar402 = pauVar413;
            if (local_188.elempack == 1) {
              while ((int)uVar395 != 0) {
                uVar4 = *puVar375;
                auVar217._4_4_ = uVar4;
                auVar217._0_4_ = uVar4;
                auVar217._8_4_ = uVar4;
                auVar217._12_4_ = uVar4;
                auVar217._16_4_ = uVar4;
                auVar217._20_4_ = uVar4;
                auVar217._24_4_ = uVar4;
                auVar217._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar217);
                uVar4 = puVar375[lVar397];
                auVar218._4_4_ = uVar4;
                auVar218._0_4_ = uVar4;
                auVar218._8_4_ = uVar4;
                auVar218._12_4_ = uVar4;
                auVar218._16_4_ = uVar4;
                auVar218._20_4_ = uVar4;
                auVar218._24_4_ = uVar4;
                auVar218._28_4_ = uVar4;
                auVar449 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar218);
                uVar4 = puVar375[lVar391];
                auVar219._4_4_ = uVar4;
                auVar219._0_4_ = uVar4;
                auVar219._8_4_ = uVar4;
                auVar219._12_4_ = uVar4;
                auVar219._16_4_ = uVar4;
                auVar219._20_4_ = uVar4;
                auVar219._24_4_ = uVar4;
                auVar219._28_4_ = uVar4;
                auVar450 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar219);
                uVar4 = puVar375[lVar405];
                auVar220._4_4_ = uVar4;
                auVar220._0_4_ = uVar4;
                auVar220._8_4_ = uVar4;
                auVar220._12_4_ = uVar4;
                auVar220._16_4_ = uVar4;
                auVar220._20_4_ = uVar4;
                auVar220._24_4_ = uVar4;
                auVar220._28_4_ = uVar4;
                auVar451 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar220);
                uVar4 = puVar375[auVar461._16_8_];
                auVar221._4_4_ = uVar4;
                auVar221._0_4_ = uVar4;
                auVar221._8_4_ = uVar4;
                auVar221._12_4_ = uVar4;
                auVar221._16_4_ = uVar4;
                auVar221._20_4_ = uVar4;
                auVar221._24_4_ = uVar4;
                auVar221._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar448,pauVar402[4],auVar221);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar375[lVar420];
                auVar222._4_4_ = uVar4;
                auVar222._0_4_ = uVar4;
                auVar222._8_4_ = uVar4;
                auVar222._12_4_ = uVar4;
                auVar222._16_4_ = uVar4;
                auVar222._20_4_ = uVar4;
                auVar222._24_4_ = uVar4;
                auVar222._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar449,pauVar402[5],auVar222);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar375[lVar528];
                auVar223._4_4_ = uVar4;
                auVar223._0_4_ = uVar4;
                auVar223._8_4_ = uVar4;
                auVar223._12_4_ = uVar4;
                auVar223._16_4_ = uVar4;
                auVar223._20_4_ = uVar4;
                auVar223._24_4_ = uVar4;
                auVar223._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar450,pauVar402[6],auVar223);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar375[lVar9];
                auVar224._4_4_ = uVar4;
                auVar224._0_4_ = uVar4;
                auVar224._8_4_ = uVar4;
                auVar224._12_4_ = uVar4;
                auVar224._16_4_ = uVar4;
                auVar224._20_4_ = uVar4;
                auVar224._24_4_ = uVar4;
                auVar224._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar451,pauVar402[7],auVar224);
                auVar463 = ZEXT3264(auVar448);
                puVar375 = puVar375 + lVar398;
                uVar395 = (ulong)((int)uVar395 - 1);
                pauVar402 = pauVar402 + 8;
              }
              pauVar413 = pauVar413 + uVar419 * 8;
            }
            lVar417 = lVar417 + lVar394 * 8;
            puVar371 = puVar371 + lVar394 * 2;
          }
          for (; (int)((uint)uVar401 | 3) < local_360; uVar401 = uVar401 + 4) {
            lVar374 = (int)((long)((ulong)(uint)((int)(uint)uVar401 >> 0x1f) << 0x20 |
                                  uVar401 & 0xffffffff) / (long)local_188.elempack) * lVar394;
            if (local_188.elempack == 4) {
              puVar375 = (undefined4 *)((long)local_188.data + lVar374 + (long)iVar410 * 4);
              uVar395 = uVar419;
              pauVar402 = pauVar413;
              while (iVar363 = (int)uVar395, uVar395 = (ulong)(iVar363 - 1), iVar363 != 0) {
                uVar4 = *puVar375;
                auVar225._4_4_ = uVar4;
                auVar225._0_4_ = uVar4;
                auVar225._8_4_ = uVar4;
                auVar225._12_4_ = uVar4;
                auVar225._16_4_ = uVar4;
                auVar225._20_4_ = uVar4;
                auVar225._24_4_ = uVar4;
                auVar225._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar225);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar375[1];
                auVar226._4_4_ = uVar4;
                auVar226._0_4_ = uVar4;
                auVar226._8_4_ = uVar4;
                auVar226._12_4_ = uVar4;
                auVar226._16_4_ = uVar4;
                auVar226._20_4_ = uVar4;
                auVar226._24_4_ = uVar4;
                auVar226._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar226);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar375[2];
                auVar227._4_4_ = uVar4;
                auVar227._0_4_ = uVar4;
                auVar227._8_4_ = uVar4;
                auVar227._12_4_ = uVar4;
                auVar227._16_4_ = uVar4;
                auVar227._20_4_ = uVar4;
                auVar227._24_4_ = uVar4;
                auVar227._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar227);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar375[3];
                auVar228._4_4_ = uVar4;
                auVar228._0_4_ = uVar4;
                auVar228._8_4_ = uVar4;
                auVar228._12_4_ = uVar4;
                auVar228._16_4_ = uVar4;
                auVar228._20_4_ = uVar4;
                auVar228._24_4_ = uVar4;
                auVar228._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar228);
                auVar463 = ZEXT3264(auVar448);
                pauVar402 = pauVar402 + 4;
                puVar375 = puVar375 + lVar422;
              }
              pauVar413 = pauVar413 + uVar419 * 4;
            }
            else {
              puVar375 = (undefined4 *)((long)local_188.data + lVar374 + (long)iVar404 * 4);
            }
            uVar395 = uVar419;
            pauVar402 = pauVar413;
            if (local_188.elempack == 1) {
              while ((int)uVar395 != 0) {
                uVar4 = *puVar375;
                auVar229._4_4_ = uVar4;
                auVar229._0_4_ = uVar4;
                auVar229._8_4_ = uVar4;
                auVar229._12_4_ = uVar4;
                auVar229._16_4_ = uVar4;
                auVar229._20_4_ = uVar4;
                auVar229._24_4_ = uVar4;
                auVar229._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar229);
                auVar464 = ZEXT3264(auVar448);
                uVar4 = puVar375[lVar397];
                auVar230._4_4_ = uVar4;
                auVar230._0_4_ = uVar4;
                auVar230._8_4_ = uVar4;
                auVar230._12_4_ = uVar4;
                auVar230._16_4_ = uVar4;
                auVar230._20_4_ = uVar4;
                auVar230._24_4_ = uVar4;
                auVar230._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar230);
                in_ZMM17 = (float  [16])ZEXT3264(auVar448);
                uVar4 = puVar375[lVar391];
                auVar231._4_4_ = uVar4;
                auVar231._0_4_ = uVar4;
                auVar231._8_4_ = uVar4;
                auVar231._12_4_ = uVar4;
                auVar231._16_4_ = uVar4;
                auVar231._20_4_ = uVar4;
                auVar231._24_4_ = uVar4;
                auVar231._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,pauVar402[2],auVar231);
                in_ZMM16 = ZEXT3264(auVar448);
                uVar4 = puVar375[lVar405];
                auVar232._4_4_ = uVar4;
                auVar232._0_4_ = uVar4;
                auVar232._8_4_ = uVar4;
                auVar232._12_4_ = uVar4;
                auVar232._16_4_ = uVar4;
                auVar232._20_4_ = uVar4;
                auVar232._24_4_ = uVar4;
                auVar232._28_4_ = uVar4;
                auVar448 = vfmadd231ps_avx512vl(auVar463._0_32_,pauVar402[3],auVar232);
                auVar463 = ZEXT3264(auVar448);
                puVar375 = puVar375 + lVar398;
                uVar395 = (ulong)((int)uVar395 - 1);
                pauVar402 = pauVar402 + 4;
              }
              pauVar413 = pauVar413 + uVar419 * 4;
            }
            lVar417 = lVar417 + lVar394 * 4;
            puVar371 = puVar371 + lVar394;
          }
          for (; (long)(uVar401 | 1) < lVar370; uVar401 = uVar401 + 2) {
            lVar374 = 0;
            uVar395 = uVar419;
            pauVar402 = pauVar413;
            while (iVar404 = (int)uVar395, uVar395 = (ulong)(iVar404 - 1), iVar404 != 0) {
              uVar4 = *(undefined4 *)((long)puVar371 + lVar374);
              auVar233._4_4_ = uVar4;
              auVar233._0_4_ = uVar4;
              auVar233._8_4_ = uVar4;
              auVar233._12_4_ = uVar4;
              auVar233._16_4_ = uVar4;
              auVar233._20_4_ = uVar4;
              auVar233._24_4_ = uVar4;
              auVar233._28_4_ = uVar4;
              auVar448 = vfmadd231ps_avx512vl(auVar464._0_32_,*pauVar402,auVar233);
              auVar464 = ZEXT3264(auVar448);
              uVar4 = *(undefined4 *)(lVar417 + lVar374);
              auVar234._4_4_ = uVar4;
              auVar234._0_4_ = uVar4;
              auVar234._8_4_ = uVar4;
              auVar234._12_4_ = uVar4;
              auVar234._16_4_ = uVar4;
              auVar234._20_4_ = uVar4;
              auVar234._24_4_ = uVar4;
              auVar234._28_4_ = uVar4;
              auVar448 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,pauVar402[1],auVar234);
              in_ZMM17 = (float  [16])ZEXT3264(auVar448);
              pauVar402 = pauVar402 + 2;
              lVar374 = lVar374 + lVar399;
            }
            pauVar413 = pauVar413 + uVar419 * 2;
            lVar417 = lVar417 + lVar394 * 2;
            puVar371 = (undefined4 *)((long)puVar371 + lVar394 * 2);
          }
          for (; puVar375 = puVar371, uVar395 = uVar419, pauVar402 = pauVar413,
              (long)uVar401 < lVar370; uVar401 = uVar401 + 1) {
            while ((int)uVar395 != 0) {
              uVar4 = *puVar375;
              auVar503._4_4_ = uVar4;
              auVar503._0_4_ = uVar4;
              auVar503._8_4_ = uVar4;
              auVar503._12_4_ = uVar4;
              auVar503._16_4_ = uVar4;
              auVar503._20_4_ = uVar4;
              auVar503._24_4_ = uVar4;
              auVar503._28_4_ = uVar4;
              auVar431 = vfmadd231ps_fma(auVar464._0_32_,auVar503,*pauVar402);
              auVar464 = ZEXT1664(auVar431);
              puVar375 = puVar375 + lVar398;
              uVar395 = (ulong)((int)uVar395 - 1);
              pauVar402 = pauVar402 + 1;
            }
            pauVar413 = pauVar413 + uVar419;
            puVar371 = (undefined4 *)((long)puVar371 + lVar394);
          }
          auVar448 = vaddps_avx512vl(in_ZMM16._0_32_,auVar463._0_32_);
          auVar449 = vaddps_avx512vl(in_ZMM17._0_32_,auVar464._0_32_);
          auVar491._0_4_ = auVar448._0_4_ + auVar449._0_4_;
          auVar491._4_4_ = auVar448._4_4_ + auVar449._4_4_;
          auVar491._8_4_ = auVar448._8_4_ + auVar449._8_4_;
          auVar491._12_4_ = auVar448._12_4_ + auVar449._12_4_;
          auVar491._16_4_ = auVar448._16_4_ + auVar449._16_4_;
          auVar491._20_4_ = auVar448._20_4_ + auVar449._20_4_;
          auVar491._24_4_ = auVar448._24_4_ + auVar449._24_4_;
          auVar491._28_4_ = auVar448._28_4_ + auVar449._28_4_;
          auVar459 = auVar491;
          if (iVar424 - 1U < 6) {
            auVar448 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar459 = vmaxps_avx(auVar491,auVar448);
            switch(iVar424) {
            case 2:
              auVar448 = vminps_avx(auVar491,auVar448);
              uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar254._4_4_ = uVar4;
              auVar254._0_4_ = uVar4;
              auVar254._8_4_ = uVar4;
              auVar254._12_4_ = uVar4;
              auVar254._16_4_ = uVar4;
              auVar254._20_4_ = uVar4;
              auVar254._24_4_ = uVar4;
              auVar254._28_4_ = uVar4;
              auVar459 = vfmadd231ps_avx512vl(auVar459,auVar448,auVar254);
              break;
            case 3:
              uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar252._4_4_ = uVar4;
              auVar252._0_4_ = uVar4;
              auVar252._8_4_ = uVar4;
              auVar252._12_4_ = uVar4;
              auVar252._16_4_ = uVar4;
              auVar252._20_4_ = uVar4;
              auVar252._24_4_ = uVar4;
              auVar252._28_4_ = uVar4;
              auVar448 = vmaxps_avx512vl(auVar491,auVar252);
              uVar4 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
              auVar253._4_4_ = uVar4;
              auVar253._0_4_ = uVar4;
              auVar253._8_4_ = uVar4;
              auVar253._12_4_ = uVar4;
              auVar253._16_4_ = uVar4;
              auVar253._20_4_ = uVar4;
              auVar253._24_4_ = uVar4;
              auVar253._28_4_ = uVar4;
              auVar459 = vminps_avx512vl(auVar448,auVar253);
              break;
            case 4:
              auVar248._8_4_ = 0x80000000;
              auVar248._0_8_ = 0x8000000080000000;
              auVar248._12_4_ = 0x80000000;
              auVar248._16_4_ = 0x80000000;
              auVar248._20_4_ = 0x80000000;
              auVar248._24_4_ = 0x80000000;
              auVar248._28_4_ = 0x80000000;
              auVar448 = vxorps_avx512vl(auVar491,auVar248);
              auVar249._8_4_ = 0x42b0c0a5;
              auVar249._0_8_ = 0x42b0c0a542b0c0a5;
              auVar249._12_4_ = 0x42b0c0a5;
              auVar249._16_4_ = 0x42b0c0a5;
              auVar249._20_4_ = 0x42b0c0a5;
              auVar249._24_4_ = 0x42b0c0a5;
              auVar249._28_4_ = 0x42b0c0a5;
              auVar448 = vminps_avx512vl(auVar448,auVar249);
              auVar250._8_4_ = 0xc2b0c0a5;
              auVar250._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar250._12_4_ = 0xc2b0c0a5;
              auVar250._16_4_ = 0xc2b0c0a5;
              auVar250._20_4_ = 0xc2b0c0a5;
              auVar250._24_4_ = 0xc2b0c0a5;
              auVar250._28_4_ = 0xc2b0c0a5;
              auVar449 = vmaxps_avx512vl(auVar448,auVar250);
              auVar431 = vfmadd231ps_fma(auVar447,auVar449,auVar446);
              auVar448 = vroundps_avx(ZEXT1632(auVar431),1);
              uVar401 = vcmpps_avx512vl(ZEXT1632(auVar431),auVar448,1);
              auVar450 = vsubps_avx512vl(auVar448,auVar538);
              bVar18 = (bool)((byte)uVar401 & 1);
              auVar460._0_4_ =
                   (float)((uint)bVar18 * auVar450._0_4_ | (uint)!bVar18 * auVar448._0_4_);
              bVar18 = (bool)((byte)(uVar401 >> 1) & 1);
              auVar460._4_4_ =
                   (float)((uint)bVar18 * auVar450._4_4_ | (uint)!bVar18 * auVar448._4_4_);
              bVar18 = (bool)((byte)(uVar401 >> 2) & 1);
              auVar460._8_4_ =
                   (float)((uint)bVar18 * auVar450._8_4_ | (uint)!bVar18 * auVar448._8_4_);
              bVar18 = (bool)((byte)(uVar401 >> 3) & 1);
              auVar460._12_4_ =
                   (float)((uint)bVar18 * auVar450._12_4_ | (uint)!bVar18 * auVar448._12_4_);
              bVar18 = (bool)((byte)(uVar401 >> 4) & 1);
              auVar460._16_4_ =
                   (float)((uint)bVar18 * auVar450._16_4_ | (uint)!bVar18 * auVar448._16_4_);
              bVar18 = (bool)((byte)(uVar401 >> 5) & 1);
              auVar460._20_4_ =
                   (float)((uint)bVar18 * auVar450._20_4_ | (uint)!bVar18 * auVar448._20_4_);
              bVar18 = (bool)((byte)(uVar401 >> 6) & 1);
              auVar460._24_4_ =
                   (float)((uint)bVar18 * auVar450._24_4_ | (uint)!bVar18 * auVar448._24_4_);
              bVar18 = SUB81(uVar401 >> 7,0);
              auVar460._28_4_ =
                   (float)((uint)bVar18 * auVar450._28_4_ | (uint)!bVar18 * auVar448._28_4_);
              auVar431 = vfmsub231ps_fma(auVar449,auVar460,auVar541);
              auVar251._8_4_ = 0x395e8083;
              auVar251._0_8_ = 0x395e8083395e8083;
              auVar251._12_4_ = 0x395e8083;
              auVar251._16_4_ = 0x395e8083;
              auVar251._20_4_ = 0x395e8083;
              auVar251._24_4_ = 0x395e8083;
              auVar251._28_4_ = 0x395e8083;
              auVar448 = vfmsub231ps_avx512vl(ZEXT1632(auVar431),auVar460,auVar251);
              auVar504._0_4_ = auVar448._0_4_ * auVar448._0_4_;
              auVar504._4_4_ = auVar448._4_4_ * auVar448._4_4_;
              auVar504._8_4_ = auVar448._8_4_ * auVar448._8_4_;
              auVar504._12_4_ = auVar448._12_4_ * auVar448._12_4_;
              auVar504._16_4_ = auVar448._16_4_ * auVar448._16_4_;
              auVar504._20_4_ = auVar448._20_4_ * auVar448._20_4_;
              auVar504._24_4_ = auVar448._24_4_ * auVar448._24_4_;
              auVar504._28_4_ = 0;
              auVar431 = vfmadd213ps_fma(auVar546,auVar448,auVar548);
              auVar431 = vfmadd213ps_fma(ZEXT1632(auVar431),auVar448,auVar554);
              auVar431 = vfmadd213ps_fma(ZEXT1632(auVar431),auVar448,auVar560);
              auVar431 = vfmadd213ps_fma(ZEXT1632(auVar431),auVar448,auVar562);
              auVar431 = vfmadd213ps_fma(ZEXT1632(auVar431),auVar448,auVar447);
              auVar431 = vfmadd213ps_fma(ZEXT1632(auVar431),auVar504,auVar448);
              auVar492._0_4_ = auVar431._0_4_ + 1.0;
              auVar492._4_4_ = auVar431._4_4_ + 1.0;
              auVar492._8_4_ = auVar431._8_4_ + 1.0;
              auVar492._12_4_ = auVar431._12_4_ + 1.0;
              auVar492._16_4_ = 0x3f800000;
              auVar492._20_4_ = 0x3f800000;
              auVar492._24_4_ = 0x3f800000;
              auVar492._28_4_ = 0x3f800000;
              auVar505._0_4_ = (int)auVar460._0_4_;
              auVar505._4_4_ = (int)auVar460._4_4_;
              auVar505._8_4_ = (int)auVar460._8_4_;
              auVar505._12_4_ = (int)auVar460._12_4_;
              auVar505._16_4_ = (int)auVar460._16_4_;
              auVar505._20_4_ = (int)auVar460._20_4_;
              auVar505._24_4_ = (int)auVar460._24_4_;
              auVar505._28_4_ = (int)auVar460._28_4_;
              auVar448 = vpslld_avx2(auVar505,0x17);
              auVar448 = vpaddd_avx2(auVar564,auVar448);
              auVar431 = vfmadd213ps_fma(auVar448,auVar492,auVar538);
              auVar448 = vrcpps_avx(ZEXT1632(auVar431));
              auVar431 = vfmsub213ps_fma(ZEXT1632(auVar431),auVar448,auVar538);
              auVar431 = vfnmadd132ps_fma(ZEXT1632(auVar431),auVar448,auVar448);
              auVar459 = ZEXT1632(auVar431);
              break;
            case 5:
              auVar450 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
              auVar449 = vminps_avx512vl(auVar491,auVar450);
              auVar451 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
              auVar452 = vmaxps_avx512vl(auVar449,auVar451);
              auVar431 = vfmadd213ps_fma(auVar446,auVar452,auVar447);
              auVar449 = vroundps_avx(ZEXT1632(auVar431),1);
              uVar401 = vcmpps_avx512vl(ZEXT1632(auVar431),auVar449,1);
              auVar453 = vsubps_avx512vl(auVar449,auVar538);
              bVar18 = (bool)((byte)uVar401 & 1);
              auVar454._0_4_ =
                   (float)((uint)bVar18 * auVar453._0_4_ | (uint)!bVar18 * auVar449._0_4_);
              bVar18 = (bool)((byte)(uVar401 >> 1) & 1);
              auVar454._4_4_ =
                   (float)((uint)bVar18 * auVar453._4_4_ | (uint)!bVar18 * auVar449._4_4_);
              bVar18 = (bool)((byte)(uVar401 >> 2) & 1);
              auVar454._8_4_ =
                   (float)((uint)bVar18 * auVar453._8_4_ | (uint)!bVar18 * auVar449._8_4_);
              bVar18 = (bool)((byte)(uVar401 >> 3) & 1);
              auVar454._12_4_ =
                   (float)((uint)bVar18 * auVar453._12_4_ | (uint)!bVar18 * auVar449._12_4_);
              bVar18 = (bool)((byte)(uVar401 >> 4) & 1);
              auVar454._16_4_ =
                   (float)((uint)bVar18 * auVar453._16_4_ | (uint)!bVar18 * auVar449._16_4_);
              bVar18 = (bool)((byte)(uVar401 >> 5) & 1);
              auVar454._20_4_ =
                   (float)((uint)bVar18 * auVar453._20_4_ | (uint)!bVar18 * auVar449._20_4_);
              bVar18 = (bool)((byte)(uVar401 >> 6) & 1);
              auVar454._24_4_ =
                   (float)((uint)bVar18 * auVar453._24_4_ | (uint)!bVar18 * auVar449._24_4_);
              bVar18 = SUB81(uVar401 >> 7,0);
              auVar454._28_4_ =
                   (float)((uint)bVar18 * auVar453._28_4_ | (uint)!bVar18 * auVar449._28_4_);
              auVar431 = vfmsub231ps_fma(auVar452,auVar454,auVar541);
              auVar431 = vfnmsub231ps_fma(ZEXT1632(auVar431),auVar454,auVar566);
              auVar452 = ZEXT1632(auVar431);
              auVar449 = vfmadd213ps_avx512vl(auVar546,auVar452,auVar548);
              auVar449 = vfmadd213ps_avx512vl(auVar449,auVar452,auVar554);
              auVar449 = vfmadd213ps_avx512vl(auVar449,auVar452,auVar560);
              auVar452 = ZEXT1632(auVar431);
              auVar449 = vfmadd213ps_avx512vl(auVar449,auVar452,auVar562);
              auVar449 = vfmadd213ps_avx512vl(auVar449,auVar452,auVar447);
              auVar449 = vfmadd213ps_avx512vl
                                   (auVar449,ZEXT1632(CONCAT412(auVar431._12_4_ * auVar431._12_4_,
                                                                CONCAT48(auVar431._8_4_ *
                                                                         auVar431._8_4_,
                                                                         CONCAT44(auVar431._4_4_ *
                                                                                  auVar431._4_4_,
                                                                                  auVar431._0_4_ *
                                                                                  auVar431._0_4_))))
                                    ,auVar452);
              auVar452 = vaddps_avx512vl(auVar449,auVar538);
              auVar518._0_4_ = (int)auVar454._0_4_;
              auVar518._4_4_ = (int)auVar454._4_4_;
              auVar518._8_4_ = (int)auVar454._8_4_;
              auVar518._12_4_ = (int)auVar454._12_4_;
              auVar518._16_4_ = (int)auVar454._16_4_;
              auVar518._20_4_ = (int)auVar454._20_4_;
              auVar518._24_4_ = (int)auVar454._24_4_;
              auVar518._28_4_ = (int)auVar454._28_4_;
              auVar449 = vpslld_avx2(auVar518,0x17);
              auVar449 = vpaddd_avx2(auVar564,auVar449);
              auVar431 = vfmadd213ps_fma(auVar449,auVar452,auVar538);
              uVar401 = vcmpps_avx512vl(ZEXT1632(auVar431),auVar448,2);
              auVar236._8_4_ = 0x800000;
              auVar236._0_8_ = 0x80000000800000;
              auVar236._12_4_ = 0x800000;
              auVar236._16_4_ = 0x800000;
              auVar236._20_4_ = 0x800000;
              auVar236._24_4_ = 0x800000;
              auVar236._28_4_ = 0x800000;
              auVar448 = vmaxps_avx512vl(ZEXT1632(auVar431),auVar236);
              auVar519 = vpsrld_avx2(auVar448,0x17);
              auVar544._8_4_ = 0x807fffff;
              auVar544._0_8_ = 0x807fffff807fffff;
              auVar544._12_4_ = 0x807fffff;
              auVar544._16_4_ = 0x807fffff;
              auVar544._20_4_ = 0x807fffff;
              auVar544._24_4_ = 0x807fffff;
              auVar544._28_4_ = 0x807fffff;
              auVar237._8_4_ = 0x3f000000;
              auVar237._0_8_ = 0x3f0000003f000000;
              auVar237._12_4_ = 0x3f000000;
              auVar237._16_4_ = 0x3f000000;
              auVar237._20_4_ = 0x3f000000;
              auVar237._24_4_ = 0x3f000000;
              auVar237._28_4_ = 0x3f000000;
              auVar448 = vpternlogd_avx512vl(auVar448,auVar544,auVar237,0xea);
              auVar238._8_4_ = 0x3f3504f3;
              auVar238._0_8_ = 0x3f3504f33f3504f3;
              auVar238._12_4_ = 0x3f3504f3;
              auVar238._16_4_ = 0x3f3504f3;
              auVar238._20_4_ = 0x3f3504f3;
              auVar238._24_4_ = 0x3f3504f3;
              auVar238._28_4_ = 0x3f3504f3;
              uVar395 = vcmpps_avx512vl(auVar448,auVar238,1);
              auVar449 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
              auVar452 = vaddps_avx512vl(auVar448,auVar449);
              auVar453 = vaddps_avx512vl(auVar452,auVar448);
              bVar18 = (bool)((byte)uVar395 & 1);
              auVar455._0_4_ =
                   (float)((uint)bVar18 * auVar453._0_4_ | (uint)!bVar18 * auVar452._0_4_);
              bVar18 = (bool)((byte)(uVar395 >> 1) & 1);
              auVar455._4_4_ =
                   (float)((uint)bVar18 * auVar453._4_4_ | (uint)!bVar18 * auVar452._4_4_);
              bVar18 = (bool)((byte)(uVar395 >> 2) & 1);
              auVar455._8_4_ =
                   (float)((uint)bVar18 * auVar453._8_4_ | (uint)!bVar18 * auVar452._8_4_);
              bVar18 = (bool)((byte)(uVar395 >> 3) & 1);
              auVar455._12_4_ =
                   (float)((uint)bVar18 * auVar453._12_4_ | (uint)!bVar18 * auVar452._12_4_);
              bVar18 = (bool)((byte)(uVar395 >> 4) & 1);
              auVar455._16_4_ =
                   (float)((uint)bVar18 * auVar453._16_4_ | (uint)!bVar18 * auVar452._16_4_);
              bVar18 = (bool)((byte)(uVar395 >> 5) & 1);
              auVar455._20_4_ =
                   (float)((uint)bVar18 * auVar453._20_4_ | (uint)!bVar18 * auVar452._20_4_);
              bVar18 = (bool)((byte)(uVar395 >> 6) & 1);
              auVar455._24_4_ =
                   (float)((uint)bVar18 * auVar453._24_4_ | (uint)!bVar18 * auVar452._24_4_);
              bVar18 = SUB81(uVar395 >> 7,0);
              auVar455._28_4_ = (uint)bVar18 * auVar453._28_4_ | (uint)!bVar18 * auVar452._28_4_;
              auVar351._4_4_ = auVar455._4_4_ * auVar455._4_4_;
              auVar351._0_4_ = auVar455._0_4_ * auVar455._0_4_;
              auVar351._8_4_ = auVar455._8_4_ * auVar455._8_4_;
              auVar351._12_4_ = auVar455._12_4_ * auVar455._12_4_;
              auVar351._16_4_ = auVar455._16_4_ * auVar455._16_4_;
              auVar351._20_4_ = auVar455._20_4_ * auVar455._20_4_;
              auVar351._24_4_ = auVar455._24_4_ * auVar455._24_4_;
              auVar351._28_4_ = auVar448._28_4_;
              auVar448 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
              auVar239._8_4_ = 0xbdebd1b8;
              auVar239._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar239._12_4_ = 0xbdebd1b8;
              auVar239._16_4_ = 0xbdebd1b8;
              auVar239._20_4_ = 0xbdebd1b8;
              auVar239._24_4_ = 0xbdebd1b8;
              auVar239._28_4_ = 0xbdebd1b8;
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar455,auVar239);
              auVar240._8_4_ = 0x3def251a;
              auVar240._0_8_ = 0x3def251a3def251a;
              auVar240._12_4_ = 0x3def251a;
              auVar240._16_4_ = 0x3def251a;
              auVar240._20_4_ = 0x3def251a;
              auVar240._24_4_ = 0x3def251a;
              auVar240._28_4_ = 0x3def251a;
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar455,auVar240);
              auVar241._8_4_ = 0xbdfe5d4f;
              auVar241._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar241._12_4_ = 0xbdfe5d4f;
              auVar241._16_4_ = 0xbdfe5d4f;
              auVar241._20_4_ = 0xbdfe5d4f;
              auVar241._24_4_ = 0xbdfe5d4f;
              auVar241._28_4_ = 0xbdfe5d4f;
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar455,auVar241);
              auVar242._8_4_ = 0x3e11e9bf;
              auVar242._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar242._12_4_ = 0x3e11e9bf;
              auVar242._16_4_ = 0x3e11e9bf;
              auVar242._20_4_ = 0x3e11e9bf;
              auVar242._24_4_ = 0x3e11e9bf;
              auVar242._28_4_ = 0x3e11e9bf;
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar455,auVar242);
              auVar243._8_4_ = 0xbe2aae50;
              auVar243._0_8_ = 0xbe2aae50be2aae50;
              auVar243._12_4_ = 0xbe2aae50;
              auVar243._16_4_ = 0xbe2aae50;
              auVar243._20_4_ = 0xbe2aae50;
              auVar243._24_4_ = 0xbe2aae50;
              auVar243._28_4_ = 0xbe2aae50;
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar455,auVar243);
              auVar244._8_4_ = 0x3e4cceac;
              auVar244._0_8_ = 0x3e4cceac3e4cceac;
              auVar244._12_4_ = 0x3e4cceac;
              auVar244._16_4_ = 0x3e4cceac;
              auVar244._20_4_ = 0x3e4cceac;
              auVar244._24_4_ = 0x3e4cceac;
              auVar244._28_4_ = 0x3e4cceac;
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar455,auVar244);
              auVar245._8_4_ = 0xbe7ffffc;
              auVar245._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar245._12_4_ = 0xbe7ffffc;
              auVar245._16_4_ = 0xbe7ffffc;
              auVar245._20_4_ = 0xbe7ffffc;
              auVar245._24_4_ = 0xbe7ffffc;
              auVar245._28_4_ = 0xbe7ffffc;
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar455,auVar245);
              auVar246._8_4_ = 0x3eaaaaaa;
              auVar246._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar246._12_4_ = 0x3eaaaaaa;
              auVar246._16_4_ = 0x3eaaaaaa;
              auVar246._20_4_ = 0x3eaaaaaa;
              auVar246._24_4_ = 0x3eaaaaaa;
              auVar246._28_4_ = 0x3eaaaaaa;
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar455,auVar246);
              auVar452 = vmulps_avx512vl(auVar351,auVar455);
              auVar452 = vmulps_avx512vl(auVar452,auVar448);
              auVar247._8_4_ = 0xffffff82;
              auVar247._0_8_ = 0xffffff82ffffff82;
              auVar247._12_4_ = 0xffffff82;
              auVar247._16_4_ = 0xffffff82;
              auVar247._20_4_ = 0xffffff82;
              auVar247._24_4_ = 0xffffff82;
              auVar247._28_4_ = 0xffffff82;
              auVar448 = vpaddd_avx512vl(auVar519,auVar247);
              auVar448 = vcvtdq2ps_avx(auVar448);
              auVar453 = vsubps_avx512vl(auVar448,auVar538);
              bVar18 = (bool)((byte)uVar395 & 1);
              auVar456._0_4_ = (uint)bVar18 * auVar453._0_4_ | (uint)!bVar18 * auVar448._0_4_;
              bVar18 = (bool)((byte)(uVar395 >> 1) & 1);
              auVar456._4_4_ = (uint)bVar18 * auVar453._4_4_ | (uint)!bVar18 * auVar448._4_4_;
              bVar18 = (bool)((byte)(uVar395 >> 2) & 1);
              auVar456._8_4_ = (uint)bVar18 * auVar453._8_4_ | (uint)!bVar18 * auVar448._8_4_;
              bVar18 = (bool)((byte)(uVar395 >> 3) & 1);
              auVar456._12_4_ = (uint)bVar18 * auVar453._12_4_ | (uint)!bVar18 * auVar448._12_4_;
              bVar18 = (bool)((byte)(uVar395 >> 4) & 1);
              auVar456._16_4_ = (uint)bVar18 * auVar453._16_4_ | (uint)!bVar18 * auVar448._16_4_;
              bVar18 = (bool)((byte)(uVar395 >> 5) & 1);
              auVar456._20_4_ = (uint)bVar18 * auVar453._20_4_ | (uint)!bVar18 * auVar448._20_4_;
              bVar18 = (bool)((byte)(uVar395 >> 6) & 1);
              auVar456._24_4_ = (uint)bVar18 * auVar453._24_4_ | (uint)!bVar18 * auVar448._24_4_;
              bVar18 = SUB81(uVar395 >> 7,0);
              auVar456._28_4_ = (uint)bVar18 * auVar453._28_4_ | (uint)!bVar18 * auVar448._28_4_;
              auVar448 = vfmadd231ps_avx512vl(auVar452,auVar456,auVar566);
              auVar448 = vfmsub231ps_avx512vl(auVar448,auVar447,auVar351);
              auVar448 = vsubps_avx512vl(auVar448,auVar455);
              auVar431 = vfmsub231ps_fma(auVar448,auVar541,auVar456);
              auVar452 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
              in_ZMM17 = (float  [16])ZEXT3264(auVar452);
              auVar448 = vmulps_avx512vl(ZEXT1632(auVar431),auVar452);
              auVar453 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar18 = (bool)((byte)uVar401 & 1);
              auVar457._0_4_ = (uint)bVar18 * auVar453._0_4_ | (uint)!bVar18 * auVar448._0_4_;
              bVar18 = (bool)((byte)(uVar401 >> 1) & 1);
              auVar457._4_4_ = (uint)bVar18 * auVar453._4_4_ | (uint)!bVar18 * auVar448._4_4_;
              bVar18 = (bool)((byte)(uVar401 >> 2) & 1);
              auVar457._8_4_ = (uint)bVar18 * auVar453._8_4_ | (uint)!bVar18 * auVar448._8_4_;
              bVar18 = (bool)((byte)(uVar401 >> 3) & 1);
              auVar457._12_4_ = (uint)bVar18 * auVar453._12_4_ | (uint)!bVar18 * auVar448._12_4_;
              bVar18 = (bool)((byte)(uVar401 >> 4) & 1);
              auVar457._16_4_ = (uint)bVar18 * auVar453._16_4_ | (uint)!bVar18 * auVar448._16_4_;
              bVar18 = (bool)((byte)(uVar401 >> 5) & 1);
              auVar457._20_4_ = (uint)bVar18 * auVar453._20_4_ | (uint)!bVar18 * auVar448._20_4_;
              bVar18 = (bool)((byte)(uVar401 >> 6) & 1);
              auVar457._24_4_ = (uint)bVar18 * auVar453._24_4_ | (uint)!bVar18 * auVar448._24_4_;
              bVar18 = SUB81(uVar401 >> 7,0);
              auVar457._28_4_ = (uint)bVar18 * auVar453._28_4_ | (uint)!bVar18 * auVar448._28_4_;
              auVar448 = vminps_avx512vl(auVar457,auVar450);
              auVar450 = vmaxps_avx512vl(auVar448,auVar451);
              auVar431 = vfmadd213ps_fma(auVar446,auVar450,auVar447);
              auVar448 = vroundps_avx(ZEXT1632(auVar431),1);
              uVar401 = vcmpps_avx512vl(ZEXT1632(auVar431),auVar448,1);
              auVar451 = vsubps_avx512vl(auVar448,auVar538);
              bVar18 = (bool)((byte)uVar401 & 1);
              auVar458._0_4_ =
                   (float)((uint)bVar18 * auVar451._0_4_ | (uint)!bVar18 * auVar448._0_4_);
              bVar18 = (bool)((byte)(uVar401 >> 1) & 1);
              auVar458._4_4_ =
                   (float)((uint)bVar18 * auVar451._4_4_ | (uint)!bVar18 * auVar448._4_4_);
              bVar18 = (bool)((byte)(uVar401 >> 2) & 1);
              auVar458._8_4_ =
                   (float)((uint)bVar18 * auVar451._8_4_ | (uint)!bVar18 * auVar448._8_4_);
              bVar18 = (bool)((byte)(uVar401 >> 3) & 1);
              auVar458._12_4_ =
                   (float)((uint)bVar18 * auVar451._12_4_ | (uint)!bVar18 * auVar448._12_4_);
              bVar18 = (bool)((byte)(uVar401 >> 4) & 1);
              auVar458._16_4_ =
                   (float)((uint)bVar18 * auVar451._16_4_ | (uint)!bVar18 * auVar448._16_4_);
              bVar18 = (bool)((byte)(uVar401 >> 5) & 1);
              auVar458._20_4_ =
                   (float)((uint)bVar18 * auVar451._20_4_ | (uint)!bVar18 * auVar448._20_4_);
              bVar18 = (bool)((byte)(uVar401 >> 6) & 1);
              auVar458._24_4_ =
                   (float)((uint)bVar18 * auVar451._24_4_ | (uint)!bVar18 * auVar448._24_4_);
              bVar18 = SUB81(uVar401 >> 7,0);
              auVar458._28_4_ =
                   (float)((uint)bVar18 * auVar451._28_4_ | (uint)!bVar18 * auVar448._28_4_);
              auVar431 = vfmsub231ps_fma(auVar450,auVar458,auVar541);
              auVar431 = vfnmsub231ps_fma(ZEXT1632(auVar431),auVar458,auVar566);
              auVar450 = ZEXT1632(auVar431);
              auVar448 = vfmadd213ps_avx512vl(auVar546,auVar450,auVar548);
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar450,auVar554);
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar450,auVar560);
              auVar450 = ZEXT1632(auVar431);
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar450,auVar562);
              auVar448 = vfmadd213ps_avx512vl(auVar448,auVar450,auVar447);
              auVar448 = vfmadd213ps_avx512vl
                                   (auVar448,ZEXT1632(CONCAT412(auVar431._12_4_ * auVar431._12_4_,
                                                                CONCAT48(auVar431._8_4_ *
                                                                         auVar431._8_4_,
                                                                         CONCAT44(auVar431._4_4_ *
                                                                                  auVar431._4_4_,
                                                                                  auVar431._0_4_ *
                                                                                  auVar431._0_4_))))
                                    ,auVar450);
              in_ZMM16 = ZEXT3264(auVar448);
              auVar450 = vaddps_avx512vl(auVar448,auVar538);
              auVar520._0_4_ = (int)auVar458._0_4_;
              auVar520._4_4_ = (int)auVar458._4_4_;
              auVar520._8_4_ = (int)auVar458._8_4_;
              auVar520._12_4_ = (int)auVar458._12_4_;
              auVar520._16_4_ = (int)auVar458._16_4_;
              auVar520._20_4_ = (int)auVar458._20_4_;
              auVar520._24_4_ = (int)auVar458._24_4_;
              auVar520._28_4_ = (int)auVar458._28_4_;
              auVar448 = vpslld_avx2(auVar520,0x17);
              auVar448 = vpaddd_avx2(auVar564,auVar448);
              auVar431 = vfmadd213ps_fma(auVar448,auVar450,auVar538);
              auVar448 = vrcpps_avx(ZEXT1632(auVar431));
              auVar431 = vfmsub213ps_fma(ZEXT1632(auVar431),auVar448,auVar538);
              auVar431 = vfnmadd132ps_fma(ZEXT1632(auVar431),auVar448,auVar448);
              auVar448 = vfnmadd213ps_avx512vl(ZEXT1632(auVar431),auVar452,auVar449);
              auVar459._4_4_ = auVar448._4_4_ * auVar491._4_4_;
              auVar459._0_4_ = auVar448._0_4_ * auVar491._0_4_;
              auVar459._8_4_ = auVar448._8_4_ * auVar491._8_4_;
              auVar459._12_4_ = auVar448._12_4_ * auVar491._12_4_;
              auVar459._16_4_ = auVar448._16_4_ * auVar491._16_4_;
              auVar459._20_4_ = auVar448._20_4_ * auVar491._20_4_;
              auVar459._24_4_ = auVar448._24_4_ * auVar491._24_4_;
              auVar459._28_4_ = auVar458._28_4_;
              break;
            case 6:
              uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar506._4_4_ = uVar4;
              auVar506._0_4_ = uVar4;
              auVar506._8_4_ = uVar4;
              auVar506._12_4_ = uVar4;
              auVar506._16_4_ = uVar4;
              auVar506._20_4_ = uVar4;
              auVar506._24_4_ = uVar4;
              auVar506._28_4_ = uVar4;
              uVar4 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
              auVar235._4_4_ = uVar4;
              auVar235._0_4_ = uVar4;
              auVar235._8_4_ = uVar4;
              auVar235._12_4_ = uVar4;
              auVar235._16_4_ = uVar4;
              auVar235._20_4_ = uVar4;
              auVar235._24_4_ = uVar4;
              auVar235._28_4_ = uVar4;
              auVar449 = vfmadd213ps_avx512vl(auVar506,auVar491,auVar235);
              auVar448 = vmaxps_avx(auVar449,auVar448);
              auVar448 = vminps_avx(auVar448,auVar538);
              auVar352._4_4_ = auVar448._4_4_ * auVar491._4_4_;
              auVar352._0_4_ = auVar448._0_4_ * auVar491._0_4_;
              auVar352._8_4_ = auVar448._8_4_ * auVar491._8_4_;
              auVar352._12_4_ = auVar448._12_4_ * auVar491._12_4_;
              auVar352._16_4_ = auVar448._16_4_ * auVar491._16_4_;
              auVar352._20_4_ = auVar448._20_4_ * auVar491._20_4_;
              auVar352._24_4_ = auVar448._24_4_ * auVar491._24_4_;
              auVar352._28_4_ = auVar459._28_4_;
              auVar459 = auVar352;
            }
          }
          auVar480 = auVar459._16_16_;
          auVar431 = auVar459._0_16_;
          if (iVar382 == 1) {
            *(int *)*local_310 = auVar459._0_4_;
            uVar4 = vextractps_avx(auVar431,1);
            *(undefined4 *)((long)*local_310 + lVar428 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,2);
            *(undefined4 *)((long)*local_310 + lVar367 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar431,3);
            *(undefined4 *)((long)*local_310 + lVar368 * 4) = uVar4;
            *(int *)((long)*local_310 + (long)(iVar383 * 4) * 4) = auVar459._16_4_;
            uVar4 = vextractps_avx(auVar480,1);
            *(undefined4 *)((long)*local_310 + (long)(iVar383 * 5) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar480,2);
            *(undefined4 *)((long)*local_310 + (long)(iVar383 * 6) * 4) = uVar4;
            uVar4 = vextractps_avx(auVar480,3);
            *(undefined4 *)((long)*local_310 + (long)(iVar383 * 7) * 4) = uVar4;
            local_310 = (undefined1 (*) [32])((long)*local_310 + 4);
          }
          else if (iVar382 == 4) {
            *(undefined1 (*) [16])*local_310 = auVar431;
            *(undefined1 (*) [16])((long)*local_310 + lVar428 * 4) = auVar480;
            local_310 = (undefined1 (*) [32])((long)*local_310 + 0x10);
          }
          else if (iVar382 == 8) {
            *local_310 = auVar459;
            local_310 = local_310 + 1;
          }
          iVar410 = iVar410 + local_188.elempack * iVar6;
          local_2e0 = local_2e0 + lVar3;
          local_2d8 = local_2d8 + lVar3;
        }
      }
      iVar382 = uVar400 + (int)uVar369 * 8;
      uVar369 = (long)(iVar389 - iVar382) / 4;
      lVar385 = uVar419 * 0x10;
      uVar426 = 0;
      iVar383 = (int)uVar369;
      uVar393 = 0;
      if (0 < iVar383) {
        uVar393 = uVar369 & 0xffffffff;
      }
      auVar461 = vmovdqu64_avx512f(local_b8);
      lVar370 = auVar461._0_8_;
      lVar420 = vpextrq_avx(auVar461._0_16_,1);
      lVar391 = vpextrq_avx(auVar461._16_16_,1);
      lVar405 = vpextrq_avx(auVar430,1);
      auVar480._8_4_ = 0x3f000000;
      auVar480._0_8_ = 0x3f0000003f000000;
      auVar480._12_4_ = 0x3f000000;
      auVar484._8_4_ = 0x3fb8aa3b;
      auVar484._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar484._12_4_ = 0x3fb8aa3b;
      auVar497._8_4_ = 0x3f318000;
      auVar497._0_8_ = 0x3f3180003f318000;
      auVar497._12_4_ = 0x3f318000;
      auVar522._8_4_ = 0x39506967;
      auVar522._0_8_ = 0x3950696739506967;
      auVar522._12_4_ = 0x39506967;
      auVar531._8_4_ = 0x3ab743ce;
      auVar531._0_8_ = 0x3ab743ce3ab743ce;
      auVar531._12_4_ = 0x3ab743ce;
      auVar536._8_4_ = 0x3c088908;
      auVar536._0_8_ = 0x3c0889083c088908;
      auVar536._12_4_ = 0x3c088908;
      auVar540._8_4_ = 0x3d2aa9c1;
      auVar540._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar540._12_4_ = 0x3d2aa9c1;
      auVar543._8_4_ = 0x3e2aaaaa;
      auVar543._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar543._12_4_ = 0x3e2aaaaa;
      auVar545._8_4_ = 0x3f800000;
      auVar545._0_8_ = 0x3f8000003f800000;
      auVar545._12_4_ = 0x3f800000;
      auVar547._8_4_ = 0xb95e8083;
      auVar547._0_8_ = 0xb95e8083b95e8083;
      auVar547._12_4_ = 0xb95e8083;
      auVar431 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar430 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      for (; uVar426 != uVar393; uVar426 = uVar426 + 1) {
        uVar369 = (long)iVar382 + uVar426 * 4;
        uVar400 = top_blob->w;
        iVar410 = top_blob->elempack;
        uVar409 = (int)uVar369 >> 0x1f;
        local_310 = (undefined1 (*) [32])
                    ((long)(int)((long)((ulong)uVar409 << 0x20 | uVar369 & 0xffffffff) /
                                (long)iVar410) * (long)(int)uVar400 * top_blob->elemsize +
                    (long)top_blob->data);
        uVar392 = (ulong)uVar409 << 0x20 | uVar369 & 0xffffffff;
        lVar417 = (long)local_188.h * (long)local_188.elempack;
        lVar394 = 0;
        uVar376 = 0;
        if (0 < (int)uVar400) {
          uVar376 = (ulong)uVar400;
        }
        iVar404 = 0;
        lVar374 = lVar397 * 4;
        for (uVar373 = 0; uVar373 != uVar376; uVar373 = uVar373 + 1) {
          auVar432 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
          auVar463 = ZEXT1664(auVar432);
          auVar432 = vxorps_avx512vl(auVar567._0_16_,auVar567._0_16_);
          if (lVar8 != 0) {
            auVar432 = *(undefined1 (*) [16])(lVar8 + uVar369 * 4);
          }
          auVar567 = ZEXT1664(auVar432);
          pauVar407 = (undefined1 (*) [16])
                      ((this->weight_data_tm).cstep *
                       (long)(((int)((long)((ulong)uVar409 << 0x20 | uVar369 & 0xffffffff) % 8) >> 2
                              ) + (int)((long)uVar392 / 0x10) +
                             (int)(char)((char)((long)uVar392 % 0x10) / '\b')) *
                       (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          iVar363 = local_188.elempack * iVar6 * (int)uVar373;
          lVar396 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar418 = lVar374 + (long)local_188.data;
          puVar371 = (undefined4 *)((long)local_188.data + lVar394);
          uVar427 = 0;
          auVar432 = vxorps_avx512vl(auVar462._0_16_,auVar462._0_16_);
          auVar462 = ZEXT1664(auVar432);
          auVar432 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
          in_ZMM31 = ZEXT1664(auVar432);
          while( true ) {
            local_368 = (int)lVar417;
            if (local_368 <= (int)((uint)uVar427 | 0xf)) break;
            lVar377 = (int)((long)((ulong)(uint)((int)(uint)uVar427 >> 0x1f) << 0x20 |
                                  uVar427 & 0xffffffff) / (long)local_188.elempack) * lVar396;
            if (local_188.elempack == 0x10) {
              puVar375 = (undefined4 *)((long)local_188.data + lVar377 + (long)iVar404 * 4);
              uVar401 = uVar419;
              pauVar403 = pauVar407;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = *puVar375;
                auVar21._4_4_ = uVar4;
                auVar21._0_4_ = uVar4;
                auVar21._8_4_ = uVar4;
                auVar21._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar21);
                uVar4 = puVar375[1];
                auVar22._4_4_ = uVar4;
                auVar22._0_4_ = uVar4;
                auVar22._8_4_ = uVar4;
                auVar22._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar22);
                uVar4 = puVar375[2];
                auVar23._4_4_ = uVar4;
                auVar23._0_4_ = uVar4;
                auVar23._8_4_ = uVar4;
                auVar23._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar23);
                uVar4 = puVar375[3];
                auVar24._4_4_ = uVar4;
                auVar24._0_4_ = uVar4;
                auVar24._8_4_ = uVar4;
                auVar24._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar24);
                uVar4 = puVar375[4];
                auVar25._4_4_ = uVar4;
                auVar25._0_4_ = uVar4;
                auVar25._8_4_ = uVar4;
                auVar25._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[4],auVar25);
                uVar4 = puVar375[5];
                auVar26._4_4_ = uVar4;
                auVar26._0_4_ = uVar4;
                auVar26._8_4_ = uVar4;
                auVar26._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar403[5],auVar26);
                uVar4 = puVar375[6];
                auVar27._4_4_ = uVar4;
                auVar27._0_4_ = uVar4;
                auVar27._8_4_ = uVar4;
                auVar27._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar434,pauVar403[6],auVar27);
                uVar4 = puVar375[7];
                auVar28._4_4_ = uVar4;
                auVar28._0_4_ = uVar4;
                auVar28._8_4_ = uVar4;
                auVar28._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar435,pauVar403[7],auVar28);
                uVar4 = puVar375[8];
                auVar29._4_4_ = uVar4;
                auVar29._0_4_ = uVar4;
                auVar29._8_4_ = uVar4;
                auVar29._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[8],auVar29);
                uVar4 = puVar375[9];
                auVar30._4_4_ = uVar4;
                auVar30._0_4_ = uVar4;
                auVar30._8_4_ = uVar4;
                auVar30._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar403[9],auVar30);
                uVar4 = puVar375[10];
                auVar31._4_4_ = uVar4;
                auVar31._0_4_ = uVar4;
                auVar31._8_4_ = uVar4;
                auVar31._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar434,pauVar403[10],auVar31);
                uVar4 = puVar375[0xb];
                auVar32._4_4_ = uVar4;
                auVar32._0_4_ = uVar4;
                auVar32._8_4_ = uVar4;
                auVar32._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar435,pauVar403[0xb],auVar32);
                uVar4 = puVar375[0xc];
                auVar33._4_4_ = uVar4;
                auVar33._0_4_ = uVar4;
                auVar33._8_4_ = uVar4;
                auVar33._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[0xc],auVar33);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar375[0xd];
                auVar34._4_4_ = uVar4;
                auVar34._0_4_ = uVar4;
                auVar34._8_4_ = uVar4;
                auVar34._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar433,pauVar403[0xd],auVar34);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar375[0xe];
                auVar35._4_4_ = uVar4;
                auVar35._0_4_ = uVar4;
                auVar35._8_4_ = uVar4;
                auVar35._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar434,pauVar403[0xe],auVar35);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar375[0xf];
                auVar36._4_4_ = uVar4;
                auVar36._0_4_ = uVar4;
                auVar36._8_4_ = uVar4;
                auVar36._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar435,pauVar403[0xf],auVar36);
                auVar463 = ZEXT1664(auVar432);
                pauVar403 = pauVar403 + 0x10;
                puVar375 = puVar375 + lVar415;
              }
              pauVar407 = pauVar407 + uVar419 * 0x10;
            }
            else {
              puVar375 = (undefined4 *)((long)local_188.data + lVar377 + (long)iVar363 * 4);
            }
            if (local_188.elempack == 8) {
              puVar408 = puVar375 + 7;
              uVar401 = uVar419;
              pauVar403 = pauVar407;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = puVar408[-7];
                auVar37._4_4_ = uVar4;
                auVar37._0_4_ = uVar4;
                auVar37._8_4_ = uVar4;
                auVar37._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar37);
                uVar4 = puVar408[-6];
                auVar38._4_4_ = uVar4;
                auVar38._0_4_ = uVar4;
                auVar38._8_4_ = uVar4;
                auVar38._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar38);
                uVar4 = puVar408[-5];
                auVar39._4_4_ = uVar4;
                auVar39._0_4_ = uVar4;
                auVar39._8_4_ = uVar4;
                auVar39._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar39);
                uVar4 = puVar408[-4];
                auVar40._4_4_ = uVar4;
                auVar40._0_4_ = uVar4;
                auVar40._8_4_ = uVar4;
                auVar40._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar40);
                uVar4 = puVar408[-3];
                auVar41._4_4_ = uVar4;
                auVar41._0_4_ = uVar4;
                auVar41._8_4_ = uVar4;
                auVar41._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[4],auVar41);
                uVar4 = puVar408[-2];
                auVar42._4_4_ = uVar4;
                auVar42._0_4_ = uVar4;
                auVar42._8_4_ = uVar4;
                auVar42._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar403[5],auVar42);
                uVar4 = puVar408[-1];
                auVar43._4_4_ = uVar4;
                auVar43._0_4_ = uVar4;
                auVar43._8_4_ = uVar4;
                auVar43._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar434,pauVar403[6],auVar43);
                uVar4 = *puVar408;
                auVar44._4_4_ = uVar4;
                auVar44._0_4_ = uVar4;
                auVar44._8_4_ = uVar4;
                auVar44._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar435,pauVar403[7],auVar44);
                uVar4 = puVar408[lVar397 + -7];
                auVar45._4_4_ = uVar4;
                auVar45._0_4_ = uVar4;
                auVar45._8_4_ = uVar4;
                auVar45._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[8],auVar45);
                uVar4 = puVar408[lVar397 + -6];
                auVar46._4_4_ = uVar4;
                auVar46._0_4_ = uVar4;
                auVar46._8_4_ = uVar4;
                auVar46._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar403[9],auVar46);
                uVar4 = puVar408[lVar397 + -5];
                auVar47._4_4_ = uVar4;
                auVar47._0_4_ = uVar4;
                auVar47._8_4_ = uVar4;
                auVar47._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar434,pauVar403[10],auVar47);
                uVar4 = puVar408[lVar397 + -4];
                auVar48._4_4_ = uVar4;
                auVar48._0_4_ = uVar4;
                auVar48._8_4_ = uVar4;
                auVar48._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar435,pauVar403[0xb],auVar48);
                uVar4 = puVar408[lVar397 + -3];
                auVar49._4_4_ = uVar4;
                auVar49._0_4_ = uVar4;
                auVar49._8_4_ = uVar4;
                auVar49._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[0xc],auVar49);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar397 + -2];
                auVar50._4_4_ = uVar4;
                auVar50._0_4_ = uVar4;
                auVar50._8_4_ = uVar4;
                auVar50._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar433,pauVar403[0xd],auVar50);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar397 + -1];
                auVar51._4_4_ = uVar4;
                auVar51._0_4_ = uVar4;
                auVar51._8_4_ = uVar4;
                auVar51._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar434,pauVar403[0xe],auVar51);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar397];
                auVar52._4_4_ = uVar4;
                auVar52._0_4_ = uVar4;
                auVar52._8_4_ = uVar4;
                auVar52._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar435,pauVar403[0xf],auVar52);
                auVar463 = ZEXT1664(auVar432);
                pauVar403 = pauVar403 + 0x10;
                puVar408 = puVar408 + lVar390;
              }
              puVar375 = (undefined4 *)((long)puVar375 + lVar372);
              pauVar407 = pauVar407 + uVar419 * 0x10;
            }
            if (local_188.elempack == 4) {
              puVar408 = puVar375 + 3;
              uVar401 = uVar419;
              pauVar403 = pauVar407;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = puVar408[-3];
                auVar53._4_4_ = uVar4;
                auVar53._0_4_ = uVar4;
                auVar53._8_4_ = uVar4;
                auVar53._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar53);
                uVar4 = puVar408[-2];
                auVar54._4_4_ = uVar4;
                auVar54._0_4_ = uVar4;
                auVar54._8_4_ = uVar4;
                auVar54._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar54);
                uVar4 = puVar408[-1];
                auVar55._4_4_ = uVar4;
                auVar55._0_4_ = uVar4;
                auVar55._8_4_ = uVar4;
                auVar55._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar55);
                uVar4 = *puVar408;
                auVar56._4_4_ = uVar4;
                auVar56._0_4_ = uVar4;
                auVar56._8_4_ = uVar4;
                auVar56._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar56);
                uVar4 = puVar408[lVar397 + -3];
                auVar57._4_4_ = uVar4;
                auVar57._0_4_ = uVar4;
                auVar57._8_4_ = uVar4;
                auVar57._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[4],auVar57);
                uVar4 = puVar408[lVar397 + -2];
                auVar58._4_4_ = uVar4;
                auVar58._0_4_ = uVar4;
                auVar58._8_4_ = uVar4;
                auVar58._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar403[5],auVar58);
                uVar4 = puVar408[lVar397 + -1];
                auVar59._4_4_ = uVar4;
                auVar59._0_4_ = uVar4;
                auVar59._8_4_ = uVar4;
                auVar59._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar434,pauVar403[6],auVar59);
                uVar4 = puVar408[lVar397];
                auVar60._4_4_ = uVar4;
                auVar60._0_4_ = uVar4;
                auVar60._8_4_ = uVar4;
                auVar60._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar435,pauVar403[7],auVar60);
                uVar4 = puVar408[lVar370 + -3];
                auVar61._4_4_ = uVar4;
                auVar61._0_4_ = uVar4;
                auVar61._8_4_ = uVar4;
                auVar61._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[8],auVar61);
                uVar4 = puVar408[lVar370 + -2];
                auVar62._4_4_ = uVar4;
                auVar62._0_4_ = uVar4;
                auVar62._8_4_ = uVar4;
                auVar62._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar403[9],auVar62);
                uVar4 = puVar408[lVar370 + -1];
                auVar63._4_4_ = uVar4;
                auVar63._0_4_ = uVar4;
                auVar63._8_4_ = uVar4;
                auVar63._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar434,pauVar403[10],auVar63);
                uVar4 = puVar408[lVar370];
                auVar64._4_4_ = uVar4;
                auVar64._0_4_ = uVar4;
                auVar64._8_4_ = uVar4;
                auVar64._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar435,pauVar403[0xb],auVar64);
                uVar4 = puVar408[lVar420 + -3];
                auVar65._4_4_ = uVar4;
                auVar65._0_4_ = uVar4;
                auVar65._8_4_ = uVar4;
                auVar65._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[0xc],auVar65);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar420 + -2];
                auVar66._4_4_ = uVar4;
                auVar66._0_4_ = uVar4;
                auVar66._8_4_ = uVar4;
                auVar66._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar433,pauVar403[0xd],auVar66);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar420 + -1];
                auVar67._4_4_ = uVar4;
                auVar67._0_4_ = uVar4;
                auVar67._8_4_ = uVar4;
                auVar67._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar434,pauVar403[0xe],auVar67);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar420];
                auVar68._4_4_ = uVar4;
                auVar68._0_4_ = uVar4;
                auVar68._8_4_ = uVar4;
                auVar68._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar435,pauVar403[0xf],auVar68);
                auVar463 = ZEXT1664(auVar432);
                pauVar403 = pauVar403 + 0x10;
                puVar408 = puVar408 + lVar422;
              }
              puVar375 = (undefined4 *)((long)puVar375 + lVar412);
              pauVar407 = pauVar407 + uVar419 * 0x10;
            }
            uVar401 = uVar419;
            pauVar403 = pauVar407;
            if (local_188.elempack == 1) {
              while ((int)uVar401 != 0) {
                uVar4 = *puVar375;
                auVar69._4_4_ = uVar4;
                auVar69._0_4_ = uVar4;
                auVar69._8_4_ = uVar4;
                auVar69._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar69);
                uVar4 = puVar375[lVar397];
                auVar70._4_4_ = uVar4;
                auVar70._0_4_ = uVar4;
                auVar70._8_4_ = uVar4;
                auVar70._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar70);
                uVar4 = puVar375[lVar370];
                auVar71._4_4_ = uVar4;
                auVar71._0_4_ = uVar4;
                auVar71._8_4_ = uVar4;
                auVar71._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar71);
                uVar4 = puVar375[lVar420];
                auVar72._4_4_ = uVar4;
                auVar72._0_4_ = uVar4;
                auVar72._8_4_ = uVar4;
                auVar72._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar72);
                uVar4 = puVar375[auVar461._16_8_];
                auVar73._4_4_ = uVar4;
                auVar73._0_4_ = uVar4;
                auVar73._8_4_ = uVar4;
                auVar73._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[4],auVar73);
                uVar4 = puVar375[lVar391];
                auVar74._4_4_ = uVar4;
                auVar74._0_4_ = uVar4;
                auVar74._8_4_ = uVar4;
                auVar74._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar403[5],auVar74);
                uVar4 = puVar375[lVar528];
                auVar75._4_4_ = uVar4;
                auVar75._0_4_ = uVar4;
                auVar75._8_4_ = uVar4;
                auVar75._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar434,pauVar403[6],auVar75);
                uVar4 = puVar375[lVar9];
                auVar76._4_4_ = uVar4;
                auVar76._0_4_ = uVar4;
                auVar76._8_4_ = uVar4;
                auVar76._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar435,pauVar403[7],auVar76);
                uVar4 = puVar375[lVar529];
                auVar77._4_4_ = uVar4;
                auVar77._0_4_ = uVar4;
                auVar77._8_4_ = uVar4;
                auVar77._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[8],auVar77);
                uVar4 = puVar375[lVar386];
                auVar78._4_4_ = uVar4;
                auVar78._0_4_ = uVar4;
                auVar78._8_4_ = uVar4;
                auVar78._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(auVar433,pauVar403[9],auVar78);
                uVar4 = puVar375[lVar496];
                auVar79._4_4_ = uVar4;
                auVar79._0_4_ = uVar4;
                auVar79._8_4_ = uVar4;
                auVar79._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar434,pauVar403[10],auVar79);
                uVar4 = puVar375[lVar405];
                auVar80._4_4_ = uVar4;
                auVar80._0_4_ = uVar4;
                auVar80._8_4_ = uVar4;
                auVar80._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar435,pauVar403[0xb],auVar80);
                uVar4 = puVar375[lVar530];
                auVar81._4_4_ = uVar4;
                auVar81._0_4_ = uVar4;
                auVar81._8_4_ = uVar4;
                auVar81._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[0xc],auVar81);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar378];
                auVar82._4_4_ = uVar4;
                auVar82._0_4_ = uVar4;
                auVar82._8_4_ = uVar4;
                auVar82._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar433,pauVar403[0xd],auVar82);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar365];
                auVar83._4_4_ = uVar4;
                auVar83._0_4_ = uVar4;
                auVar83._8_4_ = uVar4;
                auVar83._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar434,pauVar403[0xe],auVar83);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar366];
                auVar84._4_4_ = uVar4;
                auVar84._0_4_ = uVar4;
                auVar84._8_4_ = uVar4;
                auVar84._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar435,pauVar403[0xf],auVar84);
                auVar463 = ZEXT1664(auVar432);
                puVar375 = puVar375 + lVar398;
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar403 = pauVar403 + 0x10;
              }
              pauVar407 = pauVar407 + uVar419 * 0x10;
            }
            uVar427 = uVar427 + 0x10;
            lVar418 = lVar418 + lVar396 * 0x10;
            puVar371 = puVar371 + lVar396 * 4;
          }
          for (; (int)((uint)uVar427 | 7) < local_368; uVar427 = uVar427 + 8) {
            lVar377 = (int)((long)((ulong)(uint)((int)(uint)uVar427 >> 0x1f) << 0x20 |
                                  uVar427 & 0xffffffff) / (long)local_188.elempack) * lVar396;
            if (local_188.elempack == 8) {
              puVar375 = (undefined4 *)((long)local_188.data + lVar377 + (long)iVar404 * 4);
              uVar401 = uVar419;
              pauVar403 = pauVar407;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = *puVar375;
                auVar432._4_4_ = uVar4;
                auVar432._0_4_ = uVar4;
                auVar432._8_4_ = uVar4;
                auVar432._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar432);
                uVar4 = puVar375[1];
                auVar433._4_4_ = uVar4;
                auVar433._0_4_ = uVar4;
                auVar433._8_4_ = uVar4;
                auVar433._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar433);
                uVar4 = puVar375[2];
                auVar434._4_4_ = uVar4;
                auVar434._0_4_ = uVar4;
                auVar434._8_4_ = uVar4;
                auVar434._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar434);
                uVar4 = puVar375[3];
                auVar435._4_4_ = uVar4;
                auVar435._0_4_ = uVar4;
                auVar435._8_4_ = uVar4;
                auVar435._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar435);
                uVar4 = puVar375[4];
                auVar436._4_4_ = uVar4;
                auVar436._0_4_ = uVar4;
                auVar436._8_4_ = uVar4;
                auVar436._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[4],auVar436);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar375[5];
                auVar437._4_4_ = uVar4;
                auVar437._0_4_ = uVar4;
                auVar437._8_4_ = uVar4;
                auVar437._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar433,pauVar403[5],auVar437);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar375[6];
                auVar85._4_4_ = uVar4;
                auVar85._0_4_ = uVar4;
                auVar85._8_4_ = uVar4;
                auVar85._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar434,pauVar403[6],auVar85);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar375[7];
                auVar86._4_4_ = uVar4;
                auVar86._0_4_ = uVar4;
                auVar86._8_4_ = uVar4;
                auVar86._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar435,pauVar403[7],auVar86);
                auVar463 = ZEXT1664(auVar432);
                pauVar403 = pauVar403 + 8;
                puVar375 = puVar375 + lVar390;
              }
              pauVar407 = pauVar407 + uVar419 * 8;
            }
            else {
              puVar375 = (undefined4 *)((long)local_188.data + lVar377 + (long)iVar363 * 4);
            }
            if (local_188.elempack == 4) {
              puVar408 = puVar375 + 3;
              uVar401 = uVar419;
              pauVar403 = pauVar407;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = puVar408[-3];
                auVar87._4_4_ = uVar4;
                auVar87._0_4_ = uVar4;
                auVar87._8_4_ = uVar4;
                auVar87._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar87);
                uVar4 = puVar408[-2];
                auVar88._4_4_ = uVar4;
                auVar88._0_4_ = uVar4;
                auVar88._8_4_ = uVar4;
                auVar88._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar88);
                uVar4 = puVar408[-1];
                auVar89._4_4_ = uVar4;
                auVar89._0_4_ = uVar4;
                auVar89._8_4_ = uVar4;
                auVar89._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar89);
                uVar4 = *puVar408;
                auVar90._4_4_ = uVar4;
                auVar90._0_4_ = uVar4;
                auVar90._8_4_ = uVar4;
                auVar90._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar90);
                uVar4 = puVar408[lVar397 + -3];
                auVar91._4_4_ = uVar4;
                auVar91._0_4_ = uVar4;
                auVar91._8_4_ = uVar4;
                auVar91._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[4],auVar91);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar397 + -2];
                auVar92._4_4_ = uVar4;
                auVar92._0_4_ = uVar4;
                auVar92._8_4_ = uVar4;
                auVar92._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar433,pauVar403[5],auVar92);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar397 + -1];
                auVar93._4_4_ = uVar4;
                auVar93._0_4_ = uVar4;
                auVar93._8_4_ = uVar4;
                auVar93._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar434,pauVar403[6],auVar93);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar408[lVar397];
                auVar94._4_4_ = uVar4;
                auVar94._0_4_ = uVar4;
                auVar94._8_4_ = uVar4;
                auVar94._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar435,pauVar403[7],auVar94);
                auVar463 = ZEXT1664(auVar432);
                pauVar403 = pauVar403 + 8;
                puVar408 = puVar408 + lVar422;
              }
              pauVar407 = pauVar407 + uVar419 * 8;
              puVar375 = (undefined4 *)((long)puVar375 + lVar412);
            }
            uVar401 = uVar419;
            pauVar403 = pauVar407;
            if (local_188.elempack == 1) {
              while ((int)uVar401 != 0) {
                uVar4 = *puVar375;
                auVar95._4_4_ = uVar4;
                auVar95._0_4_ = uVar4;
                auVar95._8_4_ = uVar4;
                auVar95._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar95);
                uVar4 = puVar375[lVar397];
                auVar96._4_4_ = uVar4;
                auVar96._0_4_ = uVar4;
                auVar96._8_4_ = uVar4;
                auVar96._12_4_ = uVar4;
                auVar433 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar96);
                uVar4 = puVar375[lVar370];
                auVar97._4_4_ = uVar4;
                auVar97._0_4_ = uVar4;
                auVar97._8_4_ = uVar4;
                auVar97._12_4_ = uVar4;
                auVar434 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar97);
                uVar4 = puVar375[lVar420];
                auVar98._4_4_ = uVar4;
                auVar98._0_4_ = uVar4;
                auVar98._8_4_ = uVar4;
                auVar98._12_4_ = uVar4;
                auVar435 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar98);
                uVar4 = puVar375[auVar461._16_8_];
                auVar99._4_4_ = uVar4;
                auVar99._0_4_ = uVar4;
                auVar99._8_4_ = uVar4;
                auVar99._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar432,pauVar403[4],auVar99);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar391];
                auVar100._4_4_ = uVar4;
                auVar100._0_4_ = uVar4;
                auVar100._8_4_ = uVar4;
                auVar100._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar433,pauVar403[5],auVar100);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar528];
                auVar101._4_4_ = uVar4;
                auVar101._0_4_ = uVar4;
                auVar101._8_4_ = uVar4;
                auVar101._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar434,pauVar403[6],auVar101);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar9];
                auVar102._4_4_ = uVar4;
                auVar102._0_4_ = uVar4;
                auVar102._8_4_ = uVar4;
                auVar102._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar435,pauVar403[7],auVar102);
                auVar463 = ZEXT1664(auVar432);
                puVar375 = puVar375 + lVar398;
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar403 = pauVar403 + 8;
              }
              pauVar407 = pauVar407 + uVar419 * 8;
            }
            lVar418 = lVar418 + lVar396 * 8;
            puVar371 = puVar371 + lVar396 * 2;
          }
          for (; (int)((uint)uVar427 | 3) < local_368; uVar427 = uVar427 + 4) {
            lVar377 = (int)((long)((ulong)(uint)((int)(uint)uVar427 >> 0x1f) << 0x20 |
                                  uVar427 & 0xffffffff) / (long)local_188.elempack) * lVar396;
            if (local_188.elempack == 4) {
              puVar375 = (undefined4 *)((long)local_188.data + lVar377 + (long)iVar404 * 4);
              uVar401 = uVar419;
              pauVar403 = pauVar407;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                uVar4 = *puVar375;
                auVar103._4_4_ = uVar4;
                auVar103._0_4_ = uVar4;
                auVar103._8_4_ = uVar4;
                auVar103._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar103);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar375[1];
                auVar104._4_4_ = uVar4;
                auVar104._0_4_ = uVar4;
                auVar104._8_4_ = uVar4;
                auVar104._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar104);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar375[2];
                auVar105._4_4_ = uVar4;
                auVar105._0_4_ = uVar4;
                auVar105._8_4_ = uVar4;
                auVar105._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar105);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar375[3];
                auVar106._4_4_ = uVar4;
                auVar106._0_4_ = uVar4;
                auVar106._8_4_ = uVar4;
                auVar106._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar106);
                auVar463 = ZEXT1664(auVar432);
                pauVar403 = pauVar403 + 4;
                puVar375 = puVar375 + lVar422;
              }
              pauVar407 = pauVar407 + uVar419 * 4;
            }
            else {
              puVar375 = (undefined4 *)((long)local_188.data + lVar377 + (long)iVar363 * 4);
            }
            uVar401 = uVar419;
            pauVar403 = pauVar407;
            if (local_188.elempack == 1) {
              while ((int)uVar401 != 0) {
                uVar4 = *puVar375;
                auVar107._4_4_ = uVar4;
                auVar107._0_4_ = uVar4;
                auVar107._8_4_ = uVar4;
                auVar107._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar107);
                auVar567 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar397];
                auVar108._4_4_ = uVar4;
                auVar108._0_4_ = uVar4;
                auVar108._8_4_ = uVar4;
                auVar108._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar108);
                in_ZMM31 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar370];
                auVar109._4_4_ = uVar4;
                auVar109._0_4_ = uVar4;
                auVar109._8_4_ = uVar4;
                auVar109._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar462._0_16_,pauVar403[2],auVar109);
                auVar462 = ZEXT1664(auVar432);
                uVar4 = puVar375[lVar420];
                auVar110._4_4_ = uVar4;
                auVar110._0_4_ = uVar4;
                auVar110._8_4_ = uVar4;
                auVar110._12_4_ = uVar4;
                auVar432 = vfmadd231ps_avx512vl(auVar463._0_16_,pauVar403[3],auVar110);
                auVar463 = ZEXT1664(auVar432);
                puVar375 = puVar375 + lVar398;
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar403 = pauVar403 + 4;
              }
              pauVar407 = pauVar407 + uVar419 * 4;
            }
            lVar418 = lVar418 + lVar396 * 4;
            puVar371 = puVar371 + lVar396;
          }
          for (; (long)(uVar427 | 1) < lVar417; uVar427 = uVar427 + 2) {
            lVar377 = 0;
            uVar401 = uVar419;
            pauVar403 = pauVar407;
            while (iVar363 = (int)uVar401, uVar401 = (ulong)(iVar363 - 1), iVar363 != 0) {
              uVar4 = *(undefined4 *)((long)puVar371 + lVar377);
              auVar111._4_4_ = uVar4;
              auVar111._0_4_ = uVar4;
              auVar111._8_4_ = uVar4;
              auVar111._12_4_ = uVar4;
              auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,*pauVar403,auVar111);
              auVar567 = ZEXT1664(auVar432);
              uVar4 = *(undefined4 *)(lVar418 + lVar377);
              auVar112._4_4_ = uVar4;
              auVar112._0_4_ = uVar4;
              auVar112._8_4_ = uVar4;
              auVar112._12_4_ = uVar4;
              auVar432 = vfmadd231ps_avx512vl(in_ZMM31._0_16_,pauVar403[1],auVar112);
              in_ZMM31 = ZEXT1664(auVar432);
              pauVar403 = pauVar403 + 2;
              lVar377 = lVar377 + lVar399;
            }
            pauVar407 = pauVar407 + uVar419 * 2;
            lVar418 = lVar418 + lVar396 * 2;
            puVar371 = (undefined4 *)((long)puVar371 + lVar396 * 2);
          }
          for (; uVar401 = uVar419, puVar375 = puVar371, pauVar403 = pauVar407,
              (long)uVar427 < lVar417; uVar427 = uVar427 + 1) {
            while ((int)uVar401 != 0) {
              uVar4 = *puVar375;
              auVar510._4_4_ = uVar4;
              auVar510._0_4_ = uVar4;
              auVar510._8_4_ = uVar4;
              auVar510._12_4_ = uVar4;
              auVar432 = vfmadd231ps_avx512vl(auVar567._0_16_,auVar510,*pauVar403);
              auVar567 = ZEXT1664(auVar432);
              uVar401 = (ulong)((int)uVar401 - 1);
              puVar375 = puVar375 + lVar398;
              pauVar403 = pauVar403 + 1;
            }
            pauVar407 = pauVar407 + uVar419;
            puVar371 = (undefined4 *)((long)puVar371 + lVar396);
          }
          auVar432 = vaddps_avx512vl(auVar462._0_16_,auVar463._0_16_);
          auVar433 = vaddps_avx512vl(in_ZMM31._0_16_,auVar567._0_16_);
          auVar433 = vaddps_avx512vl(auVar432,auVar433);
          in_ZMM28 = ZEXT1664(auVar433);
          auVar432 = auVar433;
          if (iVar424 - 1U < 6) {
            auVar432 = vmaxps_avx512vl(auVar433,auVar430);
            switch(iVar424) {
            case 2:
              auVar433 = vminps_avx512vl(auVar433,auVar430);
              uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar137._4_4_ = uVar4;
              auVar137._0_4_ = uVar4;
              auVar137._8_4_ = uVar4;
              auVar137._12_4_ = uVar4;
              auVar432 = vfmadd231ps_avx512vl(auVar432,auVar433,auVar137);
              break;
            case 3:
              uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar135._4_4_ = uVar4;
              auVar135._0_4_ = uVar4;
              auVar135._8_4_ = uVar4;
              auVar135._12_4_ = uVar4;
              auVar432 = vmaxps_avx512vl(auVar433,auVar135);
              uVar4 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
              auVar136._4_4_ = uVar4;
              auVar136._0_4_ = uVar4;
              auVar136._8_4_ = uVar4;
              auVar136._12_4_ = uVar4;
              auVar432 = vminps_avx512vl(auVar432,auVar136);
              break;
            case 4:
              auVar131._8_4_ = 0x80000000;
              auVar131._0_8_ = 0x8000000080000000;
              auVar131._12_4_ = 0x80000000;
              auVar432 = vxorps_avx512vl(auVar433,auVar131);
              auVar132._8_4_ = 0x42b0c0a5;
              auVar132._0_8_ = 0x42b0c0a542b0c0a5;
              auVar132._12_4_ = 0x42b0c0a5;
              auVar432 = vminps_avx512vl(auVar432,auVar132);
              auVar133._8_4_ = 0xc2b0c0a5;
              auVar133._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar133._12_4_ = 0xc2b0c0a5;
              auVar434 = vmaxps_avx512vl(auVar432,auVar133);
              auVar433 = vfmadd231ps_fma(auVar480,auVar434,auVar484);
              auVar559._0_4_ = (int)auVar433._0_4_;
              auVar559._4_4_ = (int)auVar433._4_4_;
              auVar559._8_4_ = (int)auVar433._8_4_;
              auVar559._12_4_ = (int)auVar433._12_4_;
              auVar432 = vcvtdq2ps_avx(auVar559);
              uVar427 = vcmpps_avx512vl(auVar433,auVar432,1);
              auVar563._8_4_ = 0x3f800000;
              auVar563._0_8_ = 0x3f8000003f800000;
              auVar563._12_4_ = 0x3f800000;
              auVar433 = vsubps_avx512vl(auVar432,auVar563);
              bVar18 = (bool)((byte)uVar427 & 1);
              auVar443._0_4_ =
                   (float)((uint)bVar18 * auVar433._0_4_ | (uint)!bVar18 * auVar432._0_4_);
              bVar18 = (bool)((byte)(uVar427 >> 1) & 1);
              auVar443._4_4_ =
                   (float)((uint)bVar18 * auVar433._4_4_ | (uint)!bVar18 * auVar432._4_4_);
              bVar18 = (bool)((byte)(uVar427 >> 2) & 1);
              auVar443._8_4_ =
                   (float)((uint)bVar18 * auVar433._8_4_ | (uint)!bVar18 * auVar432._8_4_);
              bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
              auVar443._12_4_ =
                   (float)((uint)bVar18 * auVar433._12_4_ | (uint)!bVar18 * auVar432._12_4_);
              auVar432 = vfmsub231ps_fma(auVar434,auVar443,auVar497);
              auVar134._8_4_ = 0x395e8083;
              auVar134._0_8_ = 0x395e8083395e8083;
              auVar134._12_4_ = 0x395e8083;
              auVar433 = vfmsub231ps_avx512vl(auVar432,auVar443,auVar134);
              auVar552._0_4_ = auVar433._0_4_ * auVar433._0_4_;
              auVar552._4_4_ = auVar433._4_4_ * auVar433._4_4_;
              auVar552._8_4_ = auVar433._8_4_ * auVar433._8_4_;
              auVar552._12_4_ = auVar433._12_4_ * auVar433._12_4_;
              auVar432 = vfmadd213ps_fma(auVar522,auVar433,auVar531);
              auVar432 = vfmadd213ps_fma(auVar432,auVar433,auVar536);
              auVar432 = vfmadd213ps_fma(auVar432,auVar433,auVar540);
              auVar432 = vfmadd213ps_fma(auVar432,auVar433,auVar543);
              auVar432 = vfmadd213ps_fma(auVar432,auVar433,auVar480);
              auVar432 = vfmadd213ps_fma(auVar432,auVar552,auVar433);
              auVar553._0_4_ = auVar432._0_4_ + 1.0;
              auVar553._4_4_ = auVar432._4_4_ + 1.0;
              auVar553._8_4_ = auVar432._8_4_ + 1.0;
              auVar553._12_4_ = auVar432._12_4_ + 1.0;
              auVar513._0_4_ = (int)auVar443._0_4_;
              auVar513._4_4_ = (int)auVar443._4_4_;
              auVar513._8_4_ = (int)auVar443._8_4_;
              auVar513._12_4_ = (int)auVar443._12_4_;
              auVar432 = vpslld_avx(auVar513,0x17);
              auVar432 = vpaddd_avx(auVar545,auVar432);
              auVar433 = vfmadd213ps_fma(auVar432,auVar553,auVar563);
              auVar432 = vrcpps_avx(auVar433);
              auVar433 = vfmsub213ps_fma(auVar433,auVar432,auVar563);
              auVar432 = vfnmadd132ps_fma(auVar433,auVar432,auVar432);
              break;
            case 5:
              auVar565._8_4_ = 0x42b0c0a5;
              auVar565._0_8_ = 0x42b0c0a542b0c0a5;
              auVar565._12_4_ = 0x42b0c0a5;
              auVar432 = vminps_avx512vl(auVar433,auVar565);
              auVar435 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
              auVar436 = vmaxps_avx512vl(auVar432,auVar435);
              auVar434 = vfmadd213ps_fma(auVar484,auVar436,auVar480);
              auVar555._0_4_ = (int)auVar434._0_4_;
              auVar555._4_4_ = (int)auVar434._4_4_;
              auVar555._8_4_ = (int)auVar434._8_4_;
              auVar555._12_4_ = (int)auVar434._12_4_;
              auVar432 = vcvtdq2ps_avx(auVar555);
              uVar427 = vcmpps_avx512vl(auVar434,auVar432,1);
              auVar437 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar434 = vsubps_avx512vl(auVar432,auVar437);
              bVar18 = (bool)((byte)uVar427 & 1);
              auVar438._0_4_ =
                   (float)((uint)bVar18 * auVar434._0_4_ | (uint)!bVar18 * auVar432._0_4_);
              bVar18 = (bool)((byte)(uVar427 >> 1) & 1);
              auVar438._4_4_ =
                   (float)((uint)bVar18 * auVar434._4_4_ | (uint)!bVar18 * auVar432._4_4_);
              bVar18 = (bool)((byte)(uVar427 >> 2) & 1);
              auVar438._8_4_ =
                   (float)((uint)bVar18 * auVar434._8_4_ | (uint)!bVar18 * auVar432._8_4_);
              bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
              auVar438._12_4_ =
                   (float)((uint)bVar18 * auVar434._12_4_ | (uint)!bVar18 * auVar432._12_4_);
              auVar432 = vfmsub231ps_fma(auVar436,auVar438,auVar497);
              auVar434 = vfnmsub231ps_fma(auVar432,auVar438,auVar547);
              auVar549._0_4_ = auVar434._0_4_ * auVar434._0_4_;
              auVar549._4_4_ = auVar434._4_4_ * auVar434._4_4_;
              auVar549._8_4_ = auVar434._8_4_ * auVar434._8_4_;
              auVar549._12_4_ = auVar434._12_4_ * auVar434._12_4_;
              auVar432 = vfmadd213ps_fma(auVar522,auVar434,auVar531);
              auVar432 = vfmadd213ps_fma(auVar432,auVar434,auVar536);
              auVar432 = vfmadd213ps_fma(auVar432,auVar434,auVar540);
              auVar432 = vfmadd213ps_fma(auVar432,auVar434,auVar543);
              auVar432 = vfmadd213ps_fma(auVar432,auVar434,auVar480);
              auVar432 = vfmadd213ps_fma(auVar432,auVar549,auVar434);
              auVar434 = vaddps_avx512vl(auVar432,auVar437);
              auVar550._0_4_ = (int)auVar438._0_4_;
              auVar550._4_4_ = (int)auVar438._4_4_;
              auVar550._8_4_ = (int)auVar438._8_4_;
              auVar550._12_4_ = (int)auVar438._12_4_;
              auVar432 = vpslld_avx(auVar550,0x17);
              auVar432 = vpaddd_avx(auVar432,auVar545);
              auVar432 = vfmadd213ps_avx512vl(auVar432,auVar434,auVar437);
              uVar427 = vcmpps_avx512vl(auVar432,auVar430,2);
              auVar117._8_4_ = 0x800000;
              auVar117._0_8_ = 0x80000000800000;
              auVar117._12_4_ = 0x800000;
              auVar432 = vmaxps_avx512vl(auVar432,auVar117);
              auVar436 = vpsrld_avx(auVar432,0x17);
              auVar556._8_4_ = 0x807fffff;
              auVar556._0_8_ = 0x807fffff807fffff;
              auVar556._12_4_ = 0x807fffff;
              auVar118._8_4_ = 0x3f000000;
              auVar118._0_8_ = 0x3f0000003f000000;
              auVar118._12_4_ = 0x3f000000;
              auVar432 = vpternlogd_avx512vl(auVar432,auVar556,auVar118,0xea);
              auVar119._8_4_ = 0x3f3504f3;
              auVar119._0_8_ = 0x3f3504f33f3504f3;
              auVar119._12_4_ = 0x3f3504f3;
              uVar401 = vcmpps_avx512vl(auVar432,auVar119,1);
              auVar120._8_4_ = 0xbf800000;
              auVar120._0_8_ = 0xbf800000bf800000;
              auVar120._12_4_ = 0xbf800000;
              auVar434 = vaddps_avx512vl(auVar432,auVar120);
              auVar432 = vaddps_avx512vl(auVar434,auVar432);
              bVar18 = (bool)((byte)uVar401 & 1);
              auVar439._0_4_ =
                   (float)((uint)bVar18 * auVar432._0_4_ | (uint)!bVar18 * auVar434._0_4_);
              bVar18 = (bool)((byte)(uVar401 >> 1) & 1);
              auVar439._4_4_ =
                   (float)((uint)bVar18 * auVar432._4_4_ | (uint)!bVar18 * auVar434._4_4_);
              bVar18 = (bool)((byte)(uVar401 >> 2) & 1);
              auVar439._8_4_ =
                   (float)((uint)bVar18 * auVar432._8_4_ | (uint)!bVar18 * auVar434._8_4_);
              bVar18 = (bool)((byte)(uVar401 >> 3) & 1);
              auVar439._12_4_ =
                   (float)((uint)bVar18 * auVar432._12_4_ | (uint)!bVar18 * auVar434._12_4_);
              auVar511._0_4_ = auVar439._0_4_ * auVar439._0_4_;
              auVar511._4_4_ = auVar439._4_4_ * auVar439._4_4_;
              auVar511._8_4_ = auVar439._8_4_ * auVar439._8_4_;
              auVar511._12_4_ = auVar439._12_4_ * auVar439._12_4_;
              auVar121._8_4_ = 0xbdebd1b8;
              auVar121._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar121._12_4_ = 0xbdebd1b8;
              auVar432 = vfmadd213ps_avx512vl(auVar431,auVar439,auVar121);
              auVar122._8_4_ = 0x3def251a;
              auVar122._0_8_ = 0x3def251a3def251a;
              auVar122._12_4_ = 0x3def251a;
              auVar432 = vfmadd213ps_avx512vl(auVar432,auVar439,auVar122);
              auVar123._8_4_ = 0xbdfe5d4f;
              auVar123._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar123._12_4_ = 0xbdfe5d4f;
              auVar432 = vfmadd213ps_avx512vl(auVar432,auVar439,auVar123);
              auVar124._8_4_ = 0x3e11e9bf;
              auVar124._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar124._12_4_ = 0x3e11e9bf;
              auVar432 = vfmadd213ps_avx512vl(auVar432,auVar439,auVar124);
              auVar125._8_4_ = 0xbe2aae50;
              auVar125._0_8_ = 0xbe2aae50be2aae50;
              auVar125._12_4_ = 0xbe2aae50;
              auVar432 = vfmadd213ps_avx512vl(auVar432,auVar439,auVar125);
              auVar126._8_4_ = 0x3e4cceac;
              auVar126._0_8_ = 0x3e4cceac3e4cceac;
              auVar126._12_4_ = 0x3e4cceac;
              auVar432 = vfmadd213ps_avx512vl(auVar432,auVar439,auVar126);
              auVar127._8_4_ = 0xbe7ffffc;
              auVar127._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar127._12_4_ = 0xbe7ffffc;
              auVar432 = vfmadd213ps_avx512vl(auVar432,auVar439,auVar127);
              auVar128._8_4_ = 0x3eaaaaaa;
              auVar128._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar128._12_4_ = 0x3eaaaaaa;
              auVar432 = vfmadd213ps_avx512vl(auVar432,auVar439,auVar128);
              auVar561._0_4_ = auVar439._0_4_ * auVar511._0_4_ * auVar432._0_4_;
              auVar561._4_4_ = auVar439._4_4_ * auVar511._4_4_ * auVar432._4_4_;
              auVar561._8_4_ = auVar439._8_4_ * auVar511._8_4_ * auVar432._8_4_;
              auVar561._12_4_ = auVar439._12_4_ * auVar511._12_4_ * auVar432._12_4_;
              auVar129._8_4_ = 0xffffff82;
              auVar129._0_8_ = 0xffffff82ffffff82;
              auVar129._12_4_ = 0xffffff82;
              auVar432 = vpaddd_avx512vl(auVar436,auVar129);
              auVar432 = vcvtdq2ps_avx(auVar432);
              auVar434 = vsubps_avx512vl(auVar432,auVar437);
              bVar18 = (bool)((byte)uVar401 & 1);
              auVar440._0_4_ = (uint)bVar18 * auVar434._0_4_ | (uint)!bVar18 * auVar432._0_4_;
              bVar18 = (bool)((byte)(uVar401 >> 1) & 1);
              auVar440._4_4_ = (uint)bVar18 * auVar434._4_4_ | (uint)!bVar18 * auVar432._4_4_;
              bVar18 = (bool)((byte)(uVar401 >> 2) & 1);
              auVar440._8_4_ = (uint)bVar18 * auVar434._8_4_ | (uint)!bVar18 * auVar432._8_4_;
              bVar18 = (bool)((byte)(uVar401 >> 3) & 1);
              auVar440._12_4_ = (uint)bVar18 * auVar434._12_4_ | (uint)!bVar18 * auVar432._12_4_;
              auVar432 = vfmadd231ps_fma(auVar561,auVar440,auVar547);
              auVar432 = vfmsub231ps_fma(auVar432,auVar480,auVar511);
              auVar432 = vsubps_avx(auVar432,auVar439);
              auVar432 = vfnmadd231ps_fma(auVar432,auVar497,auVar440);
              auVar434 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar18 = (bool)((byte)uVar427 & 1);
              auVar441._0_4_ =
                   (uint)bVar18 * auVar434._0_4_ |
                   (uint)!bVar18 * (int)(auVar432._0_4_ + auVar432._0_4_);
              bVar18 = (bool)((byte)(uVar427 >> 1) & 1);
              auVar441._4_4_ =
                   (uint)bVar18 * auVar434._4_4_ |
                   (uint)!bVar18 * (int)(auVar432._4_4_ + auVar432._4_4_);
              bVar18 = (bool)((byte)(uVar427 >> 2) & 1);
              auVar441._8_4_ =
                   (uint)bVar18 * auVar434._8_4_ |
                   (uint)!bVar18 * (int)(auVar432._8_4_ + auVar432._8_4_);
              bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
              auVar441._12_4_ =
                   (uint)bVar18 * auVar434._12_4_ |
                   (uint)!bVar18 * (int)(auVar432._12_4_ + auVar432._12_4_);
              auVar432 = vminps_avx(auVar565,auVar441);
              auVar435 = vmaxps_avx512vl(auVar432,auVar435);
              auVar434 = vfmadd213ps_fma(auVar484,auVar435,auVar480);
              auVar557._0_4_ = (int)auVar434._0_4_;
              auVar557._4_4_ = (int)auVar434._4_4_;
              auVar557._8_4_ = (int)auVar434._8_4_;
              auVar557._12_4_ = (int)auVar434._12_4_;
              auVar432 = vcvtdq2ps_avx(auVar557);
              uVar427 = vcmpps_avx512vl(auVar434,auVar432,1);
              auVar434 = vsubps_avx512vl(auVar432,auVar437);
              bVar18 = (bool)((byte)uVar427 & 1);
              auVar442._0_4_ =
                   (float)((uint)bVar18 * auVar434._0_4_ | (uint)!bVar18 * auVar432._0_4_);
              bVar18 = (bool)((byte)(uVar427 >> 1) & 1);
              auVar442._4_4_ =
                   (float)((uint)bVar18 * auVar434._4_4_ | (uint)!bVar18 * auVar432._4_4_);
              bVar18 = (bool)((byte)(uVar427 >> 2) & 1);
              auVar442._8_4_ =
                   (float)((uint)bVar18 * auVar434._8_4_ | (uint)!bVar18 * auVar432._8_4_);
              bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
              auVar442._12_4_ =
                   (float)((uint)bVar18 * auVar434._12_4_ | (uint)!bVar18 * auVar432._12_4_);
              auVar432 = vfmsub231ps_fma(auVar435,auVar442,auVar497);
              auVar434 = vfnmsub231ps_fma(auVar432,auVar442,auVar547);
              auVar551._0_4_ = auVar434._0_4_ * auVar434._0_4_;
              auVar551._4_4_ = auVar434._4_4_ * auVar434._4_4_;
              auVar551._8_4_ = auVar434._8_4_ * auVar434._8_4_;
              auVar551._12_4_ = auVar434._12_4_ * auVar434._12_4_;
              auVar432 = vfmadd213ps_fma(auVar522,auVar434,auVar531);
              auVar432 = vfmadd213ps_fma(auVar432,auVar434,auVar536);
              auVar432 = vfmadd213ps_fma(auVar432,auVar434,auVar540);
              auVar432 = vfmadd213ps_fma(auVar432,auVar434,auVar543);
              auVar432 = vfmadd213ps_fma(auVar432,auVar434,auVar480);
              auVar432 = vfmadd213ps_fma(auVar432,auVar551,auVar434);
              auVar434 = vaddps_avx512vl(auVar432,auVar437);
              auVar512._0_4_ = (int)auVar442._0_4_;
              auVar512._4_4_ = (int)auVar442._4_4_;
              auVar512._8_4_ = (int)auVar442._8_4_;
              auVar512._12_4_ = (int)auVar442._12_4_;
              auVar432 = vpslld_avx(auVar512,0x17);
              auVar432 = vpaddd_avx(auVar545,auVar432);
              auVar434 = vfmadd213ps_avx512vl(auVar432,auVar434,auVar437);
              auVar432 = vrcpps_avx(auVar434);
              auVar558._0_4_ = auVar432._0_4_ + auVar432._0_4_;
              auVar558._4_4_ = auVar432._4_4_ + auVar432._4_4_;
              auVar558._8_4_ = auVar432._8_4_ + auVar432._8_4_;
              auVar558._12_4_ = auVar432._12_4_ + auVar432._12_4_;
              auVar130._8_4_ = 0x40000000;
              auVar130._0_8_ = 0x4000000040000000;
              auVar130._12_4_ = 0x40000000;
              auVar434 = vfmsub213ps_avx512vl(auVar434,auVar558,auVar130);
              auVar432 = vfnmadd213ps_fma(auVar434,auVar432,auVar558);
              auVar432 = vfmsub213ps_avx512vl(auVar432,auVar433,auVar433);
              break;
            case 6:
              uVar4 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar514._4_4_ = uVar4;
              auVar514._0_4_ = uVar4;
              auVar514._8_4_ = uVar4;
              auVar514._12_4_ = uVar4;
              uVar4 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
              auVar115._4_4_ = uVar4;
              auVar115._0_4_ = uVar4;
              auVar115._8_4_ = uVar4;
              auVar115._12_4_ = uVar4;
              auVar432 = vfmadd213ps_avx512vl(auVar514,auVar433,auVar115);
              auVar432 = vmaxps_avx512vl(auVar432,auVar430);
              auVar116._8_4_ = 0x3f800000;
              auVar116._0_8_ = 0x3f8000003f800000;
              auVar116._12_4_ = 0x3f800000;
              auVar432 = vminps_avx512vl(auVar432,auVar116);
              auVar432 = vmulps_avx512vl(auVar432,auVar433);
            }
          }
          if (iVar410 == 1) {
            *(int *)*local_310 = auVar432._0_4_;
            uVar4 = vextractps_avx(auVar432,1);
            *(undefined4 *)((long)*local_310 + lVar428 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar432,2);
            *(undefined4 *)((long)*local_310 + lVar367 * 4) = uVar4;
            uVar4 = vextractps_avx(auVar432,3);
            *(undefined4 *)((long)*local_310 + lVar368 * 4) = uVar4;
            local_310 = (undefined1 (*) [32])((long)*local_310 + 4);
          }
          else if (iVar410 == 4) {
            *(undefined1 (*) [16])local_310 = auVar432;
            local_310 = (undefined1 (*) [32])((long)local_310 + 0x10);
          }
          iVar404 = iVar404 + local_188.elempack * iVar6;
          lVar374 = lVar374 + lVar3;
          lVar394 = lVar394 + lVar3;
        }
      }
      iVar382 = iVar382 + iVar383 * 4;
      uVar369 = (long)(iVar389 - iVar382) / 2;
      lVar367 = (long)local_188.h * (long)local_188.elempack;
      uVar400 = top_blob->w;
      lVar368 = (long)(int)uVar400 * top_blob->elemsize;
      pvVar10 = top_blob->data;
      iVar383 = local_188.elempack * iVar6;
      uVar393 = 0;
      uVar426 = 0;
      if (0 < (int)uVar400) {
        uVar426 = (ulong)uVar400;
      }
      iVar389 = (int)uVar369;
      uVar392 = 0;
      if (0 < iVar389) {
        uVar392 = uVar369 & 0xffffffff;
      }
      auVar463 = vmovdqu64_avx512f(local_b8);
      lVar422 = auVar463._0_8_;
      lVar390 = vpextrq_avx(auVar463._0_16_,1);
      auVar461 = _DAT_004f6b80;
      auVar462 = _DAT_004f6bc0;
      for (; iVar410 = (int)uVar419, uVar393 != uVar392; uVar393 = uVar393 + 1) {
        uVar369 = (long)iVar382 + uVar393 * 2;
        uVar400 = (int)uVar369 >> 0x1f;
        uVar376 = (ulong)uVar400 << 0x20 | uVar369 & 0xffffffff;
        puVar375 = (undefined4 *)(uVar369 * lVar368 + (long)pvVar10);
        sVar11 = (this->weight_data_tm).cstep;
        sVar12 = (this->weight_data_tm).elemsize;
        puVar371 = (undefined4 *)(((long)iVar382 + uVar393 * 2 + 1) * lVar368 + (long)pvVar10);
        pvVar13 = (this->weight_data_tm).data;
        pfVar14 = *(float **)(&this->field_0xf8 + (long)p_Var7);
        local_2e8 = 0;
        iVar404 = 0;
        local_340 = lVar397 * 4;
        for (uVar373 = 0; uVar373 != uVar426; uVar373 = uVar373 + 1) {
          if (lVar8 == 0) {
            fVar429 = 0.0;
            fVar494 = 0.0;
          }
          else {
            pfVar423 = (float *)(lVar8 + uVar369 * 4);
            fVar429 = *pfVar423;
            fVar494 = pfVar423[1];
          }
          iVar363 = iVar383 * (int)uVar373;
          lVar386 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar428 = (long)local_188.data + local_340;
          puVar408 = (undefined4 *)((long)local_188.data + local_2e8);
          auVar464 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar427 = 0;
          auVar465 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar406 = (undefined1 (*) [64])
                      ((long)(((int)((long)((ulong)uVar400 << 0x20 | uVar369 & 0xffffffff) % 4) >> 1
                              ) + (int)((long)uVar376 / 0x10) +
                              (int)(char)((char)((long)uVar376 % 0x10) / '\b') +
                             (int)(char)((char)((long)((ulong)uVar400 << 0x20 | uVar369 & 0xffffffff
                                                      ) % 8) / '\x04')) * sVar11 * sVar12 +
                      (long)pvVar13);
          while( true ) {
            local_338 = (int)lVar367;
            if (local_338 <= (int)((uint)uVar427 | 0xf)) break;
            lVar378 = (int)((long)((ulong)(uint)((int)(uint)uVar427 >> 0x1f) << 0x20 |
                                  uVar427 & 0xffffffff) / (long)iVar5) * lVar386;
            if (iVar5 == 0x10) {
              pauVar379 = (undefined1 (*) [64])((long)local_188.data + lVar378 + (long)iVar404 * 4);
              uVar401 = uVar419;
              pauVar414 = pauVar406;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                auVar464 = vfmadd231ps_avx512f(auVar464,*pauVar379,*pauVar414);
                auVar465 = vfmadd231ps_avx512f(auVar465,*pauVar379,pauVar414[1]);
                pauVar414 = pauVar414 + 2;
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + lVar415 * 4);
              }
              pauVar406 = pauVar406 + uVar419 * 2;
            }
            else {
              pauVar379 = (undefined1 (*) [64])((long)local_188.data + lVar378 + (long)iVar363 * 4);
            }
            uVar401 = uVar419;
            pauVar414 = pauVar379;
            pauVar421 = pauVar406;
            if (iVar5 == 8) {
              while ((int)uVar401 != 0) {
                auVar567 = vinsertf64x4_avx512f
                                     (ZEXT3264(*(undefined1 (*) [32])*pauVar414),
                                      *(undefined1 (*) [32])(*pauVar414 + lVar397 * 4),1);
                auVar464 = vfmadd231ps_avx512f(auVar464,auVar567,*pauVar421);
                auVar465 = vfmadd231ps_avx512f(auVar465,auVar567,pauVar421[1]);
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar414 = (undefined1 (*) [64])(*pauVar414 + lVar1);
                pauVar421 = pauVar421 + 2;
              }
              pauVar406 = pauVar406 + uVar419 * 2;
              pauVar379 = (undefined1 (*) [64])(*pauVar379 + lVar372);
            }
            uVar401 = uVar419;
            pauVar414 = pauVar379;
            pauVar421 = pauVar406;
            if (iVar5 == 4) {
              while ((int)uVar401 != 0) {
                auVar525._16_16_ = *(undefined1 (*) [16])(*pauVar414 + lVar390 * 4);
                auVar525._0_16_ = *(undefined1 (*) [16])(*pauVar414 + lVar422 * 4);
                auVar567 = vinsertf64x4_avx512f
                                     (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                           (*pauVar414 + lVar397 * 4),
                                                          *(undefined1 (*) [16])*pauVar414)),
                                      auVar525,1);
                auVar464 = vfmadd231ps_avx512f(auVar464,auVar567,*pauVar421);
                auVar465 = vfmadd231ps_avx512f(auVar465,auVar567,pauVar421[1]);
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar414 = (undefined1 (*) [64])(*pauVar414 + lVar2);
                pauVar421 = pauVar421 + 2;
              }
              pauVar406 = pauVar406 + uVar419 * 2;
              pauVar379 = (undefined1 (*) [64])(*pauVar379 + lVar412);
            }
            uVar401 = uVar419;
            pauVar414 = pauVar406;
            if (iVar5 == 1) {
              while ((int)uVar401 != 0) {
                auVar430 = vgatherqps_avx512vl(*(undefined8 *)(*pauVar379 + lVar428 * 4));
                vgatherqps_avx512f(*(undefined8 *)(*pauVar379 + (long)pauVar414 * 4));
                auVar431 = vinsertps_avx(ZEXT416(*(uint *)*pauVar379),
                                         ZEXT416(*(uint *)(*pauVar379 + lVar397 * 4)),0x10);
                vpermt2pd_avx512f(auVar461,ZEXT1664(auVar431));
                auVar567 = vpermt2pd_avx512f(auVar462,ZEXT1664(auVar430));
                auVar535 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar379 + lVar365 * 4)));
                auVar479._56_4_ = auVar535._56_4_;
                auVar535 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar379 + lVar366 * 4)));
                auVar479._0_56_ = auVar567._0_56_;
                auVar479._60_4_ = auVar535._60_4_;
                auVar464 = vfmadd231ps_avx512f(auVar464,auVar479,*pauVar414);
                auVar465 = vfmadd231ps_avx512f(auVar465,auVar479,pauVar414[1]);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + lVar399);
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar414 = pauVar414 + 2;
              }
              pauVar406 = pauVar406 + uVar419 * 2;
            }
            uVar427 = uVar427 + 0x10;
            lVar428 = lVar428 + lVar386 * 0x10;
            puVar408 = puVar408 + lVar386 * 4;
          }
          auVar447 = vextractf64x4_avx512f(auVar464,1);
          fVar493 = auVar464._4_4_ + auVar447._4_4_;
          auVar430._0_4_ = auVar464._0_4_ + auVar447._0_4_ + auVar464._16_4_ + auVar447._16_4_;
          auVar430._4_4_ = fVar493 + fVar493;
          auVar430._8_4_ = auVar464._8_4_ + auVar447._8_4_ + auVar464._24_4_ + auVar447._24_4_;
          auVar430._12_4_ = auVar464._12_4_ + auVar447._12_4_ + auVar464._28_4_ + auVar447._28_4_;
          auVar431 = vshufpd_avx(auVar430,auVar430,1);
          auVar485._0_4_ = auVar431._0_4_ + auVar430._0_4_;
          auVar485._4_4_ = auVar431._4_4_ + auVar430._4_4_;
          auVar485._8_4_ = auVar431._8_4_ + auVar430._8_4_;
          auVar485._12_4_ = auVar431._12_4_ + auVar430._12_4_;
          auVar447 = vextractf64x4_avx512f(auVar465,1);
          fVar493 = auVar465._4_4_ + auVar447._4_4_;
          auVar498._0_4_ = auVar465._0_4_ + auVar447._0_4_ + auVar465._16_4_ + auVar447._16_4_;
          auVar498._4_4_ = fVar493 + fVar493;
          auVar498._8_4_ = auVar465._8_4_ + auVar447._8_4_ + auVar465._24_4_ + auVar447._24_4_;
          auVar498._12_4_ = auVar465._12_4_ + auVar447._12_4_ + auVar465._28_4_ + auVar447._28_4_;
          auVar431 = vshufpd_avx(auVar498,auVar498,1);
          auVar499._0_4_ = auVar431._0_4_ + auVar498._0_4_;
          auVar499._4_4_ = auVar431._4_4_ + auVar498._4_4_;
          auVar499._8_4_ = auVar431._8_4_ + auVar498._8_4_;
          auVar499._12_4_ = auVar431._12_4_ + auVar498._12_4_;
          auVar464 = ZEXT864(0) << 0x20;
          auVar465 = ZEXT1664(ZEXT816(0) << 0x40);
          for (; (int)((uint)uVar427 | 7) < local_338; uVar427 = uVar427 + 8) {
            lVar378 = (int)((long)((ulong)(uint)((int)(uint)uVar427 >> 0x1f) << 0x20 |
                                  uVar427 & 0xffffffff) / (long)iVar5) * lVar386;
            if (iVar5 == 8) {
              pauVar413 = (undefined1 (*) [32])((long)local_188.data + lVar378 + (long)iVar404 * 4);
              uVar401 = uVar419;
              pauVar379 = pauVar406;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                auVar431 = vfmadd231ps_fma(auVar464._0_32_,*pauVar413,
                                           *(undefined1 (*) [32])*pauVar379);
                auVar464 = ZEXT1664(auVar431);
                auVar431 = vfmadd231ps_fma(auVar465._0_32_,*pauVar413,
                                           *(undefined1 (*) [32])(*pauVar379 + 0x20));
                auVar465 = ZEXT1664(auVar431);
                pauVar379 = pauVar379 + 1;
                pauVar413 = (undefined1 (*) [32])(*pauVar413 + lVar1);
              }
              pauVar406 = pauVar406 + uVar419;
            }
            else {
              pauVar413 = (undefined1 (*) [32])((long)local_188.data + lVar378 + (long)iVar363 * 4);
            }
            uVar401 = uVar419;
            pauVar402 = pauVar413;
            pauVar379 = pauVar406;
            if (iVar5 == 4) {
              while ((int)uVar401 != 0) {
                auVar534._16_16_ = *(undefined1 (*) [16])(*pauVar402 + lVar397 * 4);
                auVar534._0_16_ = *(undefined1 (*) [16])*pauVar402;
                auVar431 = vfmadd231ps_fma(auVar464._0_32_,auVar534,*(undefined1 (*) [32])*pauVar379
                                          );
                auVar464 = ZEXT1664(auVar431);
                auVar431 = vfmadd231ps_fma(auVar465._0_32_,auVar534,
                                           *(undefined1 (*) [32])(*pauVar379 + 0x20));
                auVar465 = ZEXT1664(auVar431);
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar402 = (undefined1 (*) [32])(*pauVar402 + lVar2);
                pauVar379 = pauVar379 + 1;
              }
              pauVar406 = pauVar406 + uVar419;
              pauVar413 = (undefined1 (*) [32])(*pauVar413 + lVar412);
            }
            uVar401 = uVar419;
            pauVar379 = pauVar406;
            if (iVar5 == 1) {
              while ((int)uVar401 != 0) {
                auVar430 = vgatherqps_avx512vl(*(undefined8 *)(*pauVar413 + (long)pauVar379 * 4));
                auVar431 = vinsertps_avx(ZEXT416(*(uint *)*pauVar413),
                                         ZEXT416(*(uint *)(*pauVar413 + lVar397 * 4)),0x10);
                auVar447 = vpermpd_avx2(ZEXT1632(auVar430),0xd0);
                auVar447 = vblendps_avx(auVar447,ZEXT1632(auVar431),3);
                uVar4 = *(undefined4 *)(*pauVar413 + lVar528 * 4);
                auVar539._4_4_ = uVar4;
                auVar539._0_4_ = uVar4;
                auVar539._8_4_ = uVar4;
                auVar539._12_4_ = uVar4;
                auVar539._16_4_ = uVar4;
                auVar539._20_4_ = uVar4;
                auVar539._24_4_ = uVar4;
                auVar539._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(*pauVar413 + lVar9 * 4);
                auVar542._4_4_ = uVar4;
                auVar542._0_4_ = uVar4;
                auVar542._8_4_ = uVar4;
                auVar542._12_4_ = uVar4;
                auVar542._16_4_ = uVar4;
                auVar542._20_4_ = uVar4;
                auVar542._24_4_ = uVar4;
                auVar542._28_4_ = uVar4;
                auVar447 = vblendps_avx(auVar447,auVar539,0x40);
                auVar447 = vblendps_avx(auVar447,auVar542,0x80);
                auVar431 = vfmadd231ps_fma(auVar464._0_32_,auVar447,*(undefined1 (*) [32])*pauVar379
                                          );
                auVar464 = ZEXT1664(auVar431);
                auVar431 = vfmadd231ps_fma(auVar465._0_32_,auVar447,
                                           *(undefined1 (*) [32])(*pauVar379 + 0x20));
                auVar465 = ZEXT1664(auVar431);
                pauVar413 = (undefined1 (*) [32])(*pauVar413 + lVar399);
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar379 = pauVar379 + 1;
              }
              pauVar406 = pauVar406 + uVar419;
            }
            lVar428 = lVar428 + lVar386 * 8;
            puVar408 = puVar408 + lVar386 * 2;
          }
          auVar515._0_4_ = auVar464._16_4_ + auVar464._0_4_;
          auVar515._4_4_ = auVar464._20_4_ + auVar464._4_4_;
          auVar515._8_4_ = auVar464._24_4_ + auVar464._8_4_;
          auVar515._12_4_ = auVar464._28_4_ + auVar464._12_4_;
          auVar431 = vshufpd_avx(auVar515,auVar515,1);
          auVar516._0_4_ = auVar431._0_4_ + auVar515._0_4_;
          auVar516._4_4_ = auVar431._4_4_ + auVar515._4_4_;
          auVar516._8_4_ = auVar431._8_4_ + auVar515._8_4_;
          auVar516._12_4_ = auVar431._12_4_ + auVar515._12_4_;
          auVar523._0_4_ = auVar465._16_4_ + auVar465._0_4_;
          auVar523._4_4_ = auVar465._20_4_ + auVar465._4_4_;
          auVar523._8_4_ = auVar465._24_4_ + auVar465._8_4_;
          auVar523._12_4_ = auVar465._28_4_ + auVar465._12_4_;
          auVar431 = vshufpd_avx(auVar523,auVar523,1);
          auVar524._0_4_ = auVar431._0_4_ + auVar523._0_4_;
          auVar524._4_4_ = auVar431._4_4_ + auVar523._4_4_;
          auVar524._8_4_ = auVar431._8_4_ + auVar523._8_4_;
          auVar524._12_4_ = auVar431._12_4_ + auVar523._12_4_;
          auVar464 = ZEXT864(0) << 0x40;
          auVar465 = ZEXT1664(ZEXT816(0) << 0x40);
          for (; (int)((uint)uVar427 | 3) < local_338; uVar427 = uVar427 + 4) {
            lVar378 = (int)((long)((ulong)(uint)((int)(uint)uVar427 >> 0x1f) << 0x20 |
                                  uVar427 & 0xffffffff) / (long)iVar5) * lVar386;
            if (iVar5 == 4) {
              pauVar407 = (undefined1 (*) [16])((long)local_188.data + lVar378 + (long)iVar404 * 4);
              uVar401 = uVar419;
              pauVar379 = pauVar406;
              while (iVar387 = (int)uVar401, uVar401 = (ulong)(iVar387 - 1), iVar387 != 0) {
                auVar431 = vfmadd231ps_fma(auVar464._0_16_,*pauVar407,
                                           *(undefined1 (*) [16])*pauVar379);
                auVar464 = ZEXT1664(auVar431);
                auVar431 = vfmadd231ps_fma(auVar465._0_16_,*pauVar407,
                                           *(undefined1 (*) [16])(*pauVar379 + 0x10));
                auVar465 = ZEXT1664(auVar431);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + 0x20);
                pauVar407 = (undefined1 (*) [16])(*pauVar407 + lVar2);
              }
              pauVar406 = (undefined1 (*) [64])(*pauVar406 + lVar416);
            }
            else {
              pauVar407 = (undefined1 (*) [16])((long)local_188.data + lVar378 + (long)iVar363 * 4);
            }
            uVar401 = uVar419;
            pauVar379 = pauVar406;
            if (iVar5 == 1) {
              while ((int)uVar401 != 0) {
                auVar431 = vinsertps_avx(ZEXT416(*(uint *)*pauVar407),
                                         ZEXT416(*(uint *)(*pauVar407 + lVar397 * 4)),0x10);
                auVar431 = vinsertps_avx(auVar431,ZEXT416(*(uint *)(*pauVar407 + lVar422 * 4)),0x20)
                ;
                auVar431 = vinsertps_avx(auVar431,ZEXT416(*(uint *)(*pauVar407 + lVar390 * 4)),0x30)
                ;
                auVar430 = vfmadd231ps_fma(auVar464._0_16_,auVar431,*(undefined1 (*) [16])*pauVar379
                                          );
                auVar464 = ZEXT1664(auVar430);
                auVar431 = vfmadd231ps_fma(auVar465._0_16_,auVar431,
                                           *(undefined1 (*) [16])(*pauVar379 + 0x10));
                auVar465 = ZEXT1664(auVar431);
                pauVar407 = (undefined1 (*) [16])(*pauVar407 + lVar399);
                uVar401 = (ulong)((int)uVar401 - 1);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + 0x20);
              }
              pauVar406 = (undefined1 (*) [64])(*pauVar406 + lVar416);
            }
            lVar428 = lVar428 + lVar386 * 4;
            puVar408 = puVar408 + lVar386;
          }
          auVar431 = vshufpd_avx(auVar464._0_16_,auVar464._0_16_,1);
          auVar532._0_4_ = auVar431._0_4_ + auVar464._0_4_;
          auVar532._4_4_ = auVar431._4_4_ + auVar464._4_4_;
          auVar532._8_4_ = auVar431._8_4_ + auVar464._8_4_;
          auVar532._12_4_ = auVar431._12_4_ + auVar464._12_4_;
          auVar431 = vshufpd_avx(auVar465._0_16_,auVar465._0_16_,1);
          auVar537._0_4_ = auVar431._0_4_ + auVar465._0_4_;
          auVar537._4_4_ = auVar431._4_4_ + auVar465._4_4_;
          auVar537._8_4_ = auVar431._8_4_ + auVar465._8_4_;
          auVar537._12_4_ = auVar431._12_4_ + auVar465._12_4_;
          auVar431 = vinsertps_avx(auVar499,auVar485,0x4c);
          auVar430 = vinsertps_avx(auVar485,auVar499,0x1c);
          auVar480 = vinsertps_avx(auVar524,auVar516,0x4c);
          auVar484 = vinsertps_avx(auVar516,auVar524,0x1c);
          auVar497 = vinsertps_avx(auVar537,auVar532,0x4c);
          auVar522 = vinsertps_avx(auVar532,auVar537,0x1c);
          auVar464 = ZEXT1664(CONCAT412(auVar431._12_4_ + 0.0 + auVar430._12_4_ + auVar480._12_4_ +
                                        auVar522._12_4_ + auVar484._12_4_ + auVar497._12_4_,
                                        CONCAT48(auVar431._8_4_ + 0.0 +
                                                 auVar430._8_4_ + auVar480._8_4_ + auVar522._8_4_ +
                                                 auVar484._8_4_ + auVar497._8_4_,
                                                 CONCAT44(auVar431._4_4_ + fVar494 +
                                                          auVar430._4_4_ + auVar480._4_4_ +
                                                          auVar522._4_4_ +
                                                          auVar484._4_4_ + auVar497._4_4_,
                                                          auVar431._0_4_ + fVar429 +
                                                          auVar430._0_4_ + auVar480._0_4_ +
                                                          auVar522._0_4_ +
                                                          auVar484._0_4_ + auVar497._0_4_))));
          for (; (long)(uVar427 | 1) < lVar367; uVar427 = uVar427 + 2) {
            lVar378 = 0;
            uVar401 = uVar419;
            pauVar379 = pauVar406;
            while (iVar363 = (int)uVar401, uVar401 = (ulong)(iVar363 - 1), iVar363 != 0) {
              auVar481._8_8_ = 0;
              auVar481._0_8_ = *(ulong *)*pauVar379;
              auVar486._8_8_ = 0;
              auVar486._0_8_ = *(ulong *)(*pauVar379 + 8);
              uVar4 = *(undefined4 *)((long)puVar408 + lVar378);
              auVar431._4_4_ = uVar4;
              auVar431._0_4_ = uVar4;
              auVar431._8_4_ = uVar4;
              auVar431._12_4_ = uVar4;
              auVar431 = vfmadd231ps_avx512vl(auVar464._0_16_,auVar481,auVar431);
              uVar4 = *(undefined4 *)(lVar428 + lVar378);
              auVar113._4_4_ = uVar4;
              auVar113._0_4_ = uVar4;
              auVar113._8_4_ = uVar4;
              auVar113._12_4_ = uVar4;
              auVar431 = vfmadd231ps_avx512vl(auVar431,auVar486,auVar113);
              auVar464 = ZEXT1664(auVar431);
              pauVar379 = (undefined1 (*) [64])(*pauVar379 + 0x10);
              lVar378 = lVar378 + lVar399;
            }
            pauVar406 = (undefined1 (*) [64])(*pauVar406 + lVar385);
            lVar428 = lVar428 + lVar386 * 2;
            puVar408 = (undefined4 *)((long)puVar408 + lVar386 * 2);
          }
          for (; auVar445 = auVar464._0_16_, (long)uVar427 < lVar367; uVar427 = uVar427 + 1) {
            puVar380 = puVar408;
            for (lVar428 = 0; iVar410 != (int)lVar428; lVar428 = lVar428 + 1) {
              auVar482._8_8_ = 0;
              auVar482._0_8_ = *(ulong *)(*pauVar406 + lVar428 * 8);
              uVar4 = *puVar380;
              auVar114._4_4_ = uVar4;
              auVar114._0_4_ = uVar4;
              auVar114._8_4_ = uVar4;
              auVar114._12_4_ = uVar4;
              auVar431 = vfmadd231ps_avx512vl(auVar464._0_16_,auVar482,auVar114);
              auVar464 = ZEXT1664(auVar431);
              puVar380 = puVar380 + lVar398;
            }
            pauVar406 = (undefined1 (*) [64])(*pauVar406 + uVar419 * 8);
            puVar408 = (undefined4 *)((long)puVar408 + lVar386);
          }
          if (iVar424 - 1U < 6) {
            auVar431 = vmovshdup_avx(auVar445);
            fVar429 = auVar464._0_4_;
            fVar494 = auVar431._0_4_;
            switch(iVar424) {
            case 1:
              auVar445 = vmaxps_avx(auVar445,_DAT_004e9a90);
              break;
            case 2:
              uVar427 = vcmpps_avx512vl(auVar445,_DAT_004e9a90,0xe);
              fVar494 = *pfVar14;
              auVar141._4_4_ = fVar494;
              auVar141._0_4_ = fVar494;
              auVar141._8_4_ = fVar494;
              auVar141._12_4_ = fVar494;
              auVar431 = vmulps_avx512vl(auVar445,auVar141);
              bVar18 = (bool)((byte)uVar427 & 1);
              auVar445._0_4_ = (float)((uint)bVar18 * (int)fVar429 | (uint)!bVar18 * auVar431._0_4_)
              ;
              bVar18 = (bool)((byte)(uVar427 >> 1) & 1);
              auVar445._4_4_ =
                   (float)((uint)bVar18 * (int)auVar464._4_4_ | (uint)!bVar18 * auVar431._4_4_);
              bVar18 = (bool)((byte)(uVar427 >> 2) & 1);
              auVar445._8_4_ =
                   (float)((uint)bVar18 * (int)auVar464._8_4_ | (uint)!bVar18 * auVar431._8_4_);
              bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
              auVar445._12_4_ =
                   (float)((uint)bVar18 * (int)auVar464._12_4_ | (uint)!bVar18 * auVar431._12_4_);
              break;
            case 3:
              uVar427 = *(ulong *)pfVar14;
              auVar483._8_8_ = 0;
              auVar483._0_8_ = uVar427;
              auVar484 = vmaxss_avx(auVar483,auVar445);
              auVar430 = vinsertps_avx(auVar483,auVar484,0x10);
              auVar480 = vinsertps_avx(auVar431,auVar483,0x50);
              uVar401 = vcmpps_avx512vl(auVar480,auVar430,1);
              auVar431 = vinsertps_avx(auVar431,auVar484,0x10);
              bVar18 = (bool)((byte)uVar401 & 1);
              auVar444._0_4_ = (uint)bVar18 * (int)uVar427 | (uint)!bVar18 * auVar431._0_4_;
              bVar18 = (bool)((byte)(uVar401 >> 1) & 1);
              auVar444._4_4_ =
                   (uint)bVar18 * (int)(uVar427 >> 0x20) | (uint)!bVar18 * auVar431._4_4_;
              auVar444._8_4_ = (uint)!(bool)((byte)(uVar401 >> 2) & 1) * auVar431._8_4_;
              auVar444._12_4_ = (uint)!(bool)((byte)(uVar401 >> 3) & 1) * auVar431._12_4_;
              auVar445 = vshufps_avx(auVar444,auVar444,0xe1);
              uVar427 = vcmpps_avx512vl(auVar483,auVar445,1);
              if ((uVar427 & 2) != 0) {
                auVar445 = vinsertps_avx(auVar445,auVar483,0x50);
              }
              break;
            case 4:
              auVar487._8_4_ = 0x42b0c0a5;
              auVar487._0_8_ = 0x42b0c0a542b0c0a5;
              auVar487._12_4_ = 0x42b0c0a5;
              auVar431 = vminps_avx(auVar445,auVar487);
              auVar139._8_4_ = 0xc2b0c0a5;
              auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar139._12_4_ = 0xc2b0c0a5;
              uVar427 = vcmpps_avx512vl(auVar431,auVar139,1);
              auVar140._8_4_ = 0x80000000;
              auVar140._0_8_ = 0x8000000080000000;
              auVar140._12_4_ = 0x80000000;
              auVar431 = vxorps_avx512vl(auVar431,auVar140);
              bVar18 = (bool)((byte)uVar427 & 1);
              fVar429 = (float)((uint)bVar18 * 0x42b0c0a5 | (uint)!bVar18 * auVar431._0_4_);
              bVar18 = (bool)((byte)(uVar427 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar427 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar427 >> 3) & 1);
              local_2a8._0_4_ = expf(fVar429);
              local_2a8._4_4_ = extraout_XMM0_Db_00;
              local_2a8._8_4_ = extraout_XMM0_Dc_00;
              local_2a8._12_4_ = extraout_XMM0_Dd_00;
              auVar354._4_4_ = (uint)bVar18 * 0x42b0c0a5 | (uint)!bVar18 * auVar431._4_4_;
              auVar354._0_4_ = fVar429;
              auVar354._8_4_ = (uint)bVar16 * 0x42b0c0a5 | (uint)!bVar16 * auVar431._8_4_;
              auVar354._12_4_ = (uint)bVar17 * 0x42b0c0a5 | (uint)!bVar17 * auVar431._12_4_;
              auVar431 = vmovshdup_avx(auVar354);
              auVar462._0_4_ = expf(auVar431._0_4_);
              auVar462._4_60_ = extraout_var_00;
              auVar463 = vmovdqu64_avx512f(local_b8);
              auVar431 = vinsertps_avx(local_2a8,auVar462._0_16_,0x10);
              auVar488._8_4_ = 0x3f800000;
              auVar488._0_8_ = 0x3f8000003f800000;
              auVar488._12_4_ = 0x3f800000;
              auVar533._0_4_ = auVar431._0_4_ + 1.0;
              auVar533._4_4_ = auVar431._4_4_ + 1.0;
              auVar533._8_4_ = auVar431._8_4_ + 1.0;
              auVar533._12_4_ = auVar431._12_4_ + 1.0;
              auVar431 = vrcpps_avx(auVar533);
              auVar430 = vfmsub213ps_fma(auVar533,auVar431,auVar488);
              auVar445 = vfnmadd132ps_fma(auVar430,auVar431,auVar431);
              auVar461 = _DAT_004f6b80;
              auVar462 = _DAT_004f6bc0;
              break;
            case 5:
              fVar493 = expf(fVar429);
              fVar493 = logf(fVar493 + 1.0);
              fVar493 = tanhf(fVar493);
              fVar494 = expf(fVar494);
              fVar494 = logf(fVar494 + 1.0);
              auVar461._0_4_ = tanhf(fVar494);
              auVar461._4_60_ = extraout_var;
              auVar463 = vmovdqu64_avx512f(local_b8);
              auVar353._4_4_ = extraout_XMM0_Db;
              auVar353._0_4_ = fVar493;
              auVar353._8_4_ = extraout_XMM0_Dc;
              auVar353._12_4_ = extraout_XMM0_Dd;
              auVar431 = vinsertps_avx(auVar353,auVar461._0_16_,0x10);
              auVar445._0_4_ = auVar431._0_4_ * fVar429;
              auVar445._4_4_ = auVar431._4_4_ * auVar464._4_4_;
              auVar445._8_4_ = auVar431._8_4_ * auVar464._8_4_;
              auVar445._12_4_ = auVar431._12_4_ * auVar464._12_4_;
              auVar461 = _DAT_004f6b80;
              auVar462 = _DAT_004f6bc0;
              break;
            case 6:
              fVar493 = *pfVar14;
              fVar509 = pfVar14[1];
              auVar138._8_4_ = 0x80000000;
              auVar138._0_8_ = 0x8000000080000000;
              auVar138._12_4_ = 0x80000000;
              auVar430 = vxorps_avx512vl(ZEXT416((uint)fVar509),auVar138);
              fVar495 = auVar430._0_4_ / fVar493;
              fVar508 = 0.0;
              if ((fVar495 <= fVar429) && (fVar508 = fVar429, fVar429 <= fVar495 + 1.0 / fVar493)) {
                auVar430 = vfmadd213ss_fma(auVar445,ZEXT416((uint)fVar493),ZEXT416((uint)fVar509));
                fVar508 = auVar430._0_4_ * fVar429;
              }
              if (fVar495 <= fVar494) {
                auVar445._4_12_ = auVar464._4_12_;
                auVar445._0_4_ = fVar508;
                if (fVar494 <= fVar495 + 1.0 / fVar493) {
                  auVar431 = vfmadd213ss_fma(ZEXT416((uint)fVar493),auVar431,ZEXT416((uint)fVar509))
                  ;
                  auVar445 = vinsertps_avx(auVar445,ZEXT416((uint)(auVar431._0_4_ * fVar494)),0x10);
                }
              }
              else {
                auVar445 = ZEXT416((uint)fVar508);
              }
            }
          }
          *puVar375 = auVar445._0_4_;
          uVar4 = vextractps_avx(auVar445,1);
          *puVar371 = uVar4;
          puVar375 = puVar375 + 1;
          puVar371 = puVar371 + 1;
          iVar404 = iVar404 + iVar383;
          local_340 = local_340 + lVar3;
          local_2e8 = local_2e8 + lVar3;
        }
      }
      lVar384 = lVar384 * lVar411;
      pvVar10 = top_blob->data;
      iVar383 = top_blob->w;
      sVar11 = top_blob->elemsize;
      uVar369 = 0;
      if (0 < (int)local_f0) {
        uVar369 = local_f0 & 0xffffffff;
      }
      uVar426 = (ulong)(iVar382 + iVar389 * 2);
      lVar367 = vpextrq_avx(auVar463._0_16_,1);
      for (; (long)uVar426 < (long)uVar364; uVar426 = uVar426 + 1) {
        uVar400 = (int)uVar426 >> 0x1f;
        uVar393 = (ulong)uVar400 << 0x20 | uVar426 & 0xffffffff;
        sVar12 = (this->weight_data_tm).cstep;
        sVar15 = (this->weight_data_tm).elemsize;
        pfVar423 = (float *)((long)iVar383 * sVar11 * uVar426 + (long)pvVar10);
        pvVar13 = (this->weight_data_tm).data;
        pfVar14 = *(float **)(&this->field_0xf8 + (long)p_Var7);
        local_2d0 = 0;
        iVar389 = 0;
        lVar368 = lVar397 * 4;
        for (uVar392 = 0; uVar392 != uVar369; uVar392 = uVar392 + 1) {
          if (lVar8 == 0) {
            fVar429 = 0.0;
          }
          else {
            fVar429 = *(float *)(lVar8 + uVar426 * 4);
          }
          iVar382 = iVar6 * iVar5 * (int)uVar392;
          lVar411 = (long)local_188.w *
                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          lVar390 = (long)local_188.data + lVar368;
          puVar425 = (uint *)((long)local_188.data + local_2d0);
          auVar464 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar376 = 0;
          pauVar406 = (undefined1 (*) [64])
                      ((long)((int)(char)((char)((long)((ulong)uVar400 << 0x20 |
                                                       uVar426 & 0xffffffff) % 4) / '\x02') +
                              (int)(char)((char)((long)((ulong)uVar400 << 0x20 |
                                                       uVar426 & 0xffffffff) % 8) / '\x04') +
                             (int)((long)((ulong)uVar400 << 0x20 | uVar426 & 0xffffffff) % 2) +
                             (int)((long)uVar393 / 0x10) +
                             (int)(char)((char)((long)uVar393 % 0x10) / '\b')) * sVar12 * sVar15 +
                      (long)pvVar13);
          while( true ) {
            local_210 = (int)lVar384;
            if (local_210 <= (int)((uint)uVar376 | 0xf)) break;
            lVar422 = (int)((long)((ulong)(uint)((int)(uint)uVar376 >> 0x1f) << 0x20 |
                                  uVar376 & 0xffffffff) / (long)iVar5) * lVar411;
            if (iVar5 == 0x10) {
              pauVar379 = (undefined1 (*) [64])((long)local_188.data + lVar422 + (long)iVar389 * 4);
              uVar373 = uVar419;
              pauVar414 = pauVar406;
              while (iVar404 = (int)uVar373, uVar373 = (ulong)(iVar404 - 1), iVar404 != 0) {
                auVar464 = vfmadd231ps_avx512f(auVar464,*pauVar379,*pauVar414);
                pauVar414 = pauVar414 + 1;
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + lVar415 * 4);
              }
              pauVar406 = pauVar406 + uVar419;
            }
            else {
              pauVar379 = (undefined1 (*) [64])((long)local_188.data + lVar422 + (long)iVar382 * 4);
            }
            uVar373 = uVar419;
            pauVar414 = pauVar379;
            pauVar421 = pauVar406;
            if (iVar5 == 8) {
              while ((int)uVar373 != 0) {
                auVar465 = vinsertf64x4_avx512f
                                     (ZEXT3264(*(undefined1 (*) [32])*pauVar414),
                                      *(undefined1 (*) [32])(*pauVar414 + lVar397 * 4),1);
                auVar464 = vfmadd231ps_avx512f(auVar464,auVar465,*pauVar421);
                uVar373 = (ulong)((int)uVar373 - 1);
                pauVar414 = (undefined1 (*) [64])(*pauVar414 + lVar1);
                pauVar421 = pauVar421 + 1;
              }
              pauVar406 = pauVar406 + uVar419;
              pauVar379 = (undefined1 (*) [64])(*pauVar379 + lVar372);
            }
            uVar373 = uVar419;
            pauVar414 = pauVar379;
            pauVar421 = pauVar406;
            if (iVar5 == 4) {
              while ((int)uVar373 != 0) {
                auVar507._16_16_ = *(undefined1 (*) [16])(*pauVar414 + lVar367 * 4);
                auVar507._0_16_ = *(undefined1 (*) [16])(*pauVar414 + auVar463._0_8_ * 4);
                auVar465 = vinsertf64x4_avx512f
                                     (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                           (*pauVar414 + lVar397 * 4),
                                                          *(undefined1 (*) [16])*pauVar414)),
                                      auVar507,1);
                auVar464 = vfmadd231ps_avx512f(auVar464,auVar465,*pauVar421);
                uVar373 = (ulong)((int)uVar373 - 1);
                pauVar414 = (undefined1 (*) [64])(*pauVar414 + lVar2);
                pauVar421 = pauVar421 + 1;
              }
              pauVar406 = pauVar406 + uVar419;
              pauVar379 = (undefined1 (*) [64])(*pauVar379 + lVar412);
            }
            uVar373 = uVar419;
            pauVar414 = pauVar406;
            if (iVar5 == 1) {
              while ((int)uVar373 != 0) {
                auVar430 = vgatherqps_avx512vl(*(undefined8 *)(*pauVar379 + lVar390 * 4));
                vgatherqps_avx512f(*(undefined8 *)(*pauVar379 + (long)pauVar414 * 4));
                auVar431 = vinsertps_avx(ZEXT416(*(uint *)*pauVar379),
                                         ZEXT416(*(uint *)(*pauVar379 + lVar397 * 4)),0x10);
                vpermt2pd_avx512f(auVar461,ZEXT1664(auVar431));
                auVar465 = vpermt2pd_avx512f(auVar462,ZEXT1664(auVar430));
                auVar567 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar379 + lVar365 * 4)));
                auVar535 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar379 + lVar366 * 4)));
                auVar567._0_56_ = auVar465._0_56_;
                auVar567._60_4_ = auVar535._60_4_;
                auVar464 = vfmadd231ps_avx512f(auVar464,auVar567,*pauVar414);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + lVar399);
                uVar373 = (ulong)((int)uVar373 - 1);
                pauVar414 = pauVar414 + 1;
              }
              pauVar406 = pauVar406 + uVar419;
            }
            uVar376 = uVar376 + 0x10;
            lVar390 = lVar390 + lVar411 * 0x10;
            puVar425 = puVar425 + lVar411 * 4;
          }
          auVar447 = vextractf64x4_avx512f(auVar464,1);
          fVar494 = auVar464._4_4_ + auVar447._4_4_;
          auVar489._0_4_ = auVar464._0_4_ + auVar447._0_4_ + auVar464._16_4_ + auVar447._16_4_;
          auVar489._4_4_ = fVar494 + fVar494;
          auVar489._8_4_ = auVar464._8_4_ + auVar447._8_4_ + auVar464._24_4_ + auVar447._24_4_;
          auVar489._12_4_ = auVar464._12_4_ + auVar447._12_4_ + auVar464._28_4_ + auVar447._28_4_;
          auVar431 = vshufpd_avx(auVar489,auVar489,1);
          auVar490._0_4_ = auVar431._0_4_ + auVar489._0_4_;
          auVar490._4_4_ = auVar431._4_4_ + auVar489._4_4_;
          auVar490._8_4_ = auVar431._8_4_ + auVar489._8_4_;
          auVar490._12_4_ = auVar431._12_4_ + auVar489._12_4_;
          auVar464 = ZEXT864(0) << 0x20;
          for (; (int)((uint)uVar376 | 7) < local_210; uVar376 = uVar376 + 8) {
            lVar422 = (int)((long)((ulong)(uint)((int)(uint)uVar376 >> 0x1f) << 0x20 |
                                  uVar376 & 0xffffffff) / (long)iVar5) * lVar411;
            if (iVar5 == 8) {
              pauVar413 = (undefined1 (*) [32])((long)local_188.data + lVar422 + (long)iVar389 * 4);
              uVar373 = uVar419;
              pauVar379 = pauVar406;
              while (iVar404 = (int)uVar373, uVar373 = (ulong)(iVar404 - 1), iVar404 != 0) {
                auVar431 = vfmadd231ps_fma(auVar464._0_32_,*pauVar413,
                                           *(undefined1 (*) [32])*pauVar379);
                auVar464 = ZEXT1664(auVar431);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + 0x20);
                pauVar413 = (undefined1 (*) [32])(*pauVar413 + lVar1);
              }
              pauVar406 = (undefined1 (*) [64])(*pauVar406 + lVar416);
            }
            else {
              pauVar413 = (undefined1 (*) [32])((long)local_188.data + lVar422 + (long)iVar382 * 4);
            }
            uVar373 = uVar419;
            pauVar402 = pauVar413;
            pauVar379 = pauVar406;
            if (iVar5 == 4) {
              while ((int)uVar373 != 0) {
                auVar521._16_16_ = *(undefined1 (*) [16])(*pauVar402 + lVar397 * 4);
                auVar521._0_16_ = *(undefined1 (*) [16])*pauVar402;
                auVar431 = vfmadd231ps_fma(auVar464._0_32_,auVar521,*(undefined1 (*) [32])*pauVar379
                                          );
                auVar464 = ZEXT1664(auVar431);
                uVar373 = (ulong)((int)uVar373 - 1);
                pauVar402 = (undefined1 (*) [32])(*pauVar402 + lVar2);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + 0x20);
              }
              pauVar406 = (undefined1 (*) [64])(*pauVar406 + lVar416);
              pauVar413 = (undefined1 (*) [32])(*pauVar413 + lVar412);
            }
            uVar373 = uVar419;
            pauVar379 = pauVar406;
            if (iVar5 == 1) {
              while ((int)uVar373 != 0) {
                auVar430 = vgatherqps_avx512vl(*(undefined8 *)(*pauVar413 + (long)pauVar379 * 4));
                auVar431 = vinsertps_avx(ZEXT416(*(uint *)*pauVar413),
                                         ZEXT416(*(uint *)(*pauVar413 + lVar397 * 4)),0x10);
                auVar447 = vpermpd_avx2(ZEXT1632(auVar430),0xd0);
                auVar447 = vblendps_avx(auVar447,ZEXT1632(auVar431),3);
                uVar4 = *(undefined4 *)(*pauVar413 + lVar528 * 4);
                auVar526._4_4_ = uVar4;
                auVar526._0_4_ = uVar4;
                auVar526._8_4_ = uVar4;
                auVar526._12_4_ = uVar4;
                auVar526._16_4_ = uVar4;
                auVar526._20_4_ = uVar4;
                auVar526._24_4_ = uVar4;
                auVar526._28_4_ = uVar4;
                auVar447 = vblendps_avx(auVar447,auVar526,0x40);
                uVar4 = *(undefined4 *)(*pauVar413 + lVar9 * 4);
                auVar527._4_4_ = uVar4;
                auVar527._0_4_ = uVar4;
                auVar527._8_4_ = uVar4;
                auVar527._12_4_ = uVar4;
                auVar527._16_4_ = uVar4;
                auVar527._20_4_ = uVar4;
                auVar527._24_4_ = uVar4;
                auVar527._28_4_ = uVar4;
                auVar447 = vblendps_avx(auVar447,auVar527,0x80);
                auVar431 = vfmadd231ps_fma(auVar464._0_32_,auVar447,*(undefined1 (*) [32])*pauVar379
                                          );
                auVar464 = ZEXT1664(auVar431);
                pauVar413 = (undefined1 (*) [32])(*pauVar413 + lVar399);
                uVar373 = (ulong)((int)uVar373 - 1);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + 0x20);
              }
              pauVar406 = (undefined1 (*) [64])(*pauVar406 + lVar416);
            }
            lVar390 = lVar390 + lVar411 * 8;
            puVar425 = puVar425 + lVar411 * 2;
          }
          auVar500._0_4_ = auVar464._16_4_ + auVar464._0_4_;
          auVar500._4_4_ = auVar464._20_4_ + auVar464._4_4_;
          auVar500._8_4_ = auVar464._24_4_ + auVar464._8_4_;
          auVar500._12_4_ = auVar464._28_4_ + auVar464._12_4_;
          auVar431 = vshufpd_avx(auVar500,auVar500,1);
          auVar501._0_4_ = auVar431._0_4_ + auVar500._0_4_;
          auVar501._4_4_ = auVar431._4_4_ + auVar500._4_4_;
          auVar501._8_4_ = auVar431._8_4_ + auVar500._8_4_;
          auVar501._12_4_ = auVar431._12_4_ + auVar500._12_4_;
          auVar464 = ZEXT864(0) << 0x40;
          for (; (int)((uint)uVar376 | 3) < local_210; uVar376 = uVar376 + 4) {
            lVar422 = (int)((long)((ulong)(uint)((int)(uint)uVar376 >> 0x1f) << 0x20 |
                                  uVar376 & 0xffffffff) / (long)iVar5) * lVar411;
            if (iVar5 == 4) {
              pauVar407 = (undefined1 (*) [16])((long)local_188.data + lVar422 + (long)iVar389 * 4);
              uVar373 = uVar419;
              pauVar379 = pauVar406;
              while (iVar404 = (int)uVar373, uVar373 = (ulong)(iVar404 - 1), iVar404 != 0) {
                auVar431 = vfmadd231ps_fma(auVar464._0_16_,*pauVar407,
                                           *(undefined1 (*) [16])*pauVar379);
                auVar464 = ZEXT1664(auVar431);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + 0x10);
                pauVar407 = (undefined1 (*) [16])(*pauVar407 + lVar2);
              }
              pauVar406 = (undefined1 (*) [64])(*pauVar406 + lVar385);
            }
            else {
              pauVar407 = (undefined1 (*) [16])((long)local_188.data + lVar422 + (long)iVar382 * 4);
            }
            uVar373 = uVar419;
            pauVar379 = pauVar406;
            if (iVar5 == 1) {
              while ((int)uVar373 != 0) {
                auVar431 = vinsertps_avx(ZEXT416(*(uint *)*pauVar407),
                                         ZEXT416(*(uint *)(*pauVar407 + lVar397 * 4)),0x10);
                auVar431 = vinsertps_avx(auVar431,ZEXT416(*(uint *)(*pauVar407 + auVar463._0_8_ * 4)
                                                         ),0x20);
                auVar431 = vinsertps_avx(auVar431,ZEXT416(*(uint *)(*pauVar407 + lVar367 * 4)),0x30)
                ;
                auVar431 = vfmadd231ps_fma(auVar464._0_16_,auVar431,*(undefined1 (*) [16])*pauVar379
                                          );
                auVar464 = ZEXT1664(auVar431);
                pauVar407 = (undefined1 (*) [16])(*pauVar407 + lVar399);
                uVar373 = (ulong)((int)uVar373 - 1);
                pauVar379 = (undefined1 (*) [64])(*pauVar379 + 0x10);
              }
              pauVar406 = (undefined1 (*) [64])(*pauVar406 + lVar385);
            }
            lVar390 = lVar390 + lVar411 * 4;
            puVar425 = puVar425 + lVar411;
          }
          auVar430 = vmovshdup_avx(auVar490);
          auVar431 = vshufpd_avx(auVar464._0_16_,auVar464._0_16_,1);
          auVar517._0_4_ = auVar431._0_4_ + auVar464._0_4_;
          auVar517._4_4_ = auVar431._4_4_ + auVar464._4_4_;
          auVar517._8_4_ = auVar431._8_4_ + auVar464._8_4_;
          auVar517._12_4_ = auVar431._12_4_ + auVar464._12_4_;
          auVar480 = vshufps_avx(auVar517,auVar501,0x11);
          auVar431 = vshufpd_avx(auVar480,auVar480,1);
          auVar502._0_4_ = auVar480._0_4_ + auVar431._0_4_;
          auVar502._4_4_ = auVar480._4_4_ + auVar431._4_4_;
          auVar502._8_4_ = auVar480._8_4_ + auVar431._8_4_;
          auVar502._12_4_ = auVar480._12_4_ + auVar431._12_4_;
          auVar431 = vhaddps_avx(auVar502,auVar502);
          auVar464 = ZEXT464((uint)(auVar430._0_4_ + auVar490._0_4_ + fVar429 + auVar431._0_4_));
          for (; (long)(uVar376 | 1) < lVar384; uVar376 = uVar376 + 2) {
            lVar422 = 0;
            for (lVar428 = 0; iVar410 != (int)lVar428; lVar428 = lVar428 + 1) {
              auVar431 = vfmadd231ss_fma(auVar464._0_16_,
                                         ZEXT416(*(uint *)(*pauVar406 + lVar428 * 8)),
                                         ZEXT416(*(uint *)((long)puVar425 + lVar422)));
              auVar431 = vfmadd231ss_fma(auVar431,ZEXT416(*(uint *)(*pauVar406 + lVar428 * 8 + 4)),
                                         ZEXT416(*(uint *)(lVar390 + lVar422)));
              auVar464 = ZEXT1664(auVar431);
              lVar422 = lVar422 + lVar399;
            }
            pauVar406 = (undefined1 (*) [64])(*pauVar406 + uVar419 * 8);
            lVar390 = lVar390 + lVar411 * 2;
            puVar425 = (uint *)((long)puVar425 + lVar411 * 2);
          }
          for (; (long)uVar376 < lVar384; uVar376 = uVar376 + 1) {
            puVar381 = puVar425;
            for (lVar390 = 0; iVar410 != (int)lVar390; lVar390 = lVar390 + 1) {
              auVar431 = vfmadd231ss_fma(auVar464._0_16_,
                                         ZEXT416(*(uint *)(*pauVar406 + lVar390 * 4)),
                                         ZEXT416(*puVar381));
              auVar464 = ZEXT1664(auVar431);
              puVar381 = puVar381 + lVar398;
            }
            pauVar406 = (undefined1 (*) [64])(*pauVar406 + local_120);
            puVar425 = (uint *)((long)puVar425 + lVar411);
          }
          auVar431 = auVar464._0_16_;
          fVar494 = auVar464._0_4_;
          fVar429 = fVar494;
          switch(iVar424) {
          case 1:
            auVar431 = vmaxss_avx(auVar431,ZEXT416(0));
            fVar429 = auVar431._0_4_;
            break;
          case 2:
            uVar20 = vcmpss_avx512f(auVar431,ZEXT416(0),0xe);
            bVar18 = (bool)((byte)uVar20 & 1);
            fVar429 = (float)((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * (int)*pfVar14) * fVar494;
            break;
          case 3:
            auVar431 = vmaxss_avx(auVar431,ZEXT416((uint)*pfVar14));
            fVar429 = auVar431._0_4_;
            if (pfVar14[1] < auVar431._0_4_) {
              fVar429 = pfVar14[1];
            }
            break;
          case 4:
            auVar431 = vminss_avx(auVar431,SUB6416(ZEXT464(0x42b0c0a5),0));
            auVar143._8_4_ = 0x80000000;
            auVar143._0_8_ = 0x8000000080000000;
            auVar143._12_4_ = 0x80000000;
            auVar430 = vxorps_avx512vl(auVar431,auVar143);
            uVar20 = vcmpss_avx512f(auVar431,ZEXT416(0xc2b0c0a5),1);
            bVar18 = (bool)((byte)uVar20 & 1);
            fVar429 = expf((float)((uint)bVar18 * 0x42b0c0a5 + (uint)!bVar18 * auVar430._0_4_));
            fVar429 = 1.0 / (fVar429 + 1.0);
            auVar461 = _DAT_004f6b80;
            auVar462 = _DAT_004f6bc0;
            break;
          case 5:
            fVar429 = expf(fVar494);
            fVar429 = logf(fVar429 + 1.0);
            fVar429 = tanhf(fVar429);
            fVar429 = fVar429 * fVar494;
            auVar461 = _DAT_004f6b80;
            auVar462 = _DAT_004f6bc0;
            break;
          case 6:
            fVar493 = *pfVar14;
            auVar142._8_4_ = 0x80000000;
            auVar142._0_8_ = 0x8000000080000000;
            auVar142._12_4_ = 0x80000000;
            auVar430 = vxorps_avx512vl(ZEXT416((uint)pfVar14[1]),auVar142);
            fVar509 = auVar430._0_4_ / fVar493;
            fVar429 = 0.0;
            if ((fVar509 <= fVar494) && (fVar429 = fVar494, fVar494 <= fVar509 + 1.0 / fVar493)) {
              auVar431 = vfmadd213ss_fma(ZEXT416((uint)fVar493),auVar431,ZEXT416((uint)pfVar14[1]));
              fVar429 = auVar431._0_4_ * fVar494;
            }
          }
          *pfVar423 = fVar429;
          pfVar423 = pfVar423 + 1;
          iVar389 = iVar389 + iVar6 * iVar5;
          lVar368 = lVar368 + lVar3;
          local_2d0 = local_2d0 + lVar3;
        }
      }
      iVar424 = 0;
    }
  }
  piVar355 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar355 != (int *)0x0) {
    LOCK();
    *piVar355 = *piVar355 + -1;
    UNLOCK();
    if (*piVar355 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        free(local_188.data);
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar424;
}

Assistant:

int Convolution1D_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}